

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [28];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  Primitive PVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [28];
  undefined1 auVar110 [28];
  undefined1 auVar111 [28];
  undefined1 auVar112 [28];
  ulong uVar113;
  ulong uVar114;
  RTCIntersectArguments *pRVar115;
  ulong uVar116;
  uint uVar117;
  long lVar118;
  Geometry *geometry;
  long lVar119;
  float fVar125;
  long lVar120;
  undefined4 uVar121;
  undefined8 unaff_R13;
  long lVar122;
  byte bVar123;
  float fVar124;
  float fVar144;
  vint4 bi;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar142;
  float fVar143;
  float fVar146;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar145;
  float fVar147;
  float fVar151;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar152;
  float fVar165;
  vint4 ai;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar169;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar163 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  float fVar170;
  float fVar184;
  float fVar185;
  vint4 bi_2;
  undefined1 auVar171 [16];
  float fVar187;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar189;
  undefined1 auVar182 [32];
  float fVar186;
  float fVar188;
  undefined1 auVar183 [64];
  float fVar190;
  float fVar198;
  float fVar199;
  vint4 ai_1;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar201;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar200;
  float fVar202;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar203;
  float fVar204;
  float fVar212;
  float fVar214;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar216;
  float fVar218;
  float fVar219;
  undefined1 auVar207 [32];
  float fVar213;
  float fVar215;
  float fVar217;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar220;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  vint4 bi_1;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar227;
  float fVar228;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar229;
  float fVar230;
  float fVar237;
  float fVar239;
  vint4 ai_2;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar241;
  undefined1 auVar233 [16];
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar238;
  float fVar240;
  float fVar242;
  float fVar246;
  float fVar247;
  undefined1 auVar236 [32];
  float fVar248;
  float fVar253;
  float fVar254;
  undefined1 auVar249 [16];
  float fVar255;
  undefined1 auVar250 [16];
  float fVar256;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar257;
  float fVar264;
  float fVar266;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar267;
  undefined1 auVar265 [12];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [64];
  float fVar268;
  float fVar269;
  float fVar275;
  float fVar277;
  float fVar279;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar280;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar272 [32];
  float fVar276;
  float fVar278;
  float fVar281;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float fVar290;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  float fVar301;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [16];
  float fVar316;
  float fVar317;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  float fVar321;
  undefined1 auVar318 [16];
  float fVar322;
  undefined1 auVar319 [32];
  undefined1 auVar320 [64];
  float fVar323;
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar329 [16];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_7f4;
  RayQueryContext *local_7f0;
  long local_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  ulong local_730;
  Precalculations *local_728;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  undefined1 local_690 [8];
  undefined8 uStack_688;
  undefined8 local_680;
  undefined4 local_678;
  float local_674;
  uint local_670;
  undefined4 local_66c;
  undefined4 local_668;
  uint local_664;
  uint local_660;
  ulong local_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [8];
  undefined8 uStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  Primitive *local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  uint local_240;
  uint local_23c;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 local_1e0 [32];
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar158 [24];
  undefined1 auVar295 [32];
  
  local_728 = pre;
  PVar9 = prim[1];
  uVar113 = (ulong)(byte)PVar9;
  auVar329 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 4 + 6)));
  lVar122 = uVar113 * 0x25;
  auVar193 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 5 + 6)));
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 6 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 0xf + 6)));
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 0x11 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 0x1a + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 0x1b + 6)));
  fVar248 = *(float *)(prim + lVar122 + 0x12);
  auVar20 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar122 + 6));
  auVar291._0_4_ = fVar248 * (ray->dir).field_0.m128[0];
  auVar291._4_4_ = fVar248 * (ray->dir).field_0.m128[1];
  auVar291._8_4_ = fVar248 * (ray->dir).field_0.m128[2];
  auVar291._12_4_ = fVar248 * (ray->dir).field_0.m128[3];
  auVar231._0_4_ = auVar20._0_4_ * fVar248;
  auVar231._4_4_ = auVar20._4_4_ * fVar248;
  auVar231._8_4_ = auVar20._8_4_ * fVar248;
  auVar231._12_4_ = auVar20._12_4_ * fVar248;
  auVar20 = vcvtdq2ps_avx(auVar193);
  auVar14 = vcvtdq2ps_avx(auVar194);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar193 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 0x1c + 6)));
  auVar194 = vshufps_avx(auVar291,auVar291,0x55);
  auVar175 = vshufps_avx(auVar291,auVar291,0xaa);
  fVar219 = auVar175._0_4_;
  fVar201 = auVar175._4_4_;
  fVar185 = auVar175._8_4_;
  fVar187 = auVar175._12_4_;
  fVar254 = auVar194._0_4_;
  fVar277 = auVar194._4_4_;
  fVar255 = auVar194._8_4_;
  fVar280 = auVar194._12_4_;
  auVar175 = vcvtdq2ps_avx(auVar329);
  auVar15 = vcvtdq2ps_avx(auVar195);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar126 = vcvtdq2ps_avx(auVar193);
  auVar329 = vshufps_avx(auVar291,auVar291,0);
  fVar248 = auVar329._0_4_;
  fVar268 = auVar329._4_4_;
  fVar253 = auVar329._8_4_;
  fVar275 = auVar329._12_4_;
  auVar292._0_4_ = fVar248 * auVar175._0_4_ + fVar254 * auVar20._0_4_ + fVar219 * auVar14._0_4_;
  auVar292._4_4_ = fVar268 * auVar175._4_4_ + fVar277 * auVar20._4_4_ + fVar201 * auVar14._4_4_;
  auVar292._8_4_ = fVar253 * auVar175._8_4_ + fVar255 * auVar20._8_4_ + fVar185 * auVar14._8_4_;
  auVar292._12_4_ = fVar275 * auVar175._12_4_ + fVar280 * auVar20._12_4_ + fVar187 * auVar14._12_4_;
  auVar270._0_4_ = fVar248 * auVar15._0_4_ + fVar219 * auVar17._0_4_ + fVar254 * auVar16._0_4_;
  auVar270._4_4_ = fVar268 * auVar15._4_4_ + fVar201 * auVar17._4_4_ + fVar277 * auVar16._4_4_;
  auVar270._8_4_ = fVar253 * auVar15._8_4_ + fVar185 * auVar17._8_4_ + fVar255 * auVar16._8_4_;
  auVar270._12_4_ = fVar275 * auVar15._12_4_ + fVar187 * auVar17._12_4_ + fVar280 * auVar16._12_4_;
  local_780._4_4_ = fVar277 * auVar19._4_4_ + fVar201 * auVar126._4_4_ + fVar268 * auVar18._4_4_;
  local_780._0_4_ = fVar254 * auVar19._0_4_ + fVar219 * auVar126._0_4_ + fVar248 * auVar18._0_4_;
  fStack_778 = fVar255 * auVar19._8_4_ + fVar185 * auVar126._8_4_ + fVar253 * auVar18._8_4_;
  fStack_774 = fVar280 * auVar19._12_4_ + fVar187 * auVar126._12_4_ + fVar275 * auVar18._12_4_;
  auVar329 = vshufps_avx(auVar231,auVar231,0x55);
  auVar193 = vshufps_avx(auVar231,auVar231,0xaa);
  fVar248 = auVar193._0_4_;
  fVar268 = auVar193._4_4_;
  fVar253 = auVar193._8_4_;
  fVar275 = auVar193._12_4_;
  fVar254 = auVar329._0_4_;
  fVar255 = auVar329._4_4_;
  fVar219 = auVar329._8_4_;
  fVar185 = auVar329._12_4_;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = *(ulong *)(prim + uVar113 * 7 + 6);
  auVar127 = vpmovsxwd_avx(auVar329);
  auVar193._8_8_ = 0;
  auVar193._0_8_ = *(ulong *)(prim + uVar113 * 0xb + 6);
  auVar128 = vpmovsxwd_avx(auVar193);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar113 * 9 + 6);
  auVar155 = vpmovsxwd_avx(auVar194);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar113 * 0xd + 6);
  auVar195 = vpmovsxwd_avx(auVar195);
  auVar329 = vshufps_avx(auVar231,auVar231,0);
  fVar277 = auVar329._0_4_;
  fVar280 = auVar329._4_4_;
  fVar201 = auVar329._8_4_;
  fVar187 = auVar329._12_4_;
  auVar299._0_4_ = fVar254 * auVar20._0_4_ + auVar14._0_4_ * fVar248 + fVar277 * auVar175._0_4_;
  auVar299._4_4_ = fVar255 * auVar20._4_4_ + auVar14._4_4_ * fVar268 + fVar280 * auVar175._4_4_;
  auVar299._8_4_ = fVar219 * auVar20._8_4_ + auVar14._8_4_ * fVar253 + fVar201 * auVar175._8_4_;
  auVar299._12_4_ = fVar185 * auVar20._12_4_ + auVar14._12_4_ * fVar275 + fVar187 * auVar175._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar113 * 0x12 + 6);
  auVar20 = vpmovsxwd_avx(auVar20);
  auVar258._0_4_ = auVar17._0_4_ * fVar248 + auVar16._0_4_ * fVar254 + fVar277 * auVar15._0_4_;
  auVar258._4_4_ = auVar17._4_4_ * fVar268 + auVar16._4_4_ * fVar255 + fVar280 * auVar15._4_4_;
  auVar258._8_4_ = auVar17._8_4_ * fVar253 + auVar16._8_4_ * fVar219 + fVar201 * auVar15._8_4_;
  auVar258._12_4_ = auVar17._12_4_ * fVar275 + auVar16._12_4_ * fVar185 + fVar187 * auVar15._12_4_;
  auVar205._0_4_ = fVar277 * auVar18._0_4_ + auVar19._0_4_ * fVar254 + fVar248 * auVar126._0_4_;
  auVar205._4_4_ = fVar280 * auVar18._4_4_ + auVar19._4_4_ * fVar255 + fVar268 * auVar126._4_4_;
  auVar205._8_4_ = fVar201 * auVar18._8_4_ + auVar19._8_4_ * fVar219 + fVar253 * auVar126._8_4_;
  auVar205._12_4_ = fVar187 * auVar18._12_4_ + auVar19._12_4_ * fVar185 + fVar275 * auVar126._12_4_;
  auVar318._8_4_ = 0x7fffffff;
  auVar318._0_8_ = 0x7fffffff7fffffff;
  auVar318._12_4_ = 0x7fffffff;
  auVar329 = vandps_avx(auVar292,auVar318);
  auVar232._8_4_ = 0x219392ef;
  auVar232._0_8_ = 0x219392ef219392ef;
  auVar232._12_4_ = 0x219392ef;
  auVar329 = vcmpps_avx(auVar329,auVar232,1);
  auVar193 = vblendvps_avx(auVar292,auVar232,auVar329);
  auVar329 = vandps_avx(auVar270,auVar318);
  auVar329 = vcmpps_avx(auVar329,auVar232,1);
  auVar194 = vblendvps_avx(auVar270,auVar232,auVar329);
  auVar329 = vandps_avx(auVar318,_local_780);
  auVar329 = vcmpps_avx(auVar329,auVar232,1);
  auVar329 = vblendvps_avx(_local_780,auVar232,auVar329);
  auVar14 = vrcpps_avx(auVar193);
  fVar229 = auVar14._0_4_;
  auVar153._0_4_ = fVar229 * auVar193._0_4_;
  fVar237 = auVar14._4_4_;
  auVar153._4_4_ = fVar237 * auVar193._4_4_;
  fVar239 = auVar14._8_4_;
  auVar153._8_4_ = fVar239 * auVar193._8_4_;
  fVar241 = auVar14._12_4_;
  auVar153._12_4_ = fVar241 * auVar193._12_4_;
  auVar271._8_4_ = 0x3f800000;
  auVar271._0_8_ = 0x3f8000003f800000;
  auVar271._12_4_ = 0x3f800000;
  auVar193 = vsubps_avx(auVar271,auVar153);
  fVar229 = fVar229 + fVar229 * auVar193._0_4_;
  fVar237 = fVar237 + fVar237 * auVar193._4_4_;
  fVar239 = fVar239 + fVar239 * auVar193._8_4_;
  fVar241 = fVar241 + fVar241 * auVar193._12_4_;
  auVar193 = vrcpps_avx(auVar194);
  fVar248 = auVar193._0_4_;
  auVar249._0_4_ = fVar248 * auVar194._0_4_;
  fVar253 = auVar193._4_4_;
  auVar249._4_4_ = fVar253 * auVar194._4_4_;
  fVar254 = auVar193._8_4_;
  auVar249._8_4_ = fVar254 * auVar194._8_4_;
  fVar255 = auVar193._12_4_;
  auVar249._12_4_ = fVar255 * auVar194._12_4_;
  auVar193 = vsubps_avx(auVar271,auVar249);
  fVar248 = fVar248 + fVar248 * auVar193._0_4_;
  fVar253 = fVar253 + fVar253 * auVar193._4_4_;
  fVar254 = fVar254 + fVar254 * auVar193._8_4_;
  fVar255 = fVar255 + fVar255 * auVar193._12_4_;
  auVar193 = vrcpps_avx(auVar329);
  fVar268 = auVar193._0_4_;
  auVar171._0_4_ = fVar268 * auVar329._0_4_;
  fVar275 = auVar193._4_4_;
  auVar171._4_4_ = fVar275 * auVar329._4_4_;
  fVar277 = auVar193._8_4_;
  auVar171._8_4_ = fVar277 * auVar329._8_4_;
  fVar280 = auVar193._12_4_;
  auVar171._12_4_ = fVar280 * auVar329._12_4_;
  auVar329 = vsubps_avx(auVar271,auVar171);
  fVar268 = fVar268 + fVar268 * auVar329._0_4_;
  fVar275 = fVar275 + fVar275 * auVar329._4_4_;
  fVar277 = fVar277 + fVar277 * auVar329._8_4_;
  fVar280 = fVar280 + fVar280 * auVar329._12_4_;
  auVar194 = vpermilps_avx(ZEXT416((uint)(((ray->dir).field_0.m128[3] -
                                          *(float *)(prim + lVar122 + 0x16)) *
                                         *(float *)(prim + lVar122 + 0x1a))),0);
  auVar329 = vcvtdq2ps_avx(auVar127);
  auVar193 = vcvtdq2ps_avx(auVar128);
  auVar193 = vsubps_avx(auVar193,auVar329);
  fVar219 = auVar194._0_4_;
  fVar201 = auVar194._4_4_;
  fVar185 = auVar194._8_4_;
  fVar187 = auVar194._12_4_;
  auVar154._0_4_ = fVar219 * auVar193._0_4_ + auVar329._0_4_;
  auVar154._4_4_ = fVar201 * auVar193._4_4_ + auVar329._4_4_;
  auVar154._8_4_ = fVar185 * auVar193._8_4_ + auVar329._8_4_;
  auVar154._12_4_ = fVar187 * auVar193._12_4_ + auVar329._12_4_;
  auVar329 = vcvtdq2ps_avx(auVar155);
  auVar193 = vcvtdq2ps_avx(auVar195);
  auVar193 = vsubps_avx(auVar193,auVar329);
  auVar126._0_4_ = fVar219 * auVar193._0_4_ + auVar329._0_4_;
  auVar126._4_4_ = fVar201 * auVar193._4_4_ + auVar329._4_4_;
  auVar126._8_4_ = fVar185 * auVar193._8_4_ + auVar329._8_4_;
  auVar126._12_4_ = fVar187 * auVar193._12_4_ + auVar329._12_4_;
  auVar329 = vcvtdq2ps_avx(auVar20);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar113 * 0x16 + 6);
  auVar193 = vpmovsxwd_avx(auVar14);
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar193 = vsubps_avx(auVar193,auVar329);
  auVar191._0_4_ = fVar219 * auVar193._0_4_ + auVar329._0_4_;
  auVar191._4_4_ = fVar201 * auVar193._4_4_ + auVar329._4_4_;
  auVar191._8_4_ = fVar185 * auVar193._8_4_ + auVar329._8_4_;
  auVar191._12_4_ = fVar187 * auVar193._12_4_ + auVar329._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar113 * 0x14 + 6);
  auVar329 = vpmovsxwd_avx(auVar16);
  auVar329 = vcvtdq2ps_avx(auVar329);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar113 * 0x18 + 6);
  auVar193 = vpmovsxwd_avx(auVar17);
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar194 = vsubps_avx(auVar193,auVar329);
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + uVar113 * 0x1d + 6);
  auVar193 = vpmovsxwd_avx(auVar175);
  auVar221._0_4_ = auVar194._0_4_ * fVar219 + auVar329._0_4_;
  auVar221._4_4_ = auVar194._4_4_ * fVar201 + auVar329._4_4_;
  auVar221._8_4_ = auVar194._8_4_ * fVar185 + auVar329._8_4_;
  auVar221._12_4_ = auVar194._12_4_ * fVar187 + auVar329._12_4_;
  auVar329 = vcvtdq2ps_avx(auVar193);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar113 * 0x21 + 6);
  auVar193 = vpmovsxwd_avx(auVar15);
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar193 = vsubps_avx(auVar193,auVar329);
  auVar293._0_4_ = auVar193._0_4_ * fVar219 + auVar329._0_4_;
  auVar293._4_4_ = auVar193._4_4_ * fVar201 + auVar329._4_4_;
  auVar293._8_4_ = auVar193._8_4_ * fVar185 + auVar329._8_4_;
  auVar293._12_4_ = auVar193._12_4_ * fVar187 + auVar329._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar113 * 0x1f + 6);
  auVar329 = vpmovsxwd_avx(auVar18);
  local_4c8 = prim;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar113 * 0x23 + 6);
  auVar193 = vpmovsxwd_avx(auVar19);
  auVar329 = vcvtdq2ps_avx(auVar329);
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar193 = vsubps_avx(auVar193,auVar329);
  auVar172._0_4_ = auVar329._0_4_ + auVar193._0_4_ * fVar219;
  auVar172._4_4_ = auVar329._4_4_ + auVar193._4_4_ * fVar201;
  auVar172._8_4_ = auVar329._8_4_ + auVar193._8_4_ * fVar185;
  auVar172._12_4_ = auVar329._12_4_ + auVar193._12_4_ * fVar187;
  auVar329 = vsubps_avx(auVar154,auVar299);
  auVar155._0_4_ = fVar229 * auVar329._0_4_;
  auVar155._4_4_ = fVar237 * auVar329._4_4_;
  auVar155._8_4_ = fVar239 * auVar329._8_4_;
  auVar155._12_4_ = fVar241 * auVar329._12_4_;
  auVar329 = vsubps_avx(auVar126,auVar299);
  auVar127._0_4_ = fVar229 * auVar329._0_4_;
  auVar127._4_4_ = fVar237 * auVar329._4_4_;
  auVar127._8_4_ = fVar239 * auVar329._8_4_;
  auVar127._12_4_ = fVar241 * auVar329._12_4_;
  auVar329 = vsubps_avx(auVar191,auVar258);
  auVar192._0_4_ = fVar248 * auVar329._0_4_;
  auVar192._4_4_ = fVar253 * auVar329._4_4_;
  auVar192._8_4_ = fVar254 * auVar329._8_4_;
  auVar192._12_4_ = fVar255 * auVar329._12_4_;
  auVar329 = vsubps_avx(auVar221,auVar258);
  auVar222._0_4_ = fVar248 * auVar329._0_4_;
  auVar222._4_4_ = fVar253 * auVar329._4_4_;
  auVar222._8_4_ = fVar254 * auVar329._8_4_;
  auVar222._12_4_ = fVar255 * auVar329._12_4_;
  auVar329 = vsubps_avx(auVar293,auVar205);
  auVar233._0_4_ = fVar268 * auVar329._0_4_;
  auVar233._4_4_ = fVar275 * auVar329._4_4_;
  auVar233._8_4_ = fVar277 * auVar329._8_4_;
  auVar233._12_4_ = fVar280 * auVar329._12_4_;
  auVar329 = vsubps_avx(auVar172,auVar205);
  auVar173._0_4_ = fVar268 * auVar329._0_4_;
  auVar173._4_4_ = fVar275 * auVar329._4_4_;
  auVar173._8_4_ = fVar277 * auVar329._8_4_;
  auVar173._12_4_ = fVar280 * auVar329._12_4_;
  auVar329 = vpminsd_avx(auVar155,auVar127);
  auVar193 = vpminsd_avx(auVar192,auVar222);
  auVar329 = vmaxps_avx(auVar329,auVar193);
  auVar193 = vpminsd_avx(auVar233,auVar173);
  uVar121 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar259._4_4_ = uVar121;
  auVar259._0_4_ = uVar121;
  auVar259._8_4_ = uVar121;
  auVar259._12_4_ = uVar121;
  auVar193 = vmaxps_avx(auVar193,auVar259);
  auVar329 = vmaxps_avx(auVar329,auVar193);
  local_2b0._0_4_ = auVar329._0_4_ * 0.99999964;
  local_2b0._4_4_ = auVar329._4_4_ * 0.99999964;
  local_2b0._8_4_ = auVar329._8_4_ * 0.99999964;
  local_2b0._12_4_ = auVar329._12_4_ * 0.99999964;
  auVar329 = vpmaxsd_avx(auVar155,auVar127);
  auVar193 = vpmaxsd_avx(auVar192,auVar222);
  auVar329 = vminps_avx(auVar329,auVar193);
  auVar193 = vpmaxsd_avx(auVar233,auVar173);
  fVar248 = ray->tfar;
  auVar174._4_4_ = fVar248;
  auVar174._0_4_ = fVar248;
  auVar174._8_4_ = fVar248;
  auVar174._12_4_ = fVar248;
  auVar193 = vminps_avx(auVar193,auVar174);
  auVar329 = vminps_avx(auVar329,auVar193);
  auVar128._0_4_ = auVar329._0_4_ * 1.0000004;
  auVar128._4_4_ = auVar329._4_4_ * 1.0000004;
  auVar128._8_4_ = auVar329._8_4_ * 1.0000004;
  auVar128._12_4_ = auVar329._12_4_ * 1.0000004;
  auVar329 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar193 = vpcmpgtd_avx(auVar329,_DAT_01f4ad30);
  auVar329 = vcmpps_avx(local_2b0,auVar128,2);
  auVar329 = vandps_avx(auVar329,auVar193);
  uVar121 = vmovmskps_avx(auVar329);
  local_4c0 = mm_lookupmask_ps._16_8_;
  uStack_4b8 = mm_lookupmask_ps._24_8_;
  uStack_4b0 = mm_lookupmask_ps._16_8_;
  uStack_4a8 = mm_lookupmask_ps._24_8_;
  local_7f0 = context;
  for (uVar113 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar121); uVar113 != 0;
      uVar113 = (ulong)((uint)uVar113 & (uint)uVar113 + 0xf & uVar117)) {
    lVar122 = 0;
    if (uVar113 != 0) {
      for (; (uVar113 >> lVar122 & 1) == 0; lVar122 = lVar122 + 1) {
      }
    }
    local_730 = (ulong)*(uint *)(local_4c8 + 2);
    pGVar10 = (local_7f0->scene->geometries).items[*(uint *)(local_4c8 + 2)].ptr;
    local_648 = (ulong)*(uint *)(local_4c8 + lVar122 * 4 + 6);
    uVar116 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                              (ulong)*(uint *)(local_4c8 + lVar122 * 4 + 6) *
                              pGVar10[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar248 = (pGVar10->time_range).lower;
    fVar248 = pGVar10->fnumTimeSegments *
              (((ray->dir).field_0.m128[3] - fVar248) / ((pGVar10->time_range).upper - fVar248));
    auVar329 = vroundss_avx(ZEXT416((uint)fVar248),ZEXT416((uint)fVar248),9);
    auVar329 = vminss_avx(auVar329,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
    auVar329 = vmaxss_avx(ZEXT816(0) << 0x20,auVar329);
    fVar248 = fVar248 - auVar329._0_4_;
    _Var11 = pGVar10[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar120 = (long)(int)auVar329._0_4_ * 0x38;
    lVar122 = *(long *)(_Var11 + 0x10 + lVar120);
    lVar119 = *(long *)(_Var11 + 0x38 + lVar120);
    lVar118 = *(long *)(_Var11 + 0x48 + lVar120);
    auVar329 = vshufps_avx(ZEXT416((uint)fVar248),ZEXT416((uint)fVar248),0);
    pfVar1 = (float *)(lVar119 + uVar116 * lVar118);
    fVar254 = auVar329._0_4_;
    fVar277 = auVar329._4_4_;
    fVar255 = auVar329._8_4_;
    fVar280 = auVar329._12_4_;
    pfVar2 = (float *)(lVar119 + (uVar116 + 1) * lVar118);
    pfVar3 = (float *)(lVar119 + (uVar116 + 2) * lVar118);
    pfVar4 = (float *)(lVar119 + lVar118 * (uVar116 + 3));
    lVar119 = *(long *)(_Var11 + lVar120);
    auVar329 = vshufps_avx(ZEXT416((uint)(1.0 - fVar248)),ZEXT416((uint)(1.0 - fVar248)),0);
    pfVar5 = (float *)(lVar119 + lVar122 * uVar116);
    fVar248 = auVar329._0_4_;
    fVar268 = auVar329._4_4_;
    fVar253 = auVar329._8_4_;
    fVar275 = auVar329._12_4_;
    pfVar6 = (float *)(lVar119 + lVar122 * (uVar116 + 1));
    local_690 = (undefined1  [8])
                CONCAT44(fVar277 * pfVar1[1] + fVar268 * pfVar5[1],
                         fVar254 * *pfVar1 + fVar248 * *pfVar5);
    uStack_688._0_4_ = fVar255 * pfVar1[2] + fVar253 * pfVar5[2];
    uStack_688._4_4_ = fVar280 * pfVar1[3] + fVar275 * pfVar5[3];
    local_6a0 = (undefined1  [8])
                CONCAT44(fVar268 * pfVar6[1] + fVar277 * pfVar2[1],
                         fVar248 * *pfVar6 + fVar254 * *pfVar2);
    uStack_698._0_4_ = fVar253 * pfVar6[2] + fVar255 * pfVar2[2];
    uStack_698._4_4_ = fVar275 * pfVar6[3] + fVar280 * pfVar2[3];
    pfVar1 = (float *)(lVar119 + lVar122 * (uVar116 + 2));
    pfVar2 = (float *)(lVar119 + lVar122 * (uVar116 + 3));
    local_590 = (undefined1  [8])
                CONCAT44(fVar268 * pfVar1[1] + fVar277 * pfVar3[1],
                         fVar248 * *pfVar1 + fVar254 * *pfVar3);
    uStack_588._0_4_ = fVar253 * pfVar1[2] + fVar255 * pfVar3[2];
    uStack_588._4_4_ = fVar275 * pfVar1[3] + fVar280 * pfVar3[3];
    local_5a0._0_4_ = fVar248 * *pfVar2 + fVar254 * *pfVar4;
    local_5a0._4_4_ = fVar268 * pfVar2[1] + fVar277 * pfVar4[1];
    fStack_598 = fVar253 * pfVar2[2] + fVar255 * pfVar4[2];
    fStack_594 = fVar275 * pfVar2[3] + fVar280 * pfVar4[3];
    uVar117 = (uint)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar8 = (ray->org).field_0;
    auVar194 = vsubps_avx(_local_690,(undefined1  [16])aVar8);
    auVar17 = _local_690;
    auVar329 = vshufps_avx(auVar194,auVar194,0);
    auVar193 = vshufps_avx(auVar194,auVar194,0x55);
    auVar194 = vshufps_avx(auVar194,auVar194,0xaa);
    fVar248 = (local_728->ray_space).vx.field_0.m128[0];
    fVar268 = (local_728->ray_space).vx.field_0.m128[1];
    fVar253 = (local_728->ray_space).vx.field_0.m128[2];
    fVar275 = (local_728->ray_space).vx.field_0.m128[3];
    fVar254 = (local_728->ray_space).vy.field_0.m128[0];
    fVar277 = (local_728->ray_space).vy.field_0.m128[1];
    fVar255 = (local_728->ray_space).vy.field_0.m128[2];
    fVar280 = (local_728->ray_space).vy.field_0.m128[3];
    fVar219 = (local_728->ray_space).vz.field_0.m128[0];
    fVar201 = (local_728->ray_space).vz.field_0.m128[1];
    fVar185 = (local_728->ray_space).vz.field_0.m128[2];
    fVar187 = (local_728->ray_space).vz.field_0.m128[3];
    auVar300._0_4_ = auVar329._0_4_ * fVar248 + auVar194._0_4_ * fVar219 + auVar193._0_4_ * fVar254;
    auVar300._4_4_ = auVar329._4_4_ * fVar268 + auVar194._4_4_ * fVar201 + auVar193._4_4_ * fVar277;
    auVar300._8_4_ = auVar329._8_4_ * fVar253 + auVar194._8_4_ * fVar185 + auVar193._8_4_ * fVar255;
    auVar300._12_4_ =
         auVar329._12_4_ * fVar275 + auVar194._12_4_ * fVar187 + auVar193._12_4_ * fVar280;
    auVar329 = vblendps_avx(auVar300,_local_690,8);
    auVar16 = _local_6a0;
    auVar195 = vsubps_avx(_local_6a0,(undefined1  [16])aVar8);
    auVar193 = vshufps_avx(auVar195,auVar195,0);
    auVar194 = vshufps_avx(auVar195,auVar195,0x55);
    auVar195 = vshufps_avx(auVar195,auVar195,0xaa);
    auVar310._0_4_ = auVar193._0_4_ * fVar248 + auVar195._0_4_ * fVar219 + auVar194._0_4_ * fVar254;
    auVar310._4_4_ = auVar193._4_4_ * fVar268 + auVar195._4_4_ * fVar201 + auVar194._4_4_ * fVar277;
    auVar310._8_4_ = auVar193._8_4_ * fVar253 + auVar195._8_4_ * fVar185 + auVar194._8_4_ * fVar255;
    auVar310._12_4_ =
         auVar193._12_4_ * fVar275 + auVar195._12_4_ * fVar187 + auVar194._12_4_ * fVar280;
    auVar193 = vblendps_avx(auVar310,_local_6a0,8);
    auVar20 = vsubps_avx(_local_590,(undefined1  [16])aVar8);
    auVar194 = vshufps_avx(auVar20,auVar20,0);
    auVar195 = vshufps_avx(auVar20,auVar20,0x55);
    auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
    auVar250._0_4_ = auVar194._0_4_ * fVar248 + auVar195._0_4_ * fVar254 + auVar20._0_4_ * fVar219;
    auVar250._4_4_ = auVar194._4_4_ * fVar268 + auVar195._4_4_ * fVar277 + auVar20._4_4_ * fVar201;
    auVar250._8_4_ = auVar194._8_4_ * fVar253 + auVar195._8_4_ * fVar255 + auVar20._8_4_ * fVar185;
    auVar250._12_4_ =
         auVar194._12_4_ * fVar275 + auVar195._12_4_ * fVar280 + auVar20._12_4_ * fVar187;
    auVar194 = vblendps_avx(auVar250,_local_590,8);
    auVar14 = vsubps_avx(_local_5a0,(undefined1  [16])aVar8);
    auVar195 = vshufps_avx(auVar14,auVar14,0xaa);
    auVar20 = vshufps_avx(auVar14,auVar14,0);
    auVar14 = vshufps_avx(auVar14,auVar14,0x55);
    auVar156._0_4_ = auVar20._0_4_ * fVar248 + auVar195._0_4_ * fVar219 + auVar14._0_4_ * fVar254;
    auVar156._4_4_ = auVar20._4_4_ * fVar268 + auVar195._4_4_ * fVar201 + auVar14._4_4_ * fVar277;
    auVar156._8_4_ = auVar20._8_4_ * fVar253 + auVar195._8_4_ * fVar185 + auVar14._8_4_ * fVar255;
    auVar156._12_4_ =
         auVar20._12_4_ * fVar275 + auVar195._12_4_ * fVar187 + auVar14._12_4_ * fVar280;
    auVar195 = vblendps_avx(auVar156,_local_5a0,8);
    auVar206._8_4_ = 0x7fffffff;
    auVar206._0_8_ = 0x7fffffff7fffffff;
    auVar206._12_4_ = 0x7fffffff;
    auVar329 = vandps_avx(auVar329,auVar206);
    auVar193 = vandps_avx(auVar193,auVar206);
    auVar20 = vmaxps_avx(auVar329,auVar193);
    auVar329 = vandps_avx(auVar194,auVar206);
    auVar193 = vandps_avx(auVar195,auVar206);
    auVar329 = vmaxps_avx(auVar329,auVar193);
    auVar329 = vmaxps_avx(auVar20,auVar329);
    auVar193 = vmovshdup_avx(auVar329);
    auVar193 = vmaxss_avx(auVar193,auVar329);
    auVar329 = vshufpd_avx(auVar329,auVar329,1);
    auVar329 = vmaxss_avx(auVar329,auVar193);
    local_7e8 = (long)(int)uVar117;
    lVar122 = local_7e8 * 0x44;
    fVar202 = *(float *)(catmullrom_basis0 + lVar122 + 0x908);
    fVar302 = *(float *)(catmullrom_basis0 + lVar122 + 0x90c);
    fVar269 = *(float *)(catmullrom_basis0 + lVar122 + 0x910);
    fVar303 = *(float *)(catmullrom_basis0 + lVar122 + 0x914);
    fVar316 = *(float *)(catmullrom_basis0 + lVar122 + 0x918);
    fVar304 = *(float *)(catmullrom_basis0 + lVar122 + 0x91c);
    fVar227 = *(float *)(catmullrom_basis0 + lVar122 + 0x920);
    local_640._0_16_ = auVar250;
    auVar193 = vshufps_avx(auVar250,auVar250,0);
    register0x00001250 = auVar193;
    _local_7c0 = auVar193;
    fVar277 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar122 + 0xd8c);
    fVar280 = *(float *)(catmullrom_basis0 + lVar122 + 0xd90);
    fVar219 = *(float *)(catmullrom_basis0 + lVar122 + 0xd94);
    fVar185 = *(float *)(catmullrom_basis0 + lVar122 + 0xd98);
    fVar187 = *(float *)(catmullrom_basis0 + lVar122 + 0xd9c);
    fVar229 = *(float *)(catmullrom_basis0 + lVar122 + 0xda0);
    fVar237 = *(float *)(catmullrom_basis0 + lVar122 + 0xda4);
    auVar109 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar122 + 0xd8c);
    auVar194 = vshufps_avx(auVar156,auVar156,0);
    register0x00001590 = auVar194;
    _local_420 = auVar194;
    fVar246 = auVar194._0_4_;
    fVar247 = auVar194._4_4_;
    fVar279 = auVar194._8_4_;
    fVar282 = auVar194._12_4_;
    fVar152 = auVar193._0_4_;
    fVar164 = auVar193._4_4_;
    fVar165 = auVar193._8_4_;
    fVar166 = auVar193._12_4_;
    auVar193 = vshufps_avx(auVar250,auVar250,0x55);
    register0x000012d0 = auVar193;
    _local_780 = auVar193;
    auVar194 = vshufps_avx(auVar156,auVar156,0x55);
    register0x00001210 = auVar194;
    _local_760 = auVar194;
    fVar124 = auVar194._0_4_;
    fVar142 = auVar194._4_4_;
    fVar144 = auVar194._8_4_;
    fVar146 = auVar194._12_4_;
    fVar190 = auVar193._0_4_;
    fVar198 = auVar193._4_4_;
    fVar199 = auVar193._8_4_;
    fVar200 = auVar193._12_4_;
    auVar14 = _local_590;
    auVar193 = vshufps_avx(_local_590,_local_590,0xff);
    register0x00001390 = auVar193;
    _local_80 = auVar193;
    auVar194 = vshufps_avx(_local_5a0,_local_5a0,0xff);
    register0x00001450 = auVar194;
    _local_a0 = auVar194;
    fVar240 = auVar194._0_4_;
    fVar242 = auVar194._4_4_;
    fVar243 = auVar194._8_4_;
    fVar244 = auVar194._12_4_;
    fVar145 = auVar193._0_4_;
    fVar147 = auVar193._4_4_;
    fVar148 = auVar193._8_4_;
    auVar194 = vshufps_avx(auVar310,auVar310,0);
    register0x00001310 = auVar194;
    _local_7a0 = auVar194;
    fVar239 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar122 + 0x484);
    fVar241 = *(float *)(catmullrom_basis0 + lVar122 + 0x488);
    fVar317 = *(float *)(catmullrom_basis0 + lVar122 + 0x48c);
    fVar301 = *(float *)(catmullrom_basis0 + lVar122 + 0x490);
    fVar305 = *(float *)(catmullrom_basis0 + lVar122 + 0x494);
    fVar245 = *(float *)(catmullrom_basis0 + lVar122 + 0x498);
    fVar257 = *(float *)(catmullrom_basis0 + lVar122 + 0x49c);
    auVar110 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar122 + 0x484);
    fVar203 = auVar194._0_4_;
    fVar212 = auVar194._4_4_;
    fVar214 = auVar194._8_4_;
    fVar216 = auVar194._12_4_;
    auVar194 = vshufps_avx(auVar310,auVar310,0x55);
    register0x00001290 = auVar194;
    _local_320 = auVar194;
    fVar170 = auVar194._0_4_;
    fVar184 = auVar194._4_4_;
    fVar186 = auVar194._8_4_;
    fVar188 = auVar194._12_4_;
    auVar194 = vpermilps_avx(_local_6a0,0xff);
    register0x000015d0 = auVar194;
    _local_120 = auVar194;
    fVar284 = auVar194._0_4_;
    fVar286 = auVar194._4_4_;
    fVar288 = auVar194._8_4_;
    fVar321 = auVar194._12_4_;
    auVar194 = vshufps_avx(auVar300,auVar300,0);
    register0x00001250 = auVar194;
    _local_720 = auVar194;
    local_480 = *(float *)(catmullrom_basis0 + lVar122);
    fStack_47c = *(float *)(catmullrom_basis0 + lVar122 + 4);
    fStack_478 = *(float *)(catmullrom_basis0 + lVar122 + 8);
    fStack_474 = *(float *)(catmullrom_basis0 + lVar122 + 0xc);
    fStack_470 = *(float *)(catmullrom_basis0 + lVar122 + 0x10);
    fStack_46c = *(float *)(catmullrom_basis0 + lVar122 + 0x14);
    fStack_468 = *(float *)(catmullrom_basis0 + lVar122 + 0x18);
    fVar248 = auVar194._0_4_;
    fVar275 = auVar194._4_4_;
    fVar255 = auVar194._8_4_;
    fVar201 = auVar194._12_4_;
    auVar294._0_4_ = local_480 * fVar248 + fVar203 * fVar239 + fVar152 * fVar202 + fVar246 * fVar277
    ;
    auVar294._4_4_ =
         fStack_47c * fVar275 + fVar212 * fVar241 + fVar164 * fVar302 + fVar247 * fVar280;
    auVar294._8_4_ =
         fStack_478 * fVar255 + fVar214 * fVar317 + fVar165 * fVar269 + fVar279 * fVar219;
    auVar294._12_4_ =
         fStack_474 * fVar201 + fVar216 * fVar301 + fVar166 * fVar303 + fVar282 * fVar185;
    auVar295._16_4_ =
         fStack_470 * fVar248 + fVar203 * fVar305 + fVar152 * fVar316 + fVar246 * fVar187;
    auVar295._0_16_ = auVar294;
    auVar295._20_4_ =
         fStack_46c * fVar275 + fVar212 * fVar245 + fVar164 * fVar304 + fVar247 * fVar229;
    auVar295._24_4_ =
         fStack_468 * fVar255 + fVar214 * fVar257 + fVar165 * fVar227 + fVar279 * fVar237;
    auVar295._28_4_ = *(float *)(catmullrom_basis0 + lVar122 + 0xda8) + fVar166 + 0.0 + 0.0;
    auVar194 = vshufps_avx(auVar300,auVar300,0x55);
    register0x00001410 = auVar194;
    _local_340 = auVar194;
    fVar149 = auVar194._0_4_;
    fVar150 = auVar194._4_4_;
    fVar230 = auVar194._8_4_;
    fVar238 = auVar194._12_4_;
    auVar311._0_4_ = fVar149 * local_480 + fVar170 * fVar239 + fVar190 * fVar202 + fVar124 * fVar277
    ;
    auVar311._4_4_ =
         fVar150 * fStack_47c + fVar184 * fVar241 + fVar198 * fVar302 + fVar142 * fVar280;
    auVar311._8_4_ =
         fVar230 * fStack_478 + fVar186 * fVar317 + fVar199 * fVar269 + fVar144 * fVar219;
    auVar311._12_4_ =
         fVar238 * fStack_474 + fVar188 * fVar301 + fVar200 * fVar303 + fVar146 * fVar185;
    auVar311._16_4_ =
         fVar149 * fStack_470 + fVar170 * fVar305 + fVar190 * fVar316 + fVar124 * fVar187;
    auVar311._20_4_ =
         fVar150 * fStack_46c + fVar184 * fVar245 + fVar198 * fVar304 + fVar142 * fVar229;
    auVar311._24_4_ =
         fVar230 * fStack_468 + fVar186 * fVar257 + fVar199 * fVar227 + fVar144 * fVar237;
    auVar311._28_4_ = fVar200 + fVar146 + 0.0 + 0.0;
    auVar194 = vpermilps_avx(_local_690,0xff);
    register0x000013d0 = auVar194;
    _local_c0 = auVar194;
    fStack_464 = (float)*(undefined4 *)(catmullrom_basis0 + lVar122 + 0x1c);
    fVar268 = auVar194._0_4_;
    fVar253 = auVar194._4_4_;
    fVar254 = auVar194._8_4_;
    local_7e0._0_4_ =
         local_480 * fVar268 + fVar284 * fVar239 + fVar145 * fVar202 + fVar240 * fVar277;
    local_7e0._4_4_ =
         fStack_47c * fVar253 + fVar286 * fVar241 + fVar147 * fVar302 + fVar242 * fVar280;
    fStack_7d8 = fStack_478 * fVar254 + fVar288 * fVar317 + fVar148 * fVar269 + fVar243 * fVar219;
    fStack_7d4 = fStack_474 * auVar194._12_4_ +
                 fVar321 * fVar301 + auVar193._12_4_ * fVar303 + fVar244 * fVar185;
    fStack_7d0 = fStack_470 * fVar268 + fVar284 * fVar305 + fVar145 * fVar316 + fVar240 * fVar187;
    fStack_7cc = fStack_46c * fVar253 + fVar286 * fVar245 + fVar147 * fVar304 + fVar242 * fVar229;
    fStack_7c8 = fStack_468 * fVar254 + fVar288 * fVar257 + fVar148 * fVar227 + fVar243 * fVar237;
    fStack_7c4 = 0.0;
    fVar305 = *(float *)(catmullrom_basis1 + lVar122 + 0x908);
    fVar245 = *(float *)(catmullrom_basis1 + lVar122 + 0x90c);
    fVar257 = *(float *)(catmullrom_basis1 + lVar122 + 0x910);
    fVar217 = *(float *)(catmullrom_basis1 + lVar122 + 0x914);
    fVar167 = *(float *)(catmullrom_basis1 + lVar122 + 0x918);
    fVar264 = *(float *)(catmullrom_basis1 + lVar122 + 0x91c);
    fVar266 = *(float *)(catmullrom_basis1 + lVar122 + 0x920);
    fVar218 = *(float *)(catmullrom_basis1 + lVar122 + 0xd8c);
    fVar168 = *(float *)(catmullrom_basis1 + lVar122 + 0xd90);
    fVar267 = *(float *)(catmullrom_basis1 + lVar122 + 0xd94);
    fVar276 = *(float *)(catmullrom_basis1 + lVar122 + 0xd98);
    fVar278 = *(float *)(catmullrom_basis1 + lVar122 + 0xd9c);
    fVar281 = *(float *)(catmullrom_basis1 + lVar122 + 0xda0);
    fVar283 = *(float *)(catmullrom_basis1 + lVar122 + 0xda4);
    fVar277 = fVar216 + 0.0;
    fVar285 = *(float *)(catmullrom_basis1 + lVar122 + 0x484);
    fVar287 = *(float *)(catmullrom_basis1 + lVar122 + 0x488);
    fVar290 = *(float *)(catmullrom_basis1 + lVar122 + 0x48c);
    fVar189 = *(float *)(catmullrom_basis1 + lVar122 + 0x490);
    fVar125 = *(float *)(catmullrom_basis1 + lVar122 + 0x494);
    fVar143 = *(float *)(catmullrom_basis1 + lVar122 + 0x498);
    fVar169 = *(float *)(catmullrom_basis1 + lVar122 + 0x49c);
    fVar219 = fVar277 + fVar216 + 0.0;
    fVar228 = fVar277 + fVar244 + 0.0;
    fVar256 = *(float *)(catmullrom_basis1 + lVar122);
    fVar289 = *(float *)(catmullrom_basis1 + lVar122 + 4);
    fVar151 = *(float *)(catmullrom_basis1 + lVar122 + 8);
    fVar220 = *(float *)(catmullrom_basis1 + lVar122 + 0xc);
    fVar204 = *(float *)(catmullrom_basis1 + lVar122 + 0x10);
    fVar213 = *(float *)(catmullrom_basis1 + lVar122 + 0x14);
    fVar215 = *(float *)(catmullrom_basis1 + lVar122 + 0x18);
    local_360._0_4_ = fVar248 * fVar256 + fVar203 * fVar285 + fVar305 * fVar152 + fVar246 * fVar218;
    local_360._4_4_ = fVar275 * fVar289 + fVar212 * fVar287 + fVar245 * fVar164 + fVar247 * fVar168;
    local_360._8_4_ = fVar255 * fVar151 + fVar214 * fVar290 + fVar257 * fVar165 + fVar279 * fVar267;
    local_360._12_4_ = fVar201 * fVar220 + fVar216 * fVar189 + fVar217 * fVar166 + fVar282 * fVar276
    ;
    local_360._16_4_ = fVar248 * fVar204 + fVar203 * fVar125 + fVar167 * fVar152 + fVar246 * fVar278
    ;
    local_360._20_4_ = fVar275 * fVar213 + fVar212 * fVar143 + fVar264 * fVar164 + fVar247 * fVar281
    ;
    local_360._24_4_ = fVar255 * fVar215 + fVar214 * fVar169 + fVar266 * fVar165 + fVar279 * fVar283
    ;
    local_360._28_4_ = fVar321 + fVar282 + fVar277;
    local_4a0._0_4_ = fVar149 * fVar256 + fVar285 * fVar170 + fVar305 * fVar190 + fVar218 * fVar124;
    local_4a0._4_4_ = fVar150 * fVar289 + fVar287 * fVar184 + fVar245 * fVar198 + fVar168 * fVar142;
    fStack_498 = fVar230 * fVar151 + fVar290 * fVar186 + fVar257 * fVar199 + fVar267 * fVar144;
    fStack_494 = fVar238 * fVar220 + fVar189 * fVar188 + fVar217 * fVar200 + fVar276 * fVar146;
    fStack_490 = fVar149 * fVar204 + fVar125 * fVar170 + fVar167 * fVar190 + fVar278 * fVar124;
    fStack_48c = fVar150 * fVar213 + fVar143 * fVar184 + fVar264 * fVar198 + fVar281 * fVar142;
    fStack_488 = fVar230 * fVar215 + fVar169 * fVar186 + fVar266 * fVar199 + fVar283 * fVar144;
    register0x0000159c = fVar282 + fVar277 + fVar219;
    local_6c0._0_4_ = fVar268 * fVar256 + fVar284 * fVar285 + fVar145 * fVar305 + fVar240 * fVar218;
    local_6c0._4_4_ = fVar253 * fVar289 + fVar286 * fVar287 + fVar147 * fVar245 + fVar242 * fVar168;
    local_6c0._8_4_ = fVar254 * fVar151 + fVar288 * fVar290 + fVar148 * fVar257 + fVar243 * fVar267;
    local_6c0._12_4_ =
         auVar194._12_4_ * fVar220 +
         fVar321 * fVar189 + auVar193._12_4_ * fVar217 + fVar244 * fVar276;
    local_6c0._16_4_ = fVar268 * fVar204 + fVar284 * fVar125 + fVar145 * fVar167 + fVar240 * fVar278
    ;
    local_6c0._20_4_ = fVar253 * fVar213 + fVar286 * fVar143 + fVar147 * fVar264 + fVar242 * fVar281
    ;
    local_6c0._24_4_ = fVar254 * fVar215 + fVar288 * fVar169 + fVar148 * fVar266 + fVar243 * fVar283
    ;
    local_6c0._28_4_ = fVar219 + fVar228;
    auVar21 = vsubps_avx(local_360,auVar295);
    local_3c0 = vsubps_avx(_local_4a0,auVar311);
    fVar268 = auVar21._0_4_;
    fVar254 = auVar21._4_4_;
    auVar162._4_4_ = auVar311._4_4_ * fVar254;
    auVar162._0_4_ = auVar311._0_4_ * fVar268;
    fVar280 = auVar21._8_4_;
    auVar162._8_4_ = auVar311._8_4_ * fVar280;
    fVar185 = auVar21._12_4_;
    auVar162._12_4_ = auVar311._12_4_ * fVar185;
    fVar229 = auVar21._16_4_;
    auVar162._16_4_ = auVar311._16_4_ * fVar229;
    fVar239 = auVar21._20_4_;
    auVar162._20_4_ = auVar311._20_4_ * fVar239;
    fVar317 = auVar21._24_4_;
    auVar162._24_4_ = auVar311._24_4_ * fVar317;
    auVar162._28_4_ = fVar219;
    fVar253 = local_3c0._0_4_;
    fVar277 = local_3c0._4_4_;
    auVar22._4_4_ = auVar294._4_4_ * fVar277;
    auVar22._0_4_ = auVar294._0_4_ * fVar253;
    fVar219 = local_3c0._8_4_;
    auVar22._8_4_ = auVar294._8_4_ * fVar219;
    fVar187 = local_3c0._12_4_;
    auVar22._12_4_ = auVar294._12_4_ * fVar187;
    fVar237 = local_3c0._16_4_;
    auVar22._16_4_ = auVar295._16_4_ * fVar237;
    fVar241 = local_3c0._20_4_;
    auVar22._20_4_ = auVar295._20_4_ * fVar241;
    fVar301 = local_3c0._24_4_;
    auVar22._24_4_ = auVar295._24_4_ * fVar301;
    auVar22._28_4_ = fVar228;
    auVar22 = vsubps_avx(auVar162,auVar22);
    auVar162 = vmaxps_avx(_local_7e0,local_6c0);
    auVar30._4_4_ = auVar162._4_4_ * auVar162._4_4_ * (fVar254 * fVar254 + fVar277 * fVar277);
    auVar30._0_4_ = auVar162._0_4_ * auVar162._0_4_ * (fVar268 * fVar268 + fVar253 * fVar253);
    auVar30._8_4_ = auVar162._8_4_ * auVar162._8_4_ * (fVar280 * fVar280 + fVar219 * fVar219);
    auVar30._12_4_ = auVar162._12_4_ * auVar162._12_4_ * (fVar185 * fVar185 + fVar187 * fVar187);
    auVar30._16_4_ = auVar162._16_4_ * auVar162._16_4_ * (fVar229 * fVar229 + fVar237 * fVar237);
    auVar30._20_4_ = auVar162._20_4_ * auVar162._20_4_ * (fVar239 * fVar239 + fVar241 * fVar241);
    auVar30._24_4_ = auVar162._24_4_ * auVar162._24_4_ * (fVar317 * fVar317 + fVar301 * fVar301);
    auVar30._28_4_ = local_360._28_4_ + fVar228;
    auVar23._4_4_ = auVar22._4_4_ * auVar22._4_4_;
    auVar23._0_4_ = auVar22._0_4_ * auVar22._0_4_;
    auVar23._8_4_ = auVar22._8_4_ * auVar22._8_4_;
    auVar23._12_4_ = auVar22._12_4_ * auVar22._12_4_;
    auVar23._16_4_ = auVar22._16_4_ * auVar22._16_4_;
    auVar23._20_4_ = auVar22._20_4_ * auVar22._20_4_;
    auVar23._24_4_ = auVar22._24_4_ * auVar22._24_4_;
    auVar23._28_4_ = auVar22._28_4_;
    auVar162 = vcmpps_avx(auVar23,auVar30,2);
    fVar268 = auVar329._0_4_ * 4.7683716e-07;
    auVar183 = ZEXT464((uint)fVar268);
    auVar223._0_4_ = (float)(int)uVar117;
    auVar223._4_12_ = auVar294._4_12_;
    local_440 = auVar223._0_4_;
    fStack_43c = auVar294._4_4_;
    fStack_438 = auVar294._8_4_;
    fStack_434 = auVar294._12_4_;
    auVar329 = vshufps_avx(auVar223,auVar223,0);
    auVar224._16_16_ = auVar329;
    auVar224._0_16_ = auVar329;
    auVar22 = vcmpps_avx(_DAT_01f7b060,auVar224,1);
    auVar329 = vpermilps_avx(auVar300,0xaa);
    register0x000013d0 = auVar329;
    _local_460 = auVar329;
    auVar193 = vpermilps_avx(auVar310,0xaa);
    register0x00001590 = auVar193;
    _local_2e0 = auVar193;
    auVar194 = vpermilps_avx(auVar250,0xaa);
    register0x000015d0 = auVar194;
    _local_300 = auVar194;
    auVar195 = vpermilps_avx(auVar156,0xaa);
    register0x00001490 = auVar195;
    _local_580 = auVar195;
    auVar30 = auVar22 & auVar162;
    auVar20 = vpermilps_avx((undefined1  [16])aVar8,0xff);
    local_620 = ZEXT1632(auVar20);
    auVar175 = ZEXT416((uint)fVar268);
    fVar268 = fVar124;
    fVar253 = fVar142;
    fVar254 = fVar144;
    fVar277 = fVar146;
    fVar280 = fVar152;
    fVar219 = fVar164;
    fVar185 = fVar165;
    fVar187 = fVar203;
    fVar229 = fVar212;
    fVar237 = fVar214;
    fVar239 = fVar190;
    fVar241 = fVar198;
    fVar317 = fVar199;
    if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar30 >> 0x7f,0) == '\0') &&
          (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar30 >> 0xbf,0) == '\0') &&
        (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar30[0x1f]) {
      bVar123 = 0;
      auVar320 = ZEXT3264(_local_720);
      local_620._0_16_ = auVar20;
    }
    else {
      local_380 = vandps_avx(auVar162,auVar22);
      fVar145 = auVar329._0_4_;
      fVar147 = auVar329._4_4_;
      fVar148 = auVar329._8_4_;
      fVar240 = auVar329._12_4_;
      fVar286 = auVar193._0_4_;
      fVar288 = auVar193._4_4_;
      fVar321 = auVar193._8_4_;
      fVar322 = auVar193._12_4_;
      fVar323 = auVar194._0_4_;
      fVar326 = auVar194._4_4_;
      fVar327 = auVar194._8_4_;
      fVar328 = auVar194._12_4_;
      fVar242 = auVar195._0_4_;
      fVar243 = auVar195._4_4_;
      fVar244 = auVar195._8_4_;
      fVar284 = auVar195._12_4_;
      fVar228 = auVar22._28_4_ + 0.0;
      fVar301 = local_380._28_4_ + fVar228;
      local_3a0 = fVar145 * fVar256 + fVar286 * fVar285 + fVar323 * fVar305 + fVar242 * fVar218;
      fStack_39c = fVar147 * fVar289 + fVar288 * fVar287 + fVar326 * fVar245 + fVar243 * fVar168;
      fStack_398 = fVar148 * fVar151 + fVar321 * fVar290 + fVar327 * fVar257 + fVar244 * fVar267;
      fStack_394 = fVar240 * fVar220 + fVar322 * fVar189 + fVar328 * fVar217 + fVar284 * fVar276;
      fStack_390 = fVar145 * fVar204 + fVar286 * fVar125 + fVar323 * fVar167 + fVar242 * fVar278;
      fStack_38c = fVar147 * fVar213 + fVar288 * fVar143 + fVar326 * fVar264 + fVar243 * fVar281;
      fStack_388 = fVar148 * fVar215 + fVar321 * fVar169 + fVar327 * fVar266 + fVar244 * fVar283;
      fStack_384 = *(float *)(catmullrom_basis1 + lVar122 + 0x1c) + fVar301;
      local_600._0_4_ = auVar110._0_4_;
      local_600._4_4_ = auVar110._4_4_;
      fStack_5f8 = auVar110._8_4_;
      fStack_5f4 = auVar110._12_4_;
      fStack_5f0 = auVar110._16_4_;
      fStack_5ec = auVar110._20_4_;
      fStack_5e8 = auVar110._24_4_;
      local_5e0._0_4_ = auVar109._0_4_;
      local_5e0._4_4_ = auVar109._4_4_;
      fStack_5d8 = auVar109._8_4_;
      fStack_5d4 = auVar109._12_4_;
      fStack_5d0 = auVar109._16_4_;
      fStack_5cc = auVar109._20_4_;
      fStack_5c8 = auVar109._24_4_;
      local_5c0 = fVar145 * local_480 +
                  fVar286 * (float)local_600._0_4_ +
                  fVar323 * fVar202 + fVar242 * (float)local_5e0._0_4_;
      fStack_5bc = fVar147 * fStack_47c +
                   fVar288 * (float)local_600._4_4_ +
                   fVar326 * fVar302 + fVar243 * (float)local_5e0._4_4_;
      fStack_5b8 = fVar148 * fStack_478 +
                   fVar321 * fStack_5f8 + fVar327 * fVar269 + fVar244 * fStack_5d8;
      fStack_5b4 = fVar240 * fStack_474 +
                   fVar322 * fStack_5f4 + fVar328 * fVar303 + fVar284 * fStack_5d4;
      fStack_5b0 = fVar145 * fStack_470 +
                   fVar286 * fStack_5f0 + fVar323 * fVar316 + fVar242 * fStack_5d0;
      fStack_5ac = fVar147 * fStack_46c +
                   fVar288 * fStack_5ec + fVar326 * fVar304 + fVar243 * fStack_5cc;
      fStack_5a8 = fVar148 * fStack_468 +
                   fVar321 * fStack_5e8 + fVar327 * fVar227 + fVar244 * fStack_5c8;
      fStack_5a4 = fVar238 + fStack_384 + *(float *)(catmullrom_basis1 + lVar122 + 0x1c) + fVar301;
      fVar301 = *(float *)(catmullrom_basis0 + lVar122 + 0x1210);
      fVar202 = *(float *)(catmullrom_basis0 + lVar122 + 0x1214);
      fVar302 = *(float *)(catmullrom_basis0 + lVar122 + 0x1218);
      fVar269 = *(float *)(catmullrom_basis0 + lVar122 + 0x121c);
      fVar303 = *(float *)(catmullrom_basis0 + lVar122 + 0x1220);
      fVar316 = *(float *)(catmullrom_basis0 + lVar122 + 0x1224);
      fVar304 = *(float *)(catmullrom_basis0 + lVar122 + 0x1228);
      fVar227 = *(float *)(catmullrom_basis0 + lVar122 + 0x1694);
      fVar305 = *(float *)(catmullrom_basis0 + lVar122 + 0x1698);
      fVar245 = *(float *)(catmullrom_basis0 + lVar122 + 0x169c);
      fVar257 = *(float *)(catmullrom_basis0 + lVar122 + 0x16a0);
      fVar217 = *(float *)(catmullrom_basis0 + lVar122 + 0x16a4);
      fVar167 = *(float *)(catmullrom_basis0 + lVar122 + 0x16a8);
      fVar264 = *(float *)(catmullrom_basis0 + lVar122 + 0x16ac);
      fVar266 = *(float *)(catmullrom_basis0 + lVar122 + 0x1b18);
      fVar218 = *(float *)(catmullrom_basis0 + lVar122 + 0x1b1c);
      fVar168 = *(float *)(catmullrom_basis0 + lVar122 + 0x1b20);
      fVar267 = *(float *)(catmullrom_basis0 + lVar122 + 0x1b24);
      fVar276 = *(float *)(catmullrom_basis0 + lVar122 + 0x1b28);
      fVar278 = *(float *)(catmullrom_basis0 + lVar122 + 0x1b2c);
      fVar281 = *(float *)(catmullrom_basis0 + lVar122 + 0x1b30);
      fVar283 = *(float *)(catmullrom_basis0 + lVar122 + 0x1f9c);
      fVar285 = *(float *)(catmullrom_basis0 + lVar122 + 0x1fa0);
      fVar287 = *(float *)(catmullrom_basis0 + lVar122 + 0x1fa4);
      fVar290 = *(float *)(catmullrom_basis0 + lVar122 + 0x1fa8);
      fVar189 = *(float *)(catmullrom_basis0 + lVar122 + 0x1fac);
      fVar125 = *(float *)(catmullrom_basis0 + lVar122 + 0x1fb0);
      fVar143 = *(float *)(catmullrom_basis0 + lVar122 + 0x1fb4);
      local_640._0_16_ = auVar175;
      fVar256 = *(float *)(catmullrom_basis1 + lVar122 + 0x4a0) + fVar240;
      fVar169 = *(float *)(catmullrom_basis0 + lVar122 + 0x1b34) +
                *(float *)(catmullrom_basis0 + lVar122 + 0x1fb8);
      fVar289 = *(float *)(catmullrom_basis0 + lVar122 + 0x16b0) + fVar169;
      local_600._4_4_ =
           fVar275 * fVar202 + fVar305 * fVar212 + fVar164 * fVar218 + fVar247 * fVar285;
      local_600._0_4_ =
           fVar248 * fVar301 + fVar227 * fVar203 + fVar152 * fVar266 + fVar246 * fVar283;
      fStack_5f8 = fVar255 * fVar302 + fVar245 * fVar214 + fVar165 * fVar168 + fVar279 * fVar287;
      fStack_5f4 = fVar201 * fVar269 + fVar257 * fVar216 + fVar166 * fVar267 + fVar282 * fVar290;
      fStack_5f0 = fVar248 * fVar303 + fVar217 * fVar203 + fVar152 * fVar276 + fVar246 * fVar189;
      fStack_5ec = fVar275 * fVar316 + fVar167 * fVar212 + fVar164 * fVar278 + fVar247 * fVar125;
      fStack_5e8 = fVar255 * fVar304 + fVar264 * fVar214 + fVar165 * fVar281 + fVar279 * fVar143;
      fStack_5e4 = *(float *)(catmullrom_basis0 + lVar122 + 0x16b0) +
                   *(float *)(catmullrom_basis0 + lVar122 + 0x1fb8) + fVar256;
      auVar312._0_4_ = fVar149 * fVar301 + fVar170 * fVar227 + fVar190 * fVar266 + fVar124 * fVar283
      ;
      auVar312._4_4_ = fVar150 * fVar202 + fVar184 * fVar305 + fVar198 * fVar218 + fVar142 * fVar285
      ;
      auVar312._8_4_ = fVar230 * fVar302 + fVar186 * fVar245 + fVar199 * fVar168 + fVar144 * fVar287
      ;
      auVar312._12_4_ =
           fVar238 * fVar269 + fVar188 * fVar257 + fVar200 * fVar267 + fVar146 * fVar290;
      auVar312._16_4_ =
           fVar149 * fVar303 + fVar170 * fVar217 + fVar190 * fVar276 + fVar124 * fVar189;
      auVar312._20_4_ =
           fVar150 * fVar316 + fVar184 * fVar167 + fVar198 * fVar278 + fVar142 * fVar125;
      auVar312._24_4_ =
           fVar230 * fVar304 + fVar186 * fVar264 + fVar199 * fVar281 + fVar144 * fVar143;
      auVar312._28_4_ =
           fVar169 + fVar256 + *(float *)(catmullrom_basis1 + lVar122 + 0x4a0) + fVar228;
      auVar196._0_4_ = fVar286 * fVar227 + fVar323 * fVar266 + fVar242 * fVar283 + fVar145 * fVar301
      ;
      auVar196._4_4_ = fVar288 * fVar305 + fVar326 * fVar218 + fVar243 * fVar285 + fVar147 * fVar202
      ;
      auVar196._8_4_ = fVar321 * fVar245 + fVar327 * fVar168 + fVar244 * fVar287 + fVar148 * fVar302
      ;
      auVar196._12_4_ =
           fVar322 * fVar257 + fVar328 * fVar267 + fVar284 * fVar290 + fVar240 * fVar269;
      auVar196._16_4_ =
           fVar286 * fVar217 + fVar323 * fVar276 + fVar242 * fVar189 + fVar145 * fVar303;
      auVar196._20_4_ =
           fVar288 * fVar167 + fVar326 * fVar278 + fVar243 * fVar125 + fVar147 * fVar316;
      auVar196._24_4_ =
           fVar321 * fVar264 + fVar327 * fVar281 + fVar244 * fVar143 + fVar148 * fVar304;
      auVar196._28_4_ = fVar289 + *(float *)(catmullrom_basis0 + lVar122 + 0x122c);
      fVar301 = *(float *)(catmullrom_basis1 + lVar122 + 0x1b18);
      fVar202 = *(float *)(catmullrom_basis1 + lVar122 + 0x1b1c);
      fVar302 = *(float *)(catmullrom_basis1 + lVar122 + 0x1b20);
      fVar269 = *(float *)(catmullrom_basis1 + lVar122 + 0x1b24);
      fVar303 = *(float *)(catmullrom_basis1 + lVar122 + 0x1b28);
      fVar316 = *(float *)(catmullrom_basis1 + lVar122 + 0x1b2c);
      fVar304 = *(float *)(catmullrom_basis1 + lVar122 + 0x1b30);
      fVar227 = *(float *)(catmullrom_basis1 + lVar122 + 0x1f9c);
      fVar305 = *(float *)(catmullrom_basis1 + lVar122 + 0x1fa0);
      fVar245 = *(float *)(catmullrom_basis1 + lVar122 + 0x1fa4);
      fVar257 = *(float *)(catmullrom_basis1 + lVar122 + 0x1fa8);
      fVar217 = *(float *)(catmullrom_basis1 + lVar122 + 0x1fac);
      fVar167 = *(float *)(catmullrom_basis1 + lVar122 + 0x1fb0);
      fVar264 = *(float *)(catmullrom_basis1 + lVar122 + 0x1fb4);
      fVar266 = *(float *)(catmullrom_basis1 + lVar122 + 0x1694);
      fVar218 = *(float *)(catmullrom_basis1 + lVar122 + 0x1698);
      fVar168 = *(float *)(catmullrom_basis1 + lVar122 + 0x169c);
      fVar267 = *(float *)(catmullrom_basis1 + lVar122 + 0x16a0);
      fVar276 = *(float *)(catmullrom_basis1 + lVar122 + 0x16a4);
      fVar278 = *(float *)(catmullrom_basis1 + lVar122 + 0x16a8);
      fVar281 = *(float *)(catmullrom_basis1 + lVar122 + 0x16ac);
      fVar283 = *(float *)(catmullrom_basis1 + lVar122 + 0x1210);
      fVar285 = *(float *)(catmullrom_basis1 + lVar122 + 0x1214);
      fVar287 = *(float *)(catmullrom_basis1 + lVar122 + 0x1218);
      fVar290 = *(float *)(catmullrom_basis1 + lVar122 + 0x121c);
      fVar189 = *(float *)(catmullrom_basis1 + lVar122 + 0x1220);
      fVar125 = *(float *)(catmullrom_basis1 + lVar122 + 0x1224);
      fVar143 = *(float *)(catmullrom_basis1 + lVar122 + 0x1228);
      auVar260._0_4_ = fVar248 * fVar283 + fVar266 * fVar203 + fVar152 * fVar301 + fVar246 * fVar227
      ;
      auVar260._4_4_ = fVar275 * fVar285 + fVar218 * fVar212 + fVar164 * fVar202 + fVar247 * fVar305
      ;
      auVar260._8_4_ = fVar255 * fVar287 + fVar168 * fVar214 + fVar165 * fVar302 + fVar279 * fVar245
      ;
      auVar260._12_4_ =
           fVar201 * fVar290 + fVar267 * fVar216 + fVar166 * fVar269 + fVar282 * fVar257;
      auVar260._16_4_ =
           fVar248 * fVar189 + fVar276 * fVar203 + fVar152 * fVar303 + fVar246 * fVar217;
      auVar260._20_4_ =
           fVar275 * fVar125 + fVar278 * fVar212 + fVar164 * fVar316 + fVar247 * fVar167;
      auVar260._24_4_ =
           fVar255 * fVar143 + fVar281 * fVar214 + fVar165 * fVar304 + fVar279 * fVar264;
      auVar260._28_4_ = fVar200 + fVar200 + fVar289 + fVar282;
      auVar272._0_4_ = fVar149 * fVar283 + fVar170 * fVar266 + fVar190 * fVar301 + fVar124 * fVar227
      ;
      auVar272._4_4_ = fVar150 * fVar285 + fVar184 * fVar218 + fVar198 * fVar202 + fVar142 * fVar305
      ;
      auVar272._8_4_ = fVar230 * fVar287 + fVar186 * fVar168 + fVar199 * fVar302 + fVar144 * fVar245
      ;
      auVar272._12_4_ =
           fVar238 * fVar290 + fVar188 * fVar267 + fVar200 * fVar269 + fVar146 * fVar257;
      auVar272._16_4_ =
           fVar149 * fVar189 + fVar170 * fVar276 + fVar190 * fVar303 + fVar124 * fVar217;
      auVar272._20_4_ =
           fVar150 * fVar125 + fVar184 * fVar278 + fVar198 * fVar316 + fVar142 * fVar167;
      auVar272._24_4_ =
           fVar230 * fVar143 + fVar186 * fVar281 + fVar199 * fVar304 + fVar144 * fVar264;
      auVar272._28_4_ = fVar200 + fVar200 + fVar200 + fVar289;
      auVar207._0_4_ = fVar145 * fVar283 + fVar286 * fVar266 + fVar323 * fVar301 + fVar242 * fVar227
      ;
      auVar207._4_4_ = fVar147 * fVar285 + fVar288 * fVar218 + fVar326 * fVar202 + fVar243 * fVar305
      ;
      auVar207._8_4_ = fVar148 * fVar287 + fVar321 * fVar168 + fVar327 * fVar302 + fVar244 * fVar245
      ;
      auVar207._12_4_ =
           fVar240 * fVar290 + fVar322 * fVar267 + fVar328 * fVar269 + fVar284 * fVar257;
      auVar207._16_4_ =
           fVar145 * fVar189 + fVar286 * fVar276 + fVar323 * fVar303 + fVar242 * fVar217;
      auVar207._20_4_ =
           fVar147 * fVar125 + fVar288 * fVar278 + fVar326 * fVar316 + fVar243 * fVar167;
      auVar207._24_4_ =
           fVar148 * fVar143 + fVar321 * fVar281 + fVar327 * fVar304 + fVar244 * fVar264;
      auVar207._28_4_ =
           *(float *)(catmullrom_basis1 + lVar122 + 0x122c) +
           *(float *)(catmullrom_basis1 + lVar122 + 0x16b0) +
           *(float *)(catmullrom_basis1 + lVar122 + 0x1b34) +
           *(float *)(catmullrom_basis1 + lVar122 + 0x1fb8);
      auVar180._8_4_ = 0x7fffffff;
      auVar180._0_8_ = 0x7fffffff7fffffff;
      auVar180._12_4_ = 0x7fffffff;
      auVar180._16_4_ = 0x7fffffff;
      auVar180._20_4_ = 0x7fffffff;
      auVar180._24_4_ = 0x7fffffff;
      auVar180._28_4_ = 0x7fffffff;
      auVar162 = vandps_avx(_local_600,auVar180);
      auVar22 = vandps_avx(auVar312,auVar180);
      auVar22 = vmaxps_avx(auVar162,auVar22);
      auVar162 = vandps_avx(auVar196,auVar180);
      auVar162 = vmaxps_avx(auVar22,auVar162);
      auVar329 = vpermilps_avx(auVar175,0);
      auVar251._16_16_ = auVar329;
      auVar251._0_16_ = auVar329;
      auVar162 = vcmpps_avx(auVar162,auVar251,1);
      auVar30 = vblendvps_avx(_local_600,auVar21,auVar162);
      auVar23 = vblendvps_avx(auVar312,local_3c0,auVar162);
      auVar162 = vandps_avx(auVar260,auVar180);
      auVar22 = vandps_avx(auVar272,auVar180);
      auVar224 = vmaxps_avx(auVar162,auVar22);
      auVar162 = vandps_avx(auVar207,auVar180);
      auVar162 = vmaxps_avx(auVar224,auVar162);
      auVar224 = vcmpps_avx(auVar162,auVar251,1);
      auVar162 = vblendvps_avx(auVar260,auVar21,auVar224);
      auVar21 = vblendvps_avx(auVar272,local_3c0,auVar224);
      fVar125 = auVar30._0_4_;
      fVar143 = auVar30._4_4_;
      fVar169 = auVar30._8_4_;
      fVar256 = auVar30._12_4_;
      fVar289 = auVar30._16_4_;
      fVar151 = auVar30._20_4_;
      fVar220 = auVar30._24_4_;
      fVar204 = auVar162._0_4_;
      fVar213 = auVar162._4_4_;
      fVar215 = auVar162._8_4_;
      fVar170 = auVar162._12_4_;
      fVar184 = auVar162._16_4_;
      fVar186 = auVar162._20_4_;
      fVar188 = auVar162._24_4_;
      fVar248 = auVar23._0_4_;
      fVar301 = auVar23._4_4_;
      fVar303 = auVar23._8_4_;
      fVar305 = auVar23._12_4_;
      fVar167 = auVar23._16_4_;
      fVar168 = auVar23._20_4_;
      fVar281 = auVar23._24_4_;
      auVar131._0_4_ = fVar248 * fVar248 + fVar125 * fVar125;
      auVar131._4_4_ = fVar301 * fVar301 + fVar143 * fVar143;
      auVar131._8_4_ = fVar303 * fVar303 + fVar169 * fVar169;
      auVar131._12_4_ = fVar305 * fVar305 + fVar256 * fVar256;
      auVar131._16_4_ = fVar167 * fVar167 + fVar289 * fVar289;
      auVar131._20_4_ = fVar168 * fVar168 + fVar151 * fVar151;
      auVar131._24_4_ = fVar281 * fVar281 + fVar220 * fVar220;
      auVar131._28_4_ = auVar272._28_4_ + auVar30._28_4_;
      auVar30 = vrsqrtps_avx(auVar131);
      fVar275 = auVar30._0_4_;
      fVar255 = auVar30._4_4_;
      auVar26._4_4_ = fVar255 * 1.5;
      auVar26._0_4_ = fVar275 * 1.5;
      fVar201 = auVar30._8_4_;
      auVar26._8_4_ = fVar201 * 1.5;
      fVar202 = auVar30._12_4_;
      auVar26._12_4_ = fVar202 * 1.5;
      fVar302 = auVar30._16_4_;
      auVar26._16_4_ = fVar302 * 1.5;
      fVar269 = auVar30._20_4_;
      auVar26._20_4_ = fVar269 * 1.5;
      fVar316 = auVar30._24_4_;
      auVar26._24_4_ = fVar316 * 1.5;
      auVar26._28_4_ = auVar22._28_4_;
      auVar13._4_4_ = fVar255 * fVar255 * fVar255 * auVar131._4_4_ * 0.5;
      auVar13._0_4_ = fVar275 * fVar275 * fVar275 * auVar131._0_4_ * 0.5;
      auVar13._8_4_ = fVar201 * fVar201 * fVar201 * auVar131._8_4_ * 0.5;
      auVar13._12_4_ = fVar202 * fVar202 * fVar202 * auVar131._12_4_ * 0.5;
      auVar13._16_4_ = fVar302 * fVar302 * fVar302 * auVar131._16_4_ * 0.5;
      auVar13._20_4_ = fVar269 * fVar269 * fVar269 * auVar131._20_4_ * 0.5;
      auVar13._24_4_ = fVar316 * fVar316 * fVar316 * auVar131._24_4_ * 0.5;
      auVar13._28_4_ = auVar131._28_4_;
      auVar30 = vsubps_avx(auVar26,auVar13);
      fVar275 = auVar30._0_4_;
      fVar202 = auVar30._4_4_;
      fVar316 = auVar30._8_4_;
      fVar245 = auVar30._12_4_;
      fVar264 = auVar30._16_4_;
      fVar267 = auVar30._20_4_;
      fVar283 = auVar30._24_4_;
      fVar290 = auVar23._28_4_;
      fVar255 = auVar21._0_4_;
      fVar302 = auVar21._4_4_;
      fVar304 = auVar21._8_4_;
      fVar257 = auVar21._12_4_;
      fVar266 = auVar21._16_4_;
      fVar276 = auVar21._20_4_;
      fVar285 = auVar21._24_4_;
      auVar132._0_4_ = fVar255 * fVar255 + fVar204 * fVar204;
      auVar132._4_4_ = fVar302 * fVar302 + fVar213 * fVar213;
      auVar132._8_4_ = fVar304 * fVar304 + fVar215 * fVar215;
      auVar132._12_4_ = fVar257 * fVar257 + fVar170 * fVar170;
      auVar132._16_4_ = fVar266 * fVar266 + fVar184 * fVar184;
      auVar132._20_4_ = fVar276 * fVar276 + fVar186 * fVar186;
      auVar132._24_4_ = fVar285 * fVar285 + fVar188 * fVar188;
      auVar132._28_4_ = auVar162._28_4_ + auVar30._28_4_;
      auVar162 = vrsqrtps_avx(auVar132);
      fVar201 = auVar162._0_4_;
      fVar269 = auVar162._4_4_;
      auVar24._4_4_ = fVar269 * 1.5;
      auVar24._0_4_ = fVar201 * 1.5;
      fVar227 = auVar162._8_4_;
      auVar24._8_4_ = fVar227 * 1.5;
      fVar217 = auVar162._12_4_;
      auVar24._12_4_ = fVar217 * 1.5;
      fVar218 = auVar162._16_4_;
      auVar24._16_4_ = fVar218 * 1.5;
      fVar278 = auVar162._20_4_;
      auVar24._20_4_ = fVar278 * 1.5;
      fVar287 = auVar162._24_4_;
      auVar24._24_4_ = fVar287 * 1.5;
      auVar24._28_4_ = auVar22._28_4_;
      fVar189 = auVar162._28_4_;
      auVar25._4_4_ = fVar269 * fVar269 * fVar269 * auVar132._4_4_ * 0.5;
      auVar25._0_4_ = fVar201 * fVar201 * fVar201 * auVar132._0_4_ * 0.5;
      auVar25._8_4_ = fVar227 * fVar227 * fVar227 * auVar132._8_4_ * 0.5;
      auVar25._12_4_ = fVar217 * fVar217 * fVar217 * auVar132._12_4_ * 0.5;
      auVar25._16_4_ = fVar218 * fVar218 * fVar218 * auVar132._16_4_ * 0.5;
      auVar25._20_4_ = fVar278 * fVar278 * fVar278 * auVar132._20_4_ * 0.5;
      auVar25._24_4_ = fVar287 * fVar287 * fVar287 * auVar132._24_4_ * 0.5;
      auVar25._28_4_ = auVar132._28_4_;
      auVar162 = vsubps_avx(auVar24,auVar25);
      fVar201 = auVar162._0_4_;
      fVar269 = auVar162._4_4_;
      fVar227 = auVar162._8_4_;
      fVar217 = auVar162._12_4_;
      fVar218 = auVar162._16_4_;
      fVar278 = auVar162._20_4_;
      fVar287 = auVar162._24_4_;
      fVar248 = (float)local_7e0._0_4_ * fVar248 * fVar275;
      fVar301 = (float)local_7e0._4_4_ * fVar301 * fVar202;
      auVar27._4_4_ = fVar301;
      auVar27._0_4_ = fVar248;
      fVar303 = fStack_7d8 * fVar303 * fVar316;
      auVar27._8_4_ = fVar303;
      fVar305 = fStack_7d4 * fVar305 * fVar245;
      auVar27._12_4_ = fVar305;
      fVar167 = fStack_7d0 * fVar167 * fVar264;
      auVar27._16_4_ = fVar167;
      fVar168 = fStack_7cc * fVar168 * fVar267;
      auVar27._20_4_ = fVar168;
      fVar281 = fStack_7c8 * fVar281 * fVar283;
      auVar27._24_4_ = fVar281;
      auVar27._28_4_ = fVar290;
      local_5e0._4_4_ = auVar294._4_4_ + fVar301;
      local_5e0._0_4_ = auVar294._0_4_ + fVar248;
      fStack_5d8 = auVar294._8_4_ + fVar303;
      fStack_5d4 = auVar294._12_4_ + fVar305;
      fStack_5d0 = auVar295._16_4_ + fVar167;
      fStack_5cc = auVar295._20_4_ + fVar168;
      fStack_5c8 = auVar295._24_4_ + fVar281;
      fStack_5c4 = auVar295._28_4_ + fVar290;
      fVar248 = (float)local_7e0._0_4_ * fVar275 * -fVar125;
      fVar301 = (float)local_7e0._4_4_ * fVar202 * -fVar143;
      auVar29._4_4_ = fVar301;
      auVar29._0_4_ = fVar248;
      fVar303 = fStack_7d8 * fVar316 * -fVar169;
      auVar29._8_4_ = fVar303;
      fVar305 = fStack_7d4 * fVar245 * -fVar256;
      auVar29._12_4_ = fVar305;
      fVar167 = fStack_7d0 * fVar264 * -fVar289;
      auVar29._16_4_ = fVar167;
      fVar168 = fStack_7cc * fVar267 * -fVar151;
      auVar29._20_4_ = fVar168;
      fVar281 = fStack_7c8 * fVar283 * -fVar220;
      auVar29._24_4_ = fVar281;
      auVar29._28_4_ = 0x3f000000;
      local_600._4_4_ = fVar301 + auVar311._4_4_;
      local_600._0_4_ = fVar248 + auVar311._0_4_;
      fStack_5f8 = fVar303 + auVar311._8_4_;
      fStack_5f4 = fVar305 + auVar311._12_4_;
      fStack_5f0 = fVar167 + auVar311._16_4_;
      fStack_5ec = fVar168 + auVar311._20_4_;
      fStack_5e8 = fVar281 + auVar311._24_4_;
      fStack_5e4 = auVar311._28_4_ + 0.5;
      fVar248 = (float)local_7e0._0_4_ * fVar275 * 0.0;
      fVar275 = (float)local_7e0._4_4_ * fVar202 * 0.0;
      auVar28._4_4_ = fVar275;
      auVar28._0_4_ = fVar248;
      fVar301 = fStack_7d8 * fVar316 * 0.0;
      auVar28._8_4_ = fVar301;
      fVar202 = fStack_7d4 * fVar245 * 0.0;
      auVar28._12_4_ = fVar202;
      fVar303 = fStack_7d0 * fVar264 * 0.0;
      auVar28._16_4_ = fVar303;
      fVar316 = fStack_7cc * fVar267 * 0.0;
      auVar28._20_4_ = fVar316;
      fVar305 = fStack_7c8 * fVar283 * 0.0;
      auVar28._24_4_ = fVar305;
      auVar28._28_4_ = auVar312._28_4_;
      auVar102._4_4_ = fStack_5bc;
      auVar102._0_4_ = local_5c0;
      auVar102._8_4_ = fStack_5b8;
      auVar102._12_4_ = fStack_5b4;
      auVar102._16_4_ = fStack_5b0;
      auVar102._20_4_ = fStack_5ac;
      auVar102._24_4_ = fStack_5a8;
      auVar102._28_4_ = fStack_5a4;
      auVar261._0_4_ = fVar248 + local_5c0;
      auVar261._4_4_ = fVar275 + fStack_5bc;
      auVar261._8_4_ = fVar301 + fStack_5b8;
      auVar261._12_4_ = fVar202 + fStack_5b4;
      auVar261._16_4_ = fVar303 + fStack_5b0;
      auVar261._20_4_ = fVar316 + fStack_5ac;
      auVar261._24_4_ = fVar305 + fStack_5a8;
      auVar261._28_4_ = auVar312._28_4_ + fStack_5a4;
      fVar248 = (float)local_6c0._0_4_ * fVar255 * fVar201;
      fVar275 = local_6c0._4_4_ * fVar302 * fVar269;
      auVar31._4_4_ = fVar275;
      auVar31._0_4_ = fVar248;
      fVar255 = local_6c0._8_4_ * fVar304 * fVar227;
      auVar31._8_4_ = fVar255;
      fVar301 = local_6c0._12_4_ * fVar257 * fVar217;
      auVar31._12_4_ = fVar301;
      fVar202 = local_6c0._16_4_ * fVar266 * fVar218;
      auVar31._16_4_ = fVar202;
      fVar302 = local_6c0._20_4_ * fVar276 * fVar278;
      auVar31._20_4_ = fVar302;
      fVar303 = local_6c0._24_4_ * fVar285 * fVar287;
      auVar31._24_4_ = fVar303;
      auVar31._28_4_ = auVar21._28_4_;
      auVar23 = vsubps_avx(auVar295,auVar27);
      auVar296._0_4_ = local_360._0_4_ + fVar248;
      auVar296._4_4_ = local_360._4_4_ + fVar275;
      auVar296._8_4_ = local_360._8_4_ + fVar255;
      auVar296._12_4_ = local_360._12_4_ + fVar301;
      auVar296._16_4_ = local_360._16_4_ + fVar202;
      auVar296._20_4_ = local_360._20_4_ + fVar302;
      auVar296._24_4_ = local_360._24_4_ + fVar303;
      auVar296._28_4_ = local_360._28_4_ + auVar21._28_4_;
      fVar248 = (float)local_6c0._0_4_ * -fVar204 * fVar201;
      fVar275 = local_6c0._4_4_ * -fVar213 * fVar269;
      auVar21._4_4_ = fVar275;
      auVar21._0_4_ = fVar248;
      fVar255 = local_6c0._8_4_ * -fVar215 * fVar227;
      auVar21._8_4_ = fVar255;
      fVar301 = local_6c0._12_4_ * -fVar170 * fVar217;
      auVar21._12_4_ = fVar301;
      fVar202 = local_6c0._16_4_ * -fVar184 * fVar218;
      auVar21._16_4_ = fVar202;
      fVar302 = local_6c0._20_4_ * -fVar186 * fVar278;
      auVar21._20_4_ = fVar302;
      fVar303 = local_6c0._24_4_ * -fVar188 * fVar287;
      auVar21._24_4_ = fVar303;
      auVar21._28_4_ = fVar290;
      auVar26 = vsubps_avx(auVar311,auVar29);
      auVar319._0_4_ = (float)local_4a0._0_4_ + fVar248;
      auVar319._4_4_ = (float)local_4a0._4_4_ + fVar275;
      auVar319._8_4_ = fStack_498 + fVar255;
      auVar319._12_4_ = fStack_494 + fVar301;
      auVar319._16_4_ = fStack_490 + fVar202;
      auVar319._20_4_ = fStack_48c + fVar302;
      auVar319._24_4_ = fStack_488 + fVar303;
      auVar319._28_4_ = register0x0000159c + fVar290;
      fVar248 = fVar201 * 0.0 * (float)local_6c0._0_4_;
      fVar275 = fVar269 * 0.0 * local_6c0._4_4_;
      auVar32._4_4_ = fVar275;
      auVar32._0_4_ = fVar248;
      fVar255 = fVar227 * 0.0 * local_6c0._8_4_;
      auVar32._8_4_ = fVar255;
      fVar201 = fVar217 * 0.0 * local_6c0._12_4_;
      auVar32._12_4_ = fVar201;
      fVar301 = fVar218 * 0.0 * local_6c0._16_4_;
      auVar32._16_4_ = fVar301;
      fVar202 = fVar278 * 0.0 * local_6c0._20_4_;
      auVar32._20_4_ = fVar202;
      fVar302 = fVar287 * 0.0 * local_6c0._24_4_;
      auVar32._24_4_ = fVar302;
      auVar32._28_4_ = fVar189;
      auVar295 = vsubps_avx(auVar102,auVar28);
      auVar106._4_4_ = fStack_39c;
      auVar106._0_4_ = local_3a0;
      auVar106._8_4_ = fStack_398;
      auVar106._12_4_ = fStack_394;
      auVar106._16_4_ = fStack_390;
      auVar106._20_4_ = fStack_38c;
      auVar106._24_4_ = fStack_388;
      auVar106._28_4_ = fStack_384;
      auVar324._0_4_ = local_3a0 + fVar248;
      auVar324._4_4_ = fStack_39c + fVar275;
      auVar324._8_4_ = fStack_398 + fVar255;
      auVar324._12_4_ = fStack_394 + fVar201;
      auVar324._16_4_ = fStack_390 + fVar301;
      auVar324._20_4_ = fStack_38c + fVar202;
      auVar324._24_4_ = fStack_388 + fVar302;
      auVar324._28_4_ = fStack_384 + fVar189;
      auVar162 = vsubps_avx(local_360,auVar31);
      auVar22 = vsubps_avx(_local_4a0,auVar21);
      auVar21 = vsubps_avx(auVar106,auVar32);
      auVar30 = vsubps_avx(auVar319,auVar26);
      auVar224 = vsubps_avx(auVar324,auVar295);
      auVar33._4_4_ = auVar295._4_4_ * auVar30._4_4_;
      auVar33._0_4_ = auVar295._0_4_ * auVar30._0_4_;
      auVar33._8_4_ = auVar295._8_4_ * auVar30._8_4_;
      auVar33._12_4_ = auVar295._12_4_ * auVar30._12_4_;
      auVar33._16_4_ = auVar295._16_4_ * auVar30._16_4_;
      auVar33._20_4_ = auVar295._20_4_ * auVar30._20_4_;
      auVar33._24_4_ = auVar295._24_4_ * auVar30._24_4_;
      auVar33._28_4_ = fVar189;
      auVar34._4_4_ = auVar26._4_4_ * auVar224._4_4_;
      auVar34._0_4_ = auVar26._0_4_ * auVar224._0_4_;
      auVar34._8_4_ = auVar26._8_4_ * auVar224._8_4_;
      auVar34._12_4_ = auVar26._12_4_ * auVar224._12_4_;
      auVar34._16_4_ = auVar26._16_4_ * auVar224._16_4_;
      auVar34._20_4_ = auVar26._20_4_ * auVar224._20_4_;
      auVar34._24_4_ = auVar26._24_4_ * auVar224._24_4_;
      auVar34._28_4_ = register0x0000159c;
      auVar311 = vsubps_avx(auVar34,auVar33);
      auVar35._4_4_ = auVar23._4_4_ * auVar224._4_4_;
      auVar35._0_4_ = auVar23._0_4_ * auVar224._0_4_;
      auVar35._8_4_ = auVar23._8_4_ * auVar224._8_4_;
      auVar35._12_4_ = auVar23._12_4_ * auVar224._12_4_;
      auVar35._16_4_ = auVar23._16_4_ * auVar224._16_4_;
      auVar35._20_4_ = auVar23._20_4_ * auVar224._20_4_;
      auVar35._24_4_ = auVar23._24_4_ * auVar224._24_4_;
      auVar35._28_4_ = auVar224._28_4_;
      auVar13 = vsubps_avx(auVar296,auVar23);
      auVar36._4_4_ = auVar295._4_4_ * auVar13._4_4_;
      auVar36._0_4_ = auVar295._0_4_ * auVar13._0_4_;
      auVar36._8_4_ = auVar295._8_4_ * auVar13._8_4_;
      auVar36._12_4_ = auVar295._12_4_ * auVar13._12_4_;
      auVar36._16_4_ = auVar295._16_4_ * auVar13._16_4_;
      auVar36._20_4_ = auVar295._20_4_ * auVar13._20_4_;
      auVar36._24_4_ = auVar295._24_4_ * auVar13._24_4_;
      auVar36._28_4_ = local_360._28_4_;
      auVar24 = vsubps_avx(auVar36,auVar35);
      auVar37._4_4_ = auVar26._4_4_ * auVar13._4_4_;
      auVar37._0_4_ = auVar26._0_4_ * auVar13._0_4_;
      auVar37._8_4_ = auVar26._8_4_ * auVar13._8_4_;
      auVar37._12_4_ = auVar26._12_4_ * auVar13._12_4_;
      auVar37._16_4_ = auVar26._16_4_ * auVar13._16_4_;
      auVar37._20_4_ = auVar26._20_4_ * auVar13._20_4_;
      auVar37._24_4_ = auVar26._24_4_ * auVar13._24_4_;
      auVar37._28_4_ = auVar224._28_4_;
      auVar38._4_4_ = auVar23._4_4_ * auVar30._4_4_;
      auVar38._0_4_ = auVar23._0_4_ * auVar30._0_4_;
      auVar38._8_4_ = auVar23._8_4_ * auVar30._8_4_;
      auVar38._12_4_ = auVar23._12_4_ * auVar30._12_4_;
      auVar38._16_4_ = auVar23._16_4_ * auVar30._16_4_;
      auVar38._20_4_ = auVar23._20_4_ * auVar30._20_4_;
      auVar38._24_4_ = auVar23._24_4_ * auVar30._24_4_;
      auVar38._28_4_ = auVar30._28_4_;
      auVar30 = vsubps_avx(auVar38,auVar37);
      auVar133._0_4_ = auVar311._0_4_ * 0.0 + auVar30._0_4_ + auVar24._0_4_ * 0.0;
      auVar133._4_4_ = auVar311._4_4_ * 0.0 + auVar30._4_4_ + auVar24._4_4_ * 0.0;
      auVar133._8_4_ = auVar311._8_4_ * 0.0 + auVar30._8_4_ + auVar24._8_4_ * 0.0;
      auVar133._12_4_ = auVar311._12_4_ * 0.0 + auVar30._12_4_ + auVar24._12_4_ * 0.0;
      auVar133._16_4_ = auVar311._16_4_ * 0.0 + auVar30._16_4_ + auVar24._16_4_ * 0.0;
      auVar133._20_4_ = auVar311._20_4_ * 0.0 + auVar30._20_4_ + auVar24._20_4_ * 0.0;
      auVar133._24_4_ = auVar311._24_4_ * 0.0 + auVar30._24_4_ + auVar24._24_4_ * 0.0;
      auVar133._28_4_ = auVar30._28_4_ + auVar30._28_4_ + auVar24._28_4_;
      auVar311 = vcmpps_avx(auVar133,ZEXT832(0) << 0x20,2);
      local_540 = vblendvps_avx(auVar162,_local_5e0,auVar311);
      _local_560 = vblendvps_avx(auVar22,_local_600,auVar311);
      auVar162 = vblendvps_avx(auVar21,auVar261,auVar311);
      auVar22 = vblendvps_avx(auVar23,auVar296,auVar311);
      auVar21 = vblendvps_avx(auVar26,auVar319,auVar311);
      auVar30 = vblendvps_avx(auVar295,auVar324,auVar311);
      auVar23 = vblendvps_avx(auVar296,auVar23,auVar311);
      auVar224 = vblendvps_avx(auVar319,auVar26,auVar311);
      auVar329 = vpackssdw_avx(local_380._0_16_,local_380._16_16_);
      auVar295 = vblendvps_avx(auVar324,auVar295,auVar311);
      auVar23 = vsubps_avx(auVar23,local_540);
      auVar224 = vsubps_avx(auVar224,_local_560);
      auVar295 = vsubps_avx(auVar295,auVar162);
      auVar13 = vsubps_avx(_local_560,auVar21);
      fVar248 = auVar224._0_4_;
      fVar151 = auVar162._0_4_;
      fVar202 = auVar224._4_4_;
      fVar220 = auVar162._4_4_;
      auVar39._4_4_ = fVar220 * fVar202;
      auVar39._0_4_ = fVar151 * fVar248;
      fVar304 = auVar224._8_4_;
      fVar204 = auVar162._8_4_;
      auVar39._8_4_ = fVar204 * fVar304;
      fVar217 = auVar224._12_4_;
      fVar213 = auVar162._12_4_;
      auVar39._12_4_ = fVar213 * fVar217;
      fVar168 = auVar224._16_4_;
      fVar215 = auVar162._16_4_;
      auVar39._16_4_ = fVar215 * fVar168;
      fVar283 = auVar224._20_4_;
      fVar170 = auVar162._20_4_;
      auVar39._20_4_ = fVar170 * fVar283;
      fVar125 = auVar224._24_4_;
      fVar184 = auVar162._24_4_;
      auVar39._24_4_ = fVar184 * fVar125;
      auVar39._28_4_ = local_380._28_4_;
      fVar275 = local_560._0_4_;
      fVar150 = auVar295._0_4_;
      fVar302 = local_560._4_4_;
      fVar230 = auVar295._4_4_;
      auVar40._4_4_ = fVar230 * fVar302;
      auVar40._0_4_ = fVar150 * fVar275;
      fVar227 = local_560._8_4_;
      fVar238 = auVar295._8_4_;
      auVar40._8_4_ = fVar238 * fVar227;
      fVar167 = local_560._12_4_;
      fVar240 = auVar295._12_4_;
      auVar40._12_4_ = fVar240 * fVar167;
      fVar267 = local_560._16_4_;
      fVar242 = auVar295._16_4_;
      auVar40._16_4_ = fVar242 * fVar267;
      fVar285 = local_560._20_4_;
      fVar243 = auVar295._20_4_;
      auVar40._20_4_ = fVar243 * fVar285;
      fVar143 = local_560._24_4_;
      fVar244 = auVar295._24_4_;
      uVar121 = auVar26._28_4_;
      auVar40._24_4_ = fVar244 * fVar143;
      auVar40._28_4_ = uVar121;
      auVar26 = vsubps_avx(auVar40,auVar39);
      fVar255 = local_540._0_4_;
      fVar269 = local_540._4_4_;
      auVar41._4_4_ = fVar230 * fVar269;
      auVar41._0_4_ = fVar150 * fVar255;
      fVar305 = local_540._8_4_;
      auVar41._8_4_ = fVar238 * fVar305;
      fVar264 = local_540._12_4_;
      auVar41._12_4_ = fVar240 * fVar264;
      fVar276 = local_540._16_4_;
      auVar41._16_4_ = fVar242 * fVar276;
      fVar287 = local_540._20_4_;
      auVar41._20_4_ = fVar243 * fVar287;
      fVar169 = local_540._24_4_;
      auVar41._24_4_ = fVar244 * fVar169;
      auVar41._28_4_ = uVar121;
      fVar201 = auVar23._0_4_;
      fVar303 = auVar23._4_4_;
      auVar42._4_4_ = fVar220 * fVar303;
      auVar42._0_4_ = fVar151 * fVar201;
      fVar245 = auVar23._8_4_;
      auVar42._8_4_ = fVar204 * fVar245;
      fVar266 = auVar23._12_4_;
      auVar42._12_4_ = fVar213 * fVar266;
      fVar278 = auVar23._16_4_;
      auVar42._16_4_ = fVar215 * fVar278;
      fVar290 = auVar23._20_4_;
      auVar42._20_4_ = fVar170 * fVar290;
      fVar256 = auVar23._24_4_;
      auVar42._24_4_ = fVar184 * fVar256;
      auVar42._28_4_ = auVar319._28_4_;
      auVar24 = vsubps_avx(auVar42,auVar41);
      auVar43._4_4_ = fVar302 * fVar303;
      auVar43._0_4_ = fVar275 * fVar201;
      auVar43._8_4_ = fVar227 * fVar245;
      auVar43._12_4_ = fVar167 * fVar266;
      auVar43._16_4_ = fVar267 * fVar278;
      auVar43._20_4_ = fVar285 * fVar290;
      auVar43._24_4_ = fVar143 * fVar256;
      auVar43._28_4_ = uVar121;
      auVar44._4_4_ = fVar269 * fVar202;
      auVar44._0_4_ = fVar255 * fVar248;
      auVar44._8_4_ = fVar305 * fVar304;
      auVar44._12_4_ = fVar264 * fVar217;
      auVar44._16_4_ = fVar276 * fVar168;
      auVar44._20_4_ = fVar287 * fVar283;
      auVar44._24_4_ = fVar169 * fVar125;
      auVar44._28_4_ = auVar324._28_4_;
      auVar25 = vsubps_avx(auVar44,auVar43);
      auVar27 = vsubps_avx(auVar162,auVar30);
      fVar301 = auVar25._28_4_ + auVar24._28_4_;
      auVar208._0_4_ = auVar25._0_4_ + auVar24._0_4_ * 0.0 + auVar26._0_4_ * 0.0;
      auVar208._4_4_ = auVar25._4_4_ + auVar24._4_4_ * 0.0 + auVar26._4_4_ * 0.0;
      auVar208._8_4_ = auVar25._8_4_ + auVar24._8_4_ * 0.0 + auVar26._8_4_ * 0.0;
      auVar208._12_4_ = auVar25._12_4_ + auVar24._12_4_ * 0.0 + auVar26._12_4_ * 0.0;
      auVar208._16_4_ = auVar25._16_4_ + auVar24._16_4_ * 0.0 + auVar26._16_4_ * 0.0;
      auVar208._20_4_ = auVar25._20_4_ + auVar24._20_4_ * 0.0 + auVar26._20_4_ * 0.0;
      auVar208._24_4_ = auVar25._24_4_ + auVar24._24_4_ * 0.0 + auVar26._24_4_ * 0.0;
      auVar208._28_4_ = fVar301 + 0.0;
      fVar186 = auVar13._0_4_;
      fVar188 = auVar13._4_4_;
      auVar45._4_4_ = fVar188 * auVar30._4_4_;
      auVar45._0_4_ = fVar186 * auVar30._0_4_;
      fVar228 = auVar13._8_4_;
      auVar45._8_4_ = fVar228 * auVar30._8_4_;
      fVar145 = auVar13._12_4_;
      auVar45._12_4_ = fVar145 * auVar30._12_4_;
      fVar147 = auVar13._16_4_;
      auVar45._16_4_ = fVar147 * auVar30._16_4_;
      fVar148 = auVar13._20_4_;
      auVar45._20_4_ = fVar148 * auVar30._20_4_;
      fVar149 = auVar13._24_4_;
      auVar45._24_4_ = fVar149 * auVar30._24_4_;
      auVar45._28_4_ = fVar301;
      fVar301 = auVar27._0_4_;
      fVar316 = auVar27._4_4_;
      auVar46._4_4_ = auVar21._4_4_ * fVar316;
      auVar46._0_4_ = auVar21._0_4_ * fVar301;
      fVar257 = auVar27._8_4_;
      auVar46._8_4_ = auVar21._8_4_ * fVar257;
      fVar218 = auVar27._12_4_;
      auVar46._12_4_ = auVar21._12_4_ * fVar218;
      fVar281 = auVar27._16_4_;
      auVar46._16_4_ = auVar21._16_4_ * fVar281;
      fVar189 = auVar27._20_4_;
      auVar46._20_4_ = auVar21._20_4_ * fVar189;
      fVar289 = auVar27._24_4_;
      auVar46._24_4_ = auVar21._24_4_ * fVar289;
      auVar46._28_4_ = auVar25._28_4_;
      auVar162 = vsubps_avx(auVar46,auVar45);
      auVar26 = vsubps_avx(local_540,auVar22);
      fVar246 = auVar26._0_4_;
      fVar247 = auVar26._4_4_;
      auVar47._4_4_ = fVar247 * auVar30._4_4_;
      auVar47._0_4_ = fVar246 * auVar30._0_4_;
      fVar279 = auVar26._8_4_;
      auVar47._8_4_ = fVar279 * auVar30._8_4_;
      fVar282 = auVar26._12_4_;
      auVar47._12_4_ = fVar282 * auVar30._12_4_;
      fVar284 = auVar26._16_4_;
      auVar47._16_4_ = fVar284 * auVar30._16_4_;
      fVar286 = auVar26._20_4_;
      auVar47._20_4_ = fVar286 * auVar30._20_4_;
      fVar288 = auVar26._24_4_;
      auVar47._24_4_ = fVar288 * auVar30._24_4_;
      auVar47._28_4_ = auVar30._28_4_;
      auVar48._4_4_ = auVar22._4_4_ * fVar316;
      auVar48._0_4_ = auVar22._0_4_ * fVar301;
      auVar48._8_4_ = auVar22._8_4_ * fVar257;
      auVar48._12_4_ = auVar22._12_4_ * fVar218;
      auVar48._16_4_ = auVar22._16_4_ * fVar281;
      auVar48._20_4_ = auVar22._20_4_ * fVar189;
      auVar48._24_4_ = auVar22._24_4_ * fVar289;
      auVar48._28_4_ = 0;
      auVar26 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = auVar21._4_4_ * fVar247;
      auVar49._0_4_ = auVar21._0_4_ * fVar246;
      auVar49._8_4_ = auVar21._8_4_ * fVar279;
      auVar49._12_4_ = auVar21._12_4_ * fVar282;
      auVar49._16_4_ = auVar21._16_4_ * fVar284;
      auVar49._20_4_ = auVar21._20_4_ * fVar286;
      auVar49._24_4_ = auVar21._24_4_ * fVar288;
      auVar49._28_4_ = auVar30._28_4_;
      auVar50._4_4_ = auVar22._4_4_ * fVar188;
      auVar50._0_4_ = auVar22._0_4_ * fVar186;
      auVar50._8_4_ = auVar22._8_4_ * fVar228;
      auVar50._12_4_ = auVar22._12_4_ * fVar145;
      auVar50._16_4_ = auVar22._16_4_ * fVar147;
      auVar50._20_4_ = auVar22._20_4_ * fVar148;
      auVar50._24_4_ = auVar22._24_4_ * fVar149;
      auVar50._28_4_ = auVar22._28_4_;
      auVar22 = vsubps_avx(auVar50,auVar49);
      auVar181._0_4_ = auVar162._0_4_ * 0.0 + auVar22._0_4_ + auVar26._0_4_ * 0.0;
      auVar181._4_4_ = auVar162._4_4_ * 0.0 + auVar22._4_4_ + auVar26._4_4_ * 0.0;
      auVar181._8_4_ = auVar162._8_4_ * 0.0 + auVar22._8_4_ + auVar26._8_4_ * 0.0;
      auVar181._12_4_ = auVar162._12_4_ * 0.0 + auVar22._12_4_ + auVar26._12_4_ * 0.0;
      auVar181._16_4_ = auVar162._16_4_ * 0.0 + auVar22._16_4_ + auVar26._16_4_ * 0.0;
      auVar181._20_4_ = auVar162._20_4_ * 0.0 + auVar22._20_4_ + auVar26._20_4_ * 0.0;
      auVar181._24_4_ = auVar162._24_4_ * 0.0 + auVar22._24_4_ + auVar26._24_4_ * 0.0;
      auVar181._28_4_ = auVar22._28_4_ + auVar22._28_4_ + auVar26._28_4_;
      auVar183 = ZEXT3264(auVar181);
      auVar162 = vmaxps_avx(auVar208,auVar181);
      auVar162 = vcmpps_avx(auVar162,ZEXT832(0) << 0x20,2);
      auVar193 = vpackssdw_avx(auVar162._0_16_,auVar162._16_16_);
      auVar329 = vpand_avx(auVar329,auVar193);
      auVar193 = vpmovsxwd_avx(auVar329);
      auVar194 = vpunpckhwd_avx(auVar329,auVar329);
      auVar134._16_16_ = auVar194;
      auVar134._0_16_ = auVar193;
      if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar134 >> 0x7f,0) == '\0') &&
            (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar194 >> 0x3f,0) == '\0') &&
          (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar194[0xf]
         ) {
LAB_0093877d:
        auVar163 = ZEXT3264(CONCAT824(uStack_4a8,
                                      CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
        auVar141 = ZEXT3264(local_500);
        auVar263 = ZEXT3264(local_520);
      }
      else {
        auVar51._4_4_ = fVar316 * fVar202;
        auVar51._0_4_ = fVar301 * fVar248;
        auVar51._8_4_ = fVar257 * fVar304;
        auVar51._12_4_ = fVar218 * fVar217;
        auVar51._16_4_ = fVar281 * fVar168;
        auVar51._20_4_ = fVar189 * fVar283;
        auVar51._24_4_ = fVar289 * fVar125;
        auVar51._28_4_ = auVar194._12_4_;
        auVar306._0_4_ = fVar186 * fVar150;
        auVar306._4_4_ = fVar188 * fVar230;
        auVar306._8_4_ = fVar228 * fVar238;
        auVar306._12_4_ = fVar145 * fVar240;
        auVar306._16_4_ = fVar147 * fVar242;
        auVar306._20_4_ = fVar148 * fVar243;
        auVar306._24_4_ = fVar149 * fVar244;
        auVar306._28_4_ = 0;
        auVar22 = vsubps_avx(auVar306,auVar51);
        auVar52._4_4_ = fVar247 * fVar230;
        auVar52._0_4_ = fVar246 * fVar150;
        auVar52._8_4_ = fVar279 * fVar238;
        auVar52._12_4_ = fVar282 * fVar240;
        auVar52._16_4_ = fVar284 * fVar242;
        auVar52._20_4_ = fVar286 * fVar243;
        auVar52._24_4_ = fVar288 * fVar244;
        auVar52._28_4_ = auVar295._28_4_;
        auVar53._4_4_ = fVar316 * fVar303;
        auVar53._0_4_ = fVar301 * fVar201;
        auVar53._8_4_ = fVar257 * fVar245;
        auVar53._12_4_ = fVar218 * fVar266;
        auVar53._16_4_ = fVar281 * fVar278;
        auVar53._20_4_ = fVar189 * fVar290;
        auVar53._24_4_ = fVar289 * fVar256;
        auVar53._28_4_ = auVar27._28_4_;
        auVar21 = vsubps_avx(auVar53,auVar52);
        auVar54._4_4_ = fVar188 * fVar303;
        auVar54._0_4_ = fVar186 * fVar201;
        auVar54._8_4_ = fVar228 * fVar245;
        auVar54._12_4_ = fVar145 * fVar266;
        auVar54._16_4_ = fVar147 * fVar278;
        auVar54._20_4_ = fVar148 * fVar290;
        auVar54._24_4_ = fVar149 * fVar256;
        auVar54._28_4_ = auVar23._28_4_;
        auVar55._4_4_ = fVar247 * fVar202;
        auVar55._0_4_ = fVar246 * fVar248;
        auVar55._8_4_ = fVar279 * fVar304;
        auVar55._12_4_ = fVar282 * fVar217;
        auVar55._16_4_ = fVar284 * fVar168;
        auVar55._20_4_ = fVar286 * fVar283;
        auVar55._24_4_ = fVar288 * fVar125;
        auVar55._28_4_ = auVar224._28_4_;
        auVar30 = vsubps_avx(auVar55,auVar54);
        auVar252._0_4_ = auVar22._0_4_ * 0.0 + auVar30._0_4_ + auVar21._0_4_ * 0.0;
        auVar252._4_4_ = auVar22._4_4_ * 0.0 + auVar30._4_4_ + auVar21._4_4_ * 0.0;
        auVar252._8_4_ = auVar22._8_4_ * 0.0 + auVar30._8_4_ + auVar21._8_4_ * 0.0;
        auVar252._12_4_ = auVar22._12_4_ * 0.0 + auVar30._12_4_ + auVar21._12_4_ * 0.0;
        auVar252._16_4_ = auVar22._16_4_ * 0.0 + auVar30._16_4_ + auVar21._16_4_ * 0.0;
        auVar252._20_4_ = auVar22._20_4_ * 0.0 + auVar30._20_4_ + auVar21._20_4_ * 0.0;
        auVar252._24_4_ = auVar22._24_4_ * 0.0 + auVar30._24_4_ + auVar21._24_4_ * 0.0;
        auVar252._28_4_ = auVar224._28_4_ + auVar30._28_4_ + auVar23._28_4_;
        auVar162 = vrcpps_avx(auVar252);
        fVar201 = auVar162._0_4_;
        fVar301 = auVar162._4_4_;
        auVar56._4_4_ = auVar252._4_4_ * fVar301;
        auVar56._0_4_ = auVar252._0_4_ * fVar201;
        fVar202 = auVar162._8_4_;
        auVar56._8_4_ = auVar252._8_4_ * fVar202;
        fVar303 = auVar162._12_4_;
        auVar56._12_4_ = auVar252._12_4_ * fVar303;
        fVar316 = auVar162._16_4_;
        auVar56._16_4_ = auVar252._16_4_ * fVar316;
        fVar304 = auVar162._20_4_;
        auVar56._20_4_ = auVar252._20_4_ * fVar304;
        fVar245 = auVar162._24_4_;
        auVar56._24_4_ = auVar252._24_4_ * fVar245;
        auVar56._28_4_ = auVar27._28_4_;
        auVar307._8_4_ = 0x3f800000;
        auVar307._0_8_ = 0x3f8000003f800000;
        auVar307._12_4_ = 0x3f800000;
        auVar307._16_4_ = 0x3f800000;
        auVar307._20_4_ = 0x3f800000;
        auVar307._24_4_ = 0x3f800000;
        auVar307._28_4_ = 0x3f800000;
        auVar162 = vsubps_avx(auVar307,auVar56);
        fVar201 = auVar162._0_4_ * fVar201 + fVar201;
        fVar301 = auVar162._4_4_ * fVar301 + fVar301;
        fVar202 = auVar162._8_4_ * fVar202 + fVar202;
        fVar303 = auVar162._12_4_ * fVar303 + fVar303;
        fVar316 = auVar162._16_4_ * fVar316 + fVar316;
        fVar304 = auVar162._20_4_ * fVar304 + fVar304;
        fVar245 = auVar162._24_4_ * fVar245 + fVar245;
        auVar159._0_4_ =
             (auVar22._0_4_ * fVar255 + auVar21._0_4_ * fVar275 + auVar30._0_4_ * fVar151) * fVar201
        ;
        auVar159._4_4_ =
             (auVar22._4_4_ * fVar269 + auVar21._4_4_ * fVar302 + auVar30._4_4_ * fVar220) * fVar301
        ;
        auVar159._8_4_ =
             (auVar22._8_4_ * fVar305 + auVar21._8_4_ * fVar227 + auVar30._8_4_ * fVar204) * fVar202
        ;
        auVar159._12_4_ =
             (auVar22._12_4_ * fVar264 + auVar21._12_4_ * fVar167 + auVar30._12_4_ * fVar213) *
             fVar303;
        auVar159._16_4_ =
             (auVar22._16_4_ * fVar276 + auVar21._16_4_ * fVar267 + auVar30._16_4_ * fVar215) *
             fVar316;
        auVar159._20_4_ =
             (auVar22._20_4_ * fVar287 + auVar21._20_4_ * fVar285 + auVar30._20_4_ * fVar170) *
             fVar304;
        auVar159._24_4_ =
             (auVar22._24_4_ * fVar169 + auVar21._24_4_ * fVar143 + auVar30._24_4_ * fVar184) *
             fVar245;
        auVar159._28_4_ = 0;
        auVar135._16_16_ = auVar20;
        auVar135._0_16_ = auVar20;
        auVar162 = vcmpps_avx(auVar135,auVar159,2);
        fVar248 = ray->tfar;
        auVar209._4_4_ = fVar248;
        auVar209._0_4_ = fVar248;
        auVar209._8_4_ = fVar248;
        auVar209._12_4_ = fVar248;
        auVar209._16_4_ = fVar248;
        auVar209._20_4_ = fVar248;
        auVar209._24_4_ = fVar248;
        auVar209._28_4_ = fVar248;
        auVar22 = vcmpps_avx(auVar159,auVar209,2);
        auVar162 = vandps_avx(auVar22,auVar162);
        auVar193 = vpackssdw_avx(auVar162._0_16_,auVar162._16_16_);
        auVar329 = vpand_avx(auVar329,auVar193);
        auVar193 = vpmovsxwd_avx(auVar329);
        auVar194 = vpshufd_avx(auVar329,0xee);
        auVar194 = vpmovsxwd_avx(auVar194);
        auVar136._16_16_ = auVar194;
        auVar136._0_16_ = auVar193;
        if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar136 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar136 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar136 >> 0x7f,0) == '\0') &&
              (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar194 >> 0x3f,0) == '\0') &&
            (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar194[0xf]) goto LAB_0093877d;
        auVar162 = vcmpps_avx(ZEXT832(0) << 0x20,auVar252,4);
        auVar193 = vpackssdw_avx(auVar162._0_16_,auVar162._16_16_);
        auVar329 = vpand_avx(auVar329,auVar193);
        auVar193 = vpmovsxwd_avx(auVar329);
        auVar329 = vpunpckhwd_avx(auVar329,auVar329);
        auVar225._16_16_ = auVar329;
        auVar225._0_16_ = auVar193;
        auVar163 = ZEXT3264(CONCAT824(uStack_4a8,
                                      CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
        auVar141 = ZEXT3264(local_500);
        auVar263 = ZEXT3264(local_520);
        if ((((((((auVar225 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar225 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar225 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar225 >> 0x7f,0) != '\0') ||
              (auVar225 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar329 >> 0x3f,0) != '\0') ||
            (auVar225 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar329[0xf] < '\0') {
          auVar137._0_4_ = auVar208._0_4_ * fVar201;
          auVar137._4_4_ = auVar208._4_4_ * fVar301;
          auVar137._8_4_ = auVar208._8_4_ * fVar202;
          auVar137._12_4_ = auVar208._12_4_ * fVar303;
          auVar137._16_4_ = auVar208._16_4_ * fVar316;
          auVar137._20_4_ = auVar208._20_4_ * fVar304;
          auVar137._24_4_ = auVar208._24_4_ * fVar245;
          auVar137._28_4_ = 0;
          auVar57._4_4_ = auVar181._4_4_ * fVar301;
          auVar57._0_4_ = auVar181._0_4_ * fVar201;
          auVar57._8_4_ = auVar181._8_4_ * fVar202;
          auVar57._12_4_ = auVar181._12_4_ * fVar303;
          auVar57._16_4_ = auVar181._16_4_ * fVar316;
          auVar57._20_4_ = auVar181._20_4_ * fVar304;
          auVar57._24_4_ = auVar181._24_4_ * fVar245;
          auVar57._28_4_ = auVar181._28_4_;
          auVar183 = ZEXT3264(auVar57);
          auVar234._8_4_ = 0x3f800000;
          auVar234._0_8_ = 0x3f8000003f800000;
          auVar234._12_4_ = 0x3f800000;
          auVar234._16_4_ = 0x3f800000;
          auVar234._20_4_ = 0x3f800000;
          auVar234._24_4_ = 0x3f800000;
          auVar234._28_4_ = 0x3f800000;
          auVar162 = vsubps_avx(auVar234,auVar137);
          auVar162 = vblendvps_avx(auVar162,auVar137,auVar311);
          auVar141 = ZEXT3264(auVar162);
          auVar162 = vsubps_avx(auVar234,auVar57);
          _local_3e0 = vblendvps_avx(auVar162,auVar57,auVar311);
          auVar163 = ZEXT3264(auVar225);
          auVar263 = ZEXT3264(auVar159);
        }
      }
      auVar320 = ZEXT3264(_local_720);
      local_500 = auVar141._0_32_;
      local_520 = auVar263._0_32_;
      auVar162 = auVar163._0_32_;
      if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar162 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar162 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar162 >> 0x7f,0) == '\0') &&
            (auVar163 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar162 >> 0xbf,0) == '\0') &&
          (auVar163 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar163[0x1f]) {
        bVar123 = 0;
        _local_6a0 = auVar16;
        _local_690 = auVar17;
        _local_590 = auVar14;
      }
      else {
        auVar22 = vsubps_avx(local_6c0,_local_7e0);
        fVar275 = (float)local_7e0._0_4_ + auVar22._0_4_ * auVar141._0_4_;
        fVar255 = (float)local_7e0._4_4_ + auVar22._4_4_ * auVar141._4_4_;
        fVar201 = fStack_7d8 + auVar22._8_4_ * auVar141._8_4_;
        fVar301 = fStack_7d4 + auVar22._12_4_ * auVar141._12_4_;
        fVar202 = fStack_7d0 + auVar22._16_4_ * auVar141._16_4_;
        fVar302 = fStack_7cc + auVar22._20_4_ * auVar141._20_4_;
        fVar269 = fStack_7c8 + auVar22._24_4_ * auVar141._24_4_;
        fVar303 = auVar22._28_4_ + 0.0;
        fVar248 = local_728->depth_scale;
        auVar58._4_4_ = (fVar255 + fVar255) * fVar248;
        auVar58._0_4_ = (fVar275 + fVar275) * fVar248;
        auVar58._8_4_ = (fVar201 + fVar201) * fVar248;
        auVar58._12_4_ = (fVar301 + fVar301) * fVar248;
        auVar58._16_4_ = (fVar202 + fVar202) * fVar248;
        auVar58._20_4_ = (fVar302 + fVar302) * fVar248;
        auVar58._24_4_ = (fVar269 + fVar269) * fVar248;
        auVar58._28_4_ = fVar303 + fVar303;
        auVar22 = vcmpps_avx(local_520,auVar58,6);
        auVar21 = auVar162 & auVar22;
        if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar21 >> 0x7f,0) == '\0') &&
              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0xbf,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar21[0x1f]) {
          bVar123 = 0;
          _local_6a0 = auVar16;
          _local_690 = auVar17;
          _local_590 = auVar14;
        }
        else {
          local_1e0 = vandps_avx(auVar22,auVar162);
          local_280._0_4_ = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
          local_280._4_4_ = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
          fStack_278 = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
          fStack_274 = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
          fStack_270 = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
          fStack_26c = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
          fStack_268 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
          fStack_264 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
          local_2a0 = local_500;
          local_260 = local_520;
          local_240 = 0;
          local_23c = uVar117;
          local_230 = local_690;
          uStack_228 = uStack_688;
          local_220 = local_6a0;
          uStack_218 = uStack_698;
          local_210 = local_590;
          uStack_208 = uStack_588;
          auVar183 = ZEXT1664(_local_5a0);
          local_200 = _local_5a0;
          local_3e0._4_4_ = local_280._4_4_;
          local_3e0._0_4_ = local_280._0_4_;
          uStack_3d8._0_4_ = fStack_278;
          uStack_3d8._4_4_ = fStack_274;
          uStack_3d0._0_4_ = fStack_270;
          uStack_3d0._4_4_ = fStack_26c;
          auVar158 = _local_3e0;
          uStack_3c8._0_4_ = fStack_268;
          uStack_3c8._4_4_ = fStack_264;
          auVar162 = _local_3e0;
          auVar22 = local_520;
          auVar21 = local_500;
          _local_6a0 = auVar16;
          _local_690 = auVar17;
          _local_590 = auVar14;
          if ((pGVar10->mask & ray->mask) != 0) {
            if ((local_7f0->args->filter == (RTCFilterFunctionN)0x0) &&
               (bVar123 = 1, pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0))
            goto LAB_00937997;
            auVar176._0_4_ = 1.0 / auVar223._0_4_;
            auVar176._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar329 = vshufps_avx(auVar176,auVar176,0);
            auVar183 = ZEXT3264(CONCAT1616(auVar329,auVar329));
            local_1c0[0] = auVar329._0_4_ * (auVar141._0_4_ + 0.0);
            local_1c0[1] = auVar329._4_4_ * (auVar141._4_4_ + 1.0);
            local_1c0[2] = auVar329._8_4_ * (auVar141._8_4_ + 2.0);
            local_1c0[3] = auVar329._12_4_ * (auVar141._12_4_ + 3.0);
            fStack_1b0 = auVar329._0_4_ * (auVar141._16_4_ + 4.0);
            fStack_1ac = auVar329._4_4_ * (auVar141._20_4_ + 5.0);
            fStack_1a8 = auVar329._8_4_ * (auVar141._24_4_ + 6.0);
            fStack_1a4 = auVar141._28_4_ + 7.0;
            uStack_3d0 = auVar158._16_8_;
            uStack_3c8 = auVar162._24_8_;
            local_1a0 = local_3e0;
            uStack_198 = uStack_3d8;
            uStack_190 = uStack_3d0;
            uStack_188 = uStack_3c8;
            local_180 = local_520;
            uVar121 = vmovmskps_avx(local_1e0);
            uVar114 = CONCAT44((int)((ulong)local_7f0->args >> 0x20),uVar121);
            uVar116 = 0;
            if (uVar114 != 0) {
              for (; (uVar114 >> uVar116 & 1) == 0; uVar116 = uVar116 + 1) {
              }
            }
            _local_3e0 = auVar162;
            while( true ) {
              auVar22 = auVar263._0_32_;
              auVar21 = auVar141._0_32_;
              auVar20 = local_620._0_16_;
              if (uVar114 == 0) break;
              local_7e0 = (undefined1  [8])uVar114;
              local_674 = local_1c0[uVar116];
              local_670 = *(undefined4 *)((long)&local_1a0 + uVar116 * 4);
              local_6c0._0_4_ = ray->tfar;
              ray->tfar = *(float *)(local_180 + uVar116 * 4);
              fVar268 = 1.0 - local_674;
              fVar248 = local_674 * 3.0;
              auVar329 = ZEXT416((uint)((fVar268 * -2.0 * local_674 + local_674 * local_674) * 0.5))
              ;
              auVar329 = vshufps_avx(auVar329,auVar329,0);
              auVar193 = ZEXT416((uint)(((fVar268 + fVar268) * (fVar248 + 2.0) +
                                        fVar268 * fVar268 * -3.0) * 0.5));
              auVar193 = vshufps_avx(auVar193,auVar193,0);
              auVar194 = ZEXT416((uint)(((local_674 + local_674) * (fVar248 + -5.0) +
                                        local_674 * fVar248) * 0.5));
              auVar194 = vshufps_avx(auVar194,auVar194,0);
              auVar195 = ZEXT416((uint)((local_674 * (fVar268 + fVar268) - fVar268 * fVar268) * 0.5)
                                );
              auVar195 = vshufps_avx(auVar195,auVar195,0);
              auVar177._0_4_ =
                   auVar195._0_4_ * (float)local_690._0_4_ +
                   auVar194._0_4_ * (float)local_6a0._0_4_ +
                   auVar329._0_4_ * (float)local_5a0._0_4_ + auVar193._0_4_ * (float)local_590._0_4_
              ;
              auVar177._4_4_ =
                   auVar195._4_4_ * (float)local_690._4_4_ +
                   auVar194._4_4_ * (float)local_6a0._4_4_ +
                   auVar329._4_4_ * (float)local_5a0._4_4_ + auVar193._4_4_ * (float)local_590._4_4_
              ;
              auVar177._8_4_ =
                   auVar195._8_4_ * (float)uStack_688 +
                   auVar194._8_4_ * (float)uStack_698 +
                   auVar329._8_4_ * fStack_598 + auVar193._8_4_ * (float)uStack_588;
              auVar177._12_4_ =
                   auVar195._12_4_ * uStack_688._4_4_ +
                   auVar194._12_4_ * uStack_698._4_4_ +
                   auVar329._12_4_ * fStack_594 + auVar193._12_4_ * uStack_588._4_4_;
              auVar183 = ZEXT1664(auVar177);
              local_6f0.context = local_7f0->user;
              local_680 = vmovlps_avx(auVar177);
              local_678 = vextractps_avx(auVar177,2);
              local_66c = (int)local_648;
              local_668 = (int)local_730;
              local_664 = (local_6f0.context)->instID[0];
              local_660 = (local_6f0.context)->instPrimID[0];
              local_7f4 = -1;
              local_6f0.valid = &local_7f4;
              local_6f0.geometryUserPtr = pGVar10->userPtr;
              local_6f0.ray = (RTCRayN *)ray;
              local_6f0.hit = (RTCHitN *)&local_680;
              local_6f0.N = 1;
              if (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_009378d8:
                p_Var12 = local_7f0->args->filter;
                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                   (((local_7f0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar183 = ZEXT1664(auVar183._0_16_);
                  (*p_Var12)(&local_6f0);
                  if (*local_6f0.valid == 0) goto LAB_0093791b;
                }
                bVar123 = 1;
                auVar320 = ZEXT3264(_local_720);
                fVar124 = (float)local_760._0_4_;
                fVar142 = (float)local_760._4_4_;
                fVar144 = fStack_758;
                fVar146 = fStack_754;
                fVar268 = fStack_750;
                fVar253 = fStack_74c;
                fVar254 = fStack_748;
                fVar277 = fStack_744;
                fVar152 = (float)local_7c0._0_4_;
                fVar164 = (float)local_7c0._4_4_;
                fVar165 = fStack_7b8;
                fVar166 = fStack_7b4;
                fVar280 = fStack_7b0;
                fVar219 = fStack_7ac;
                fVar185 = fStack_7a8;
                fVar203 = (float)local_7a0._0_4_;
                fVar212 = (float)local_7a0._4_4_;
                fVar214 = fStack_798;
                fVar216 = fStack_794;
                fVar187 = fStack_790;
                fVar229 = fStack_78c;
                fVar237 = fStack_788;
                fVar190 = (float)local_780._0_4_;
                fVar198 = (float)local_780._4_4_;
                fVar199 = fStack_778;
                fVar200 = fStack_774;
                fVar239 = fStack_770;
                fVar241 = fStack_76c;
                fVar317 = fStack_768;
                auVar20 = local_620._0_16_;
                goto LAB_00937997;
              }
              auVar183 = ZEXT1664(auVar177);
              (*pGVar10->occlusionFilterN)(&local_6f0);
              if (*local_6f0.valid != 0) goto LAB_009378d8;
LAB_0093791b:
              ray->tfar = (float)local_6c0._0_4_;
              uVar114 = (ulong)local_7e0 ^ 1L << (uVar116 & 0x3f);
              uVar116 = 0;
              if (uVar114 != 0) {
                for (; (uVar114 >> uVar116 & 1) == 0; uVar116 = uVar116 + 1) {
                }
              }
              auVar141 = ZEXT3264(local_500);
              auVar263 = ZEXT3264(local_520);
              auVar320 = ZEXT3264(_local_720);
              fVar124 = (float)local_760._0_4_;
              fVar142 = (float)local_760._4_4_;
              fVar144 = fStack_758;
              fVar146 = fStack_754;
              fVar268 = fStack_750;
              fVar253 = fStack_74c;
              fVar254 = fStack_748;
              fVar277 = fStack_744;
              fVar203 = (float)local_7a0._0_4_;
              fVar212 = (float)local_7a0._4_4_;
              fVar214 = fStack_798;
              fVar216 = fStack_794;
              fVar187 = fStack_790;
              fVar229 = fStack_78c;
              fVar237 = fStack_788;
              fVar190 = (float)local_780._0_4_;
              fVar198 = (float)local_780._4_4_;
              fVar199 = fStack_778;
              fVar200 = fStack_774;
              fVar239 = fStack_770;
              fVar241 = fStack_76c;
              fVar317 = fStack_768;
            }
          }
          local_620._0_16_ = auVar20;
          local_500 = auVar21;
          local_520 = auVar22;
          bVar123 = 0;
          fVar152 = (float)local_7c0._0_4_;
          fVar164 = (float)local_7c0._4_4_;
          fVar165 = fStack_7b8;
          fVar166 = fStack_7b4;
          fVar280 = fStack_7b0;
          fVar219 = fStack_7ac;
          fVar185 = fStack_7a8;
          auVar20 = local_620._0_16_;
        }
      }
LAB_00937997:
      local_620._0_16_ = auVar20;
      auVar175 = local_640._0_16_;
    }
    auVar163 = ZEXT1664(auVar175);
    if (8 < (int)uVar117) {
      auVar329 = vpshufd_avx(ZEXT416(uVar117),0);
      local_380._0_16_ = auVar329;
      auVar329 = vshufps_avx(auVar175,auVar175,0);
      local_3c0._16_16_ = auVar329;
      local_3c0._0_16_ = auVar329;
      local_e0 = local_620._0_8_;
      uStack_d8 = local_620._8_8_;
      uStack_d0 = local_620._0_8_;
      uStack_c8 = local_620._8_8_;
      auVar130._0_4_ = 1.0 / local_440;
      auVar130._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar329 = vshufps_avx(auVar130,auVar130,0);
      register0x00001210 = auVar329;
      _local_100 = auVar329;
      auVar141 = ZEXT3264(_local_100);
      for (lVar119 = 8; lVar119 < local_7e8; lVar119 = lVar119 + 8) {
        pauVar7 = (undefined1 (*) [28])(catmullrom_basis0 + lVar119 * 4 + lVar122);
        fVar248 = *(float *)*pauVar7;
        fVar275 = *(float *)(*pauVar7 + 4);
        fVar255 = *(float *)(*pauVar7 + 8);
        fVar201 = *(float *)(*pauVar7 + 0xc);
        fVar301 = *(float *)(*pauVar7 + 0x10);
        fVar202 = *(float *)(*pauVar7 + 0x14);
        fVar302 = *(float *)(*pauVar7 + 0x18);
        auVar111 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar122 + 0x22047f0 + lVar119 * 4);
        fVar269 = *(float *)*pauVar7;
        fVar303 = *(float *)(*pauVar7 + 4);
        fVar316 = *(float *)(*pauVar7 + 8);
        fVar304 = *(float *)(*pauVar7 + 0xc);
        fVar227 = *(float *)(*pauVar7 + 0x10);
        fVar305 = *(float *)(*pauVar7 + 0x14);
        fVar245 = *(float *)(*pauVar7 + 0x18);
        auVar110 = *pauVar7;
        pfVar1 = (float *)(lVar122 + 0x2204c74 + lVar119 * 4);
        fVar257 = *pfVar1;
        fVar217 = pfVar1[1];
        fVar167 = pfVar1[2];
        fVar264 = pfVar1[3];
        fVar266 = pfVar1[4];
        fVar218 = pfVar1[5];
        fVar168 = pfVar1[6];
        pauVar7 = (undefined1 (*) [28])(lVar122 + 0x22050f8 + lVar119 * 4);
        fVar267 = *(float *)*pauVar7;
        fVar276 = *(float *)(*pauVar7 + 4);
        fVar278 = *(float *)(*pauVar7 + 8);
        fVar281 = *(float *)(*pauVar7 + 0xc);
        fVar283 = *(float *)(*pauVar7 + 0x10);
        fVar285 = *(float *)(*pauVar7 + 0x14);
        fVar287 = *(float *)(*pauVar7 + 0x18);
        auVar109 = *pauVar7;
        fVar290 = *(float *)pauVar7[1];
        fVar189 = fVar290 + auVar183._28_4_;
        fStack_7c4 = fVar290 + fVar290 + auVar141._28_4_;
        fVar204 = auVar320._0_4_;
        fVar213 = auVar320._4_4_;
        fVar215 = auVar320._8_4_;
        fVar170 = auVar320._12_4_;
        fVar184 = auVar320._16_4_;
        fVar186 = auVar320._20_4_;
        fVar188 = auVar320._24_4_;
        local_640._0_4_ =
             fVar204 * fVar248 +
             fVar203 * fVar269 + fVar257 * fVar152 + (float)local_420._0_4_ * fVar267;
        local_640._4_4_ =
             fVar213 * fVar275 +
             fVar212 * fVar303 + fVar217 * fVar164 + (float)local_420._4_4_ * fVar276;
        local_640._8_4_ =
             fVar215 * fVar255 + fVar214 * fVar316 + fVar167 * fVar165 + fStack_418 * fVar278;
        local_640._12_4_ =
             fVar170 * fVar201 + fVar216 * fVar304 + fVar264 * fVar166 + fStack_414 * fVar281;
        local_640._16_4_ =
             fVar184 * fVar301 + fVar187 * fVar227 + fVar266 * fVar280 + fStack_410 * fVar283;
        local_640._20_4_ =
             fVar186 * fVar202 + fVar229 * fVar305 + fVar218 * fVar219 + fStack_40c * fVar285;
        local_640._24_4_ =
             fVar188 * fVar302 + fVar237 * fVar245 + fVar168 * fVar185 + fStack_408 * fVar287;
        local_640._28_4_ = fVar189 + fStack_7c4;
        auVar182._0_4_ =
             fVar269 * (float)local_320._0_4_ + fVar190 * fVar257 + fVar124 * fVar267 +
             (float)local_340._0_4_ * fVar248;
        auVar182._4_4_ =
             fVar303 * (float)local_320._4_4_ + fVar198 * fVar217 + fVar142 * fVar276 +
             (float)local_340._4_4_ * fVar275;
        auVar182._8_4_ =
             fVar316 * fStack_318 + fVar199 * fVar167 + fVar144 * fVar278 + fStack_338 * fVar255;
        auVar182._12_4_ =
             fVar304 * fStack_314 + fVar200 * fVar264 + fVar146 * fVar281 + fStack_334 * fVar201;
        auVar182._16_4_ =
             fVar227 * fStack_310 + fVar239 * fVar266 + fVar268 * fVar283 + fStack_330 * fVar301;
        auVar182._20_4_ =
             fVar305 * fStack_30c + fVar241 * fVar218 + fVar253 * fVar285 + fStack_32c * fVar202;
        auVar182._24_4_ =
             fVar245 * fStack_308 + fVar317 * fVar168 + fVar254 * fVar287 + fStack_328 * fVar302;
        auVar182._28_4_ = fVar290 + fVar290 + auVar163._28_4_ + fStack_7c4;
        auVar183 = ZEXT3264(auVar182);
        local_7e0._0_4_ =
             (float)local_c0._0_4_ * fVar248 +
             fVar269 * (float)local_120._0_4_ +
             (float)local_80._0_4_ * fVar257 + (float)local_a0._0_4_ * fVar267;
        local_7e0._4_4_ =
             (float)local_c0._4_4_ * fVar275 +
             fVar303 * (float)local_120._4_4_ +
             (float)local_80._4_4_ * fVar217 + (float)local_a0._4_4_ * fVar276;
        fStack_7d8 = fStack_b8 * fVar255 +
                     fVar316 * fStack_118 + fStack_78 * fVar167 + fStack_98 * fVar278;
        fStack_7d4 = fStack_b4 * fVar201 +
                     fVar304 * fStack_114 + fStack_74 * fVar264 + fStack_94 * fVar281;
        fStack_7d0 = fStack_b0 * fVar301 +
                     fVar227 * fStack_110 + fStack_70 * fVar266 + fStack_90 * fVar283;
        fStack_7cc = fStack_ac * fVar202 +
                     fVar305 * fStack_10c + fStack_6c * fVar218 + fStack_8c * fVar285;
        fStack_7c8 = fStack_a8 * fVar302 +
                     fVar245 * fStack_108 + fStack_68 * fVar168 + fStack_88 * fVar287;
        fStack_7c4 = fStack_7c4 + fVar290 + fVar189;
        pfVar1 = (float *)(catmullrom_basis1 + lVar119 * 4 + lVar122);
        fVar303 = *pfVar1;
        fVar316 = pfVar1[1];
        fVar304 = pfVar1[2];
        fVar227 = pfVar1[3];
        fVar305 = pfVar1[4];
        fVar245 = pfVar1[5];
        fVar267 = pfVar1[6];
        pauVar7 = (undefined1 (*) [28])(lVar122 + 0x2206c10 + lVar119 * 4);
        fVar269 = *(float *)*pauVar7;
        fVar276 = *(float *)(*pauVar7 + 4);
        fVar278 = *(float *)(*pauVar7 + 8);
        fVar281 = *(float *)(*pauVar7 + 0xc);
        fVar283 = *(float *)(*pauVar7 + 0x10);
        fVar285 = *(float *)(*pauVar7 + 0x14);
        fVar287 = *(float *)(*pauVar7 + 0x18);
        auVar112 = *pauVar7;
        auVar162 = *(undefined1 (*) [32])(lVar122 + 0x2207094 + lVar119 * 4);
        auVar141 = ZEXT3264(auVar162);
        pfVar2 = (float *)(lVar122 + 0x2207518 + lVar119 * 4);
        fVar290 = *pfVar2;
        fVar189 = pfVar2[1];
        fVar125 = pfVar2[2];
        fVar143 = pfVar2[3];
        fVar169 = pfVar2[4];
        fVar256 = pfVar2[5];
        fVar289 = pfVar2[6];
        fVar151 = pfVar2[7];
        fVar248 = auVar162._0_4_;
        fVar275 = auVar162._4_4_;
        fVar255 = auVar162._8_4_;
        fVar201 = auVar162._12_4_;
        fVar301 = auVar162._16_4_;
        fVar202 = auVar162._20_4_;
        fVar302 = auVar162._24_4_;
        fVar220 = fVar151 + fVar151 + fStack_404;
        auVar235._0_4_ =
             fVar204 * fVar303 +
             fVar269 * fVar203 + fVar152 * fVar248 + (float)local_420._0_4_ * fVar290;
        auVar235._4_4_ =
             fVar213 * fVar316 +
             fVar276 * fVar212 + fVar164 * fVar275 + (float)local_420._4_4_ * fVar189;
        auVar235._8_4_ =
             fVar215 * fVar304 + fVar278 * fVar214 + fVar165 * fVar255 + fStack_418 * fVar125;
        auVar235._12_4_ =
             fVar170 * fVar227 + fVar281 * fVar216 + fVar166 * fVar201 + fStack_414 * fVar143;
        auVar235._16_4_ =
             fVar184 * fVar305 + fVar283 * fVar187 + fVar280 * fVar301 + fStack_410 * fVar169;
        auVar235._20_4_ =
             fVar186 * fVar245 + fVar285 * fVar229 + fVar219 * fVar202 + fStack_40c * fVar256;
        auVar235._24_4_ =
             fVar188 * fVar267 + fVar287 * fVar237 + fVar185 * fVar302 + fStack_408 * fVar289;
        auVar235._28_4_ = fStack_84 + fVar151 + fVar220;
        local_540._0_4_ =
             fVar303 * (float)local_340._0_4_ +
             (float)local_320._0_4_ * fVar269 + fVar190 * fVar248 + fVar124 * fVar290;
        local_540._4_4_ =
             fVar316 * (float)local_340._4_4_ +
             (float)local_320._4_4_ * fVar276 + fVar198 * fVar275 + fVar142 * fVar189;
        local_540._8_4_ =
             fVar304 * fStack_338 + fStack_318 * fVar278 + fVar199 * fVar255 + fVar144 * fVar125;
        local_540._12_4_ =
             fVar227 * fStack_334 + fStack_314 * fVar281 + fVar200 * fVar201 + fVar146 * fVar143;
        local_540._16_4_ =
             fVar305 * fStack_330 + fStack_310 * fVar283 + fVar239 * fVar301 + fVar268 * fVar169;
        local_540._20_4_ =
             fVar245 * fStack_32c + fStack_30c * fVar285 + fVar241 * fVar202 + fVar253 * fVar256;
        local_540._24_4_ =
             fVar267 * fStack_328 + fStack_308 * fVar287 + fVar317 * fVar302 + fVar254 * fVar289;
        local_540._28_4_ = fVar220 + fVar151 + fVar151 + fVar277;
        auVar313._0_4_ =
             fVar269 * (float)local_120._0_4_ +
             (float)local_a0._0_4_ * fVar290 + (float)local_80._0_4_ * fVar248 +
             (float)local_c0._0_4_ * fVar303;
        auVar313._4_4_ =
             fVar276 * (float)local_120._4_4_ +
             (float)local_a0._4_4_ * fVar189 + (float)local_80._4_4_ * fVar275 +
             (float)local_c0._4_4_ * fVar316;
        auVar313._8_4_ =
             fVar278 * fStack_118 + fStack_98 * fVar125 + fStack_78 * fVar255 + fStack_b8 * fVar304;
        auVar313._12_4_ =
             fVar281 * fStack_114 + fStack_94 * fVar143 + fStack_74 * fVar201 + fStack_b4 * fVar227;
        auVar313._16_4_ =
             fVar283 * fStack_110 + fStack_90 * fVar169 + fStack_70 * fVar301 + fStack_b0 * fVar305;
        auVar313._20_4_ =
             fVar285 * fStack_10c + fStack_8c * fVar256 + fStack_6c * fVar202 + fStack_ac * fVar245;
        auVar313._24_4_ =
             fVar287 * fStack_108 + fStack_88 * fVar289 + fStack_68 * fVar302 + fStack_a8 * fVar267;
        auVar313._28_4_ = fVar151 + fStack_84 + fVar151 + fVar220;
        auVar21 = vsubps_avx(auVar235,local_640);
        auVar30 = vsubps_avx(local_540,auVar182);
        fVar268 = auVar21._0_4_;
        fVar254 = auVar21._4_4_;
        auVar59._4_4_ = auVar182._4_4_ * fVar254;
        auVar59._0_4_ = auVar182._0_4_ * fVar268;
        fVar280 = auVar21._8_4_;
        auVar59._8_4_ = auVar182._8_4_ * fVar280;
        fVar185 = auVar21._12_4_;
        auVar59._12_4_ = auVar182._12_4_ * fVar185;
        fVar229 = auVar21._16_4_;
        auVar59._16_4_ = auVar182._16_4_ * fVar229;
        fVar239 = auVar21._20_4_;
        auVar59._20_4_ = auVar182._20_4_ * fVar239;
        fVar317 = auVar21._24_4_;
        auVar59._24_4_ = auVar182._24_4_ * fVar317;
        auVar59._28_4_ = fVar220;
        fVar253 = auVar30._0_4_;
        fVar277 = auVar30._4_4_;
        auVar60._4_4_ = local_640._4_4_ * fVar277;
        auVar60._0_4_ = (float)local_640._0_4_ * fVar253;
        fVar219 = auVar30._8_4_;
        auVar60._8_4_ = local_640._8_4_ * fVar219;
        fVar187 = auVar30._12_4_;
        auVar60._12_4_ = local_640._12_4_ * fVar187;
        fVar237 = auVar30._16_4_;
        auVar60._16_4_ = local_640._16_4_ * fVar237;
        fVar241 = auVar30._20_4_;
        auVar60._20_4_ = local_640._20_4_ * fVar241;
        fVar269 = auVar30._24_4_;
        auVar60._24_4_ = local_640._24_4_ * fVar269;
        auVar60._28_4_ = local_540._28_4_;
        auVar23 = vsubps_avx(auVar59,auVar60);
        auVar22 = vmaxps_avx(_local_7e0,auVar313);
        auVar61._4_4_ = auVar22._4_4_ * auVar22._4_4_ * (fVar254 * fVar254 + fVar277 * fVar277);
        auVar61._0_4_ = auVar22._0_4_ * auVar22._0_4_ * (fVar268 * fVar268 + fVar253 * fVar253);
        auVar61._8_4_ = auVar22._8_4_ * auVar22._8_4_ * (fVar280 * fVar280 + fVar219 * fVar219);
        auVar61._12_4_ = auVar22._12_4_ * auVar22._12_4_ * (fVar185 * fVar185 + fVar187 * fVar187);
        auVar61._16_4_ = auVar22._16_4_ * auVar22._16_4_ * (fVar229 * fVar229 + fVar237 * fVar237);
        auVar61._20_4_ = auVar22._20_4_ * auVar22._20_4_ * (fVar239 * fVar239 + fVar241 * fVar241);
        auVar61._24_4_ = auVar22._24_4_ * auVar22._24_4_ * (fVar317 * fVar317 + fVar269 * fVar269);
        auVar61._28_4_ = auVar235._28_4_ + local_540._28_4_;
        auVar62._4_4_ = auVar23._4_4_ * auVar23._4_4_;
        auVar62._0_4_ = auVar23._0_4_ * auVar23._0_4_;
        auVar62._8_4_ = auVar23._8_4_ * auVar23._8_4_;
        auVar62._12_4_ = auVar23._12_4_ * auVar23._12_4_;
        auVar62._16_4_ = auVar23._16_4_ * auVar23._16_4_;
        auVar62._20_4_ = auVar23._20_4_ * auVar23._20_4_;
        auVar62._24_4_ = auVar23._24_4_ * auVar23._24_4_;
        auVar62._28_4_ = auVar23._28_4_;
        local_360 = vcmpps_avx(auVar62,auVar61,2);
        auVar163 = ZEXT3264(local_360);
        local_240 = (uint)lVar119;
        auVar193 = vpshufd_avx(ZEXT416(local_240),0);
        auVar329 = vpor_avx(auVar193,_DAT_01f4ad30);
        auVar193 = vpor_avx(auVar193,_DAT_01f7afa0);
        auVar329 = vpcmpgtd_avx(local_380._0_16_,auVar329);
        auVar193 = vpcmpgtd_avx(local_380._0_16_,auVar193);
        auVar197._16_16_ = auVar193;
        auVar197._0_16_ = auVar329;
        auVar22 = auVar197 & local_360;
        fVar124 = (float)local_760._0_4_;
        fVar142 = (float)local_760._4_4_;
        fVar144 = fStack_758;
        fVar146 = fStack_754;
        fVar268 = fStack_750;
        fVar253 = fStack_74c;
        fVar254 = fStack_748;
        fVar277 = fStack_744;
        fVar152 = (float)local_7c0._0_4_;
        fVar164 = (float)local_7c0._4_4_;
        fVar165 = fStack_7b8;
        fVar166 = fStack_7b4;
        fVar280 = fStack_7b0;
        fVar219 = fStack_7ac;
        fVar185 = fStack_7a8;
        fVar203 = (float)local_7a0._0_4_;
        fVar212 = (float)local_7a0._4_4_;
        fVar214 = fStack_798;
        fVar216 = fStack_794;
        fVar187 = fStack_790;
        fVar229 = fStack_78c;
        fVar237 = fStack_788;
        fVar190 = (float)local_780._0_4_;
        fVar198 = (float)local_780._4_4_;
        fVar199 = fStack_778;
        fVar200 = fStack_774;
        fVar239 = fStack_770;
        fVar241 = fStack_76c;
        fVar317 = fStack_768;
        if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar22 >> 0x7f,0) == '\0') &&
              (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar22 >> 0xbf,0) == '\0') &&
            (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar22[0x1f]) {
          auVar320 = ZEXT3264(auVar320._0_32_);
        }
        else {
          local_600._0_4_ = auVar112._0_4_;
          local_600._4_4_ = auVar112._4_4_;
          fStack_5f8 = auVar112._8_4_;
          fStack_5f4 = auVar112._12_4_;
          fStack_5f0 = auVar112._16_4_;
          fStack_5ec = auVar112._20_4_;
          fStack_5e8 = auVar112._24_4_;
          fVar269 = (float)local_2e0._0_4_ * (float)local_600._0_4_;
          fVar276 = (float)local_2e0._4_4_ * (float)local_600._4_4_;
          fVar278 = fStack_2d8 * fStack_5f8;
          fVar281 = fStack_2d4 * fStack_5f4;
          fVar283 = fStack_2d0 * fStack_5f0;
          fVar285 = fStack_2cc * fStack_5ec;
          fVar287 = fStack_2c8 * fStack_5e8;
          _local_600 = auVar197;
          local_480 = fVar303 * (float)local_460._0_4_ +
                      fVar269 + (float)local_300._0_4_ * fVar248 + (float)local_580._0_4_ * fVar290;
          fStack_47c = fVar316 * (float)local_460._4_4_ +
                       fVar276 + (float)local_300._4_4_ * fVar275 + (float)local_580._4_4_ * fVar189
          ;
          fStack_478 = fVar304 * fStack_458 + fVar278 + fStack_2f8 * fVar255 + fStack_578 * fVar125;
          fStack_474 = fVar227 * fStack_454 + fVar281 + fStack_2f4 * fVar201 + fStack_574 * fVar143;
          fStack_470 = fVar305 * fStack_450 + fVar283 + fStack_2f0 * fVar301 + fStack_570 * fVar169;
          fStack_46c = fVar245 * fStack_44c + fVar285 + fStack_2ec * fVar202 + fStack_56c * fVar256;
          fStack_468 = fVar267 * fStack_448 + fVar287 + fStack_2e8 * fVar302 + fStack_568 * fVar289;
          fStack_464 = pfVar1[7] + auVar162._28_4_ + local_360._28_4_ + 0.0;
          local_4a0._0_4_ = auVar110._0_4_;
          local_4a0._4_4_ = auVar110._4_4_;
          fStack_498 = auVar110._8_4_;
          fStack_494 = auVar110._12_4_;
          fStack_490 = auVar110._16_4_;
          fStack_48c = auVar110._20_4_;
          fStack_488 = auVar110._24_4_;
          fVar220 = (float)local_2e0._0_4_ * (float)local_4a0._0_4_;
          fVar228 = (float)local_2e0._4_4_ * (float)local_4a0._4_4_;
          fVar145 = fStack_2d8 * fStack_498;
          fVar147 = fStack_2d4 * fStack_494;
          fVar148 = fStack_2d0 * fStack_490;
          fVar149 = fStack_2cc * fStack_48c;
          fVar150 = fStack_2c8 * fStack_488;
          local_5e0._0_4_ = auVar109._0_4_;
          local_5e0._4_4_ = auVar109._4_4_;
          fStack_5d8 = auVar109._8_4_;
          fStack_5d4 = auVar109._12_4_;
          fStack_5d0 = auVar109._16_4_;
          fStack_5cc = auVar109._20_4_;
          fStack_5c8 = auVar109._24_4_;
          fVar230 = (float)local_580._0_4_ * (float)local_5e0._0_4_;
          fVar238 = (float)local_580._4_4_ * (float)local_5e0._4_4_;
          fVar240 = fStack_578 * fStack_5d8;
          fVar242 = fStack_574 * fStack_5d4;
          fVar243 = fStack_570 * fStack_5d0;
          fVar244 = fStack_56c * fStack_5cc;
          fVar246 = fStack_568 * fStack_5c8;
          pfVar1 = (float *)(lVar122 + 0x2205e84 + lVar119 * 4);
          fVar248 = *pfVar1;
          fVar275 = pfVar1[1];
          fVar255 = pfVar1[2];
          fVar201 = pfVar1[3];
          fVar301 = pfVar1[4];
          fVar202 = pfVar1[5];
          fVar302 = pfVar1[6];
          pfVar2 = (float *)(lVar122 + 0x2206308 + lVar119 * 4);
          fVar269 = *pfVar2;
          fVar303 = pfVar2[1];
          fVar316 = pfVar2[2];
          fVar304 = pfVar2[3];
          fVar227 = pfVar2[4];
          fVar305 = pfVar2[5];
          fVar245 = pfVar2[6];
          _local_4a0 = auVar313;
          _local_5e0 = auVar30;
          fVar247 = *(float *)pauVar7[1] + 0.0;
          pfVar3 = (float *)(lVar122 + 0x2205a00 + lVar119 * 4);
          fVar267 = *pfVar3;
          fVar276 = pfVar3[1];
          fVar278 = pfVar3[2];
          fVar281 = pfVar3[3];
          fVar283 = pfVar3[4];
          fVar285 = pfVar3[5];
          fVar287 = pfVar3[6];
          fVar151 = pfVar1[7] + pfVar2[7];
          fStack_384 = pfVar2[7] + fVar247;
          fVar247 = *(float *)pauVar7[1] + auVar313._28_4_ + fVar247;
          pfVar1 = (float *)(lVar122 + 0x220557c + lVar119 * 4);
          fVar290 = *pfVar1;
          fVar189 = pfVar1[1];
          fVar125 = pfVar1[2];
          fVar143 = pfVar1[3];
          fVar169 = pfVar1[4];
          fVar256 = pfVar1[5];
          fVar289 = pfVar1[6];
          local_440 = fVar204 * fVar290 +
                      (float)local_7a0._0_4_ * fVar267 +
                      (float)local_7c0._0_4_ * fVar248 + (float)local_420._0_4_ * fVar269;
          fStack_43c = fVar213 * fVar189 +
                       (float)local_7a0._4_4_ * fVar276 +
                       (float)local_7c0._4_4_ * fVar275 + (float)local_420._4_4_ * fVar303;
          fStack_438 = fVar215 * fVar125 +
                       fStack_798 * fVar278 + fStack_7b8 * fVar255 + fStack_418 * fVar316;
          fStack_434 = fVar170 * fVar143 +
                       fStack_794 * fVar281 + fStack_7b4 * fVar201 + fStack_414 * fVar304;
          fStack_430 = fVar184 * fVar169 +
                       fStack_790 * fVar283 + fStack_7b0 * fVar301 + fStack_410 * fVar227;
          fStack_42c = fVar186 * fVar256 +
                       fStack_78c * fVar285 + fStack_7ac * fVar202 + fStack_40c * fVar305;
          fStack_428 = fVar188 * fVar289 +
                       fStack_788 * fVar287 + fStack_7a8 * fVar302 + fStack_408 * fVar245;
          fStack_424 = fVar151 + fStack_384;
          local_3a0 = fVar290 * (float)local_340._0_4_ +
                      (float)local_780._0_4_ * fVar248 + (float)local_760._0_4_ * fVar269 +
                      (float)local_320._0_4_ * fVar267;
          fStack_39c = fVar189 * (float)local_340._4_4_ +
                       (float)local_780._4_4_ * fVar275 + (float)local_760._4_4_ * fVar303 +
                       (float)local_320._4_4_ * fVar276;
          fStack_398 = fVar125 * fStack_338 +
                       fStack_778 * fVar255 + fStack_758 * fVar316 + fStack_318 * fVar278;
          fStack_394 = fVar143 * fStack_334 +
                       fStack_774 * fVar201 + fStack_754 * fVar304 + fStack_314 * fVar281;
          fStack_390 = fVar169 * fStack_330 +
                       fStack_770 * fVar301 + fStack_750 * fVar227 + fStack_310 * fVar283;
          fStack_38c = fVar256 * fStack_32c +
                       fStack_76c * fVar202 + fStack_74c * fVar305 + fStack_30c * fVar285;
          fStack_388 = fVar289 * fStack_328 +
                       fStack_768 * fVar302 + fStack_748 * fVar245 + fStack_308 * fVar287;
          fStack_384 = fStack_384 + fVar247;
          auVar314._0_4_ =
               fVar267 * (float)local_2e0._0_4_ +
               (float)local_300._0_4_ * fVar248 + (float)local_580._0_4_ * fVar269 +
               fVar290 * (float)local_460._0_4_;
          auVar314._4_4_ =
               fVar276 * (float)local_2e0._4_4_ +
               (float)local_300._4_4_ * fVar275 + (float)local_580._4_4_ * fVar303 +
               fVar189 * (float)local_460._4_4_;
          auVar314._8_4_ =
               fVar278 * fStack_2d8 + fStack_2f8 * fVar255 + fStack_578 * fVar316 +
               fVar125 * fStack_458;
          auVar314._12_4_ =
               fVar281 * fStack_2d4 + fStack_2f4 * fVar201 + fStack_574 * fVar304 +
               fVar143 * fStack_454;
          auVar314._16_4_ =
               fVar283 * fStack_2d0 + fStack_2f0 * fVar301 + fStack_570 * fVar227 +
               fVar169 * fStack_450;
          auVar314._20_4_ =
               fVar285 * fStack_2cc + fStack_2ec * fVar202 + fStack_56c * fVar305 +
               fVar256 * fStack_44c;
          auVar314._24_4_ =
               fVar287 * fStack_2c8 + fStack_2e8 * fVar302 + fStack_568 * fVar245 +
               fVar289 * fStack_448;
          auVar314._28_4_ = pfVar3[7] + fVar151 + fVar247;
          pfVar1 = (float *)(lVar122 + 0x22082a4 + lVar119 * 4);
          fVar275 = *pfVar1;
          fVar255 = pfVar1[1];
          fVar201 = pfVar1[2];
          fVar301 = pfVar1[3];
          fVar202 = pfVar1[4];
          fVar302 = pfVar1[5];
          fVar269 = pfVar1[6];
          pfVar2 = (float *)(lVar122 + 0x2208728 + lVar119 * 4);
          fVar303 = *pfVar2;
          fVar316 = pfVar2[1];
          fVar304 = pfVar2[2];
          fVar227 = pfVar2[3];
          fVar305 = pfVar2[4];
          fVar245 = pfVar2[5];
          fVar267 = pfVar2[6];
          fVar248 = auVar320._28_4_;
          pfVar3 = (float *)(lVar122 + 0x2207e20 + lVar119 * 4);
          fVar276 = *pfVar3;
          fVar278 = pfVar3[1];
          fVar281 = pfVar3[2];
          fVar283 = pfVar3[3];
          fVar285 = pfVar3[4];
          fVar287 = pfVar3[5];
          fVar290 = pfVar3[6];
          pfVar4 = (float *)(lVar122 + 0x220799c + lVar119 * 4);
          fVar189 = *pfVar4;
          fVar125 = pfVar4[1];
          fVar143 = pfVar4[2];
          fVar169 = pfVar4[3];
          fVar256 = pfVar4[4];
          fVar289 = pfVar4[5];
          fVar151 = pfVar4[6];
          auVar273._0_4_ =
               fVar189 * (float)local_720._0_4_ +
               (float)local_7a0._0_4_ * fVar276 +
               (float)local_7c0._0_4_ * fVar275 + (float)local_420._0_4_ * fVar303;
          auVar273._4_4_ =
               fVar125 * (float)local_720._4_4_ +
               (float)local_7a0._4_4_ * fVar278 +
               (float)local_7c0._4_4_ * fVar255 + (float)local_420._4_4_ * fVar316;
          auVar273._8_4_ =
               fVar143 * fStack_718 +
               fStack_798 * fVar281 + fStack_7b8 * fVar201 + fStack_418 * fVar304;
          auVar273._12_4_ =
               fVar169 * fStack_714 +
               fStack_794 * fVar283 + fStack_7b4 * fVar301 + fStack_414 * fVar227;
          auVar273._16_4_ =
               fVar256 * fStack_710 +
               fStack_790 * fVar285 + fStack_7b0 * fVar202 + fStack_410 * fVar305;
          auVar273._20_4_ =
               fVar289 * fStack_70c +
               fStack_78c * fVar287 + fStack_7ac * fVar302 + fStack_40c * fVar245;
          auVar273._24_4_ =
               fVar151 * fStack_708 +
               fStack_788 * fVar290 + fStack_7a8 * fVar269 + fStack_408 * fVar267;
          auVar273._28_4_ = fVar248 + fVar248 + fStack_404 + fVar248;
          auVar308._0_4_ =
               fVar189 * (float)local_340._0_4_ +
               (float)local_320._0_4_ * fVar276 +
               (float)local_780._0_4_ * fVar275 + (float)local_760._0_4_ * fVar303;
          auVar308._4_4_ =
               fVar125 * (float)local_340._4_4_ +
               (float)local_320._4_4_ * fVar278 +
               (float)local_780._4_4_ * fVar255 + (float)local_760._4_4_ * fVar316;
          auVar308._8_4_ =
               fVar143 * fStack_338 +
               fStack_318 * fVar281 + fStack_778 * fVar201 + fStack_758 * fVar304;
          auVar308._12_4_ =
               fVar169 * fStack_334 +
               fStack_314 * fVar283 + fStack_774 * fVar301 + fStack_754 * fVar227;
          auVar308._16_4_ =
               fVar256 * fStack_330 +
               fStack_310 * fVar285 + fStack_770 * fVar202 + fStack_750 * fVar305;
          auVar308._20_4_ =
               fVar289 * fStack_32c +
               fStack_30c * fVar287 + fStack_76c * fVar302 + fStack_74c * fVar245;
          auVar308._24_4_ =
               fVar151 * fStack_328 +
               fStack_308 * fVar290 + fStack_768 * fVar269 + fStack_748 * fVar267;
          auVar308._28_4_ = fVar248 + fVar248 + fStack_744 + fVar248;
          auVar226._8_4_ = 0x7fffffff;
          auVar226._0_8_ = 0x7fffffff7fffffff;
          auVar226._12_4_ = 0x7fffffff;
          auVar226._16_4_ = 0x7fffffff;
          auVar226._20_4_ = 0x7fffffff;
          auVar226._24_4_ = 0x7fffffff;
          auVar226._28_4_ = 0x7fffffff;
          auVar105._4_4_ = fStack_43c;
          auVar105._0_4_ = local_440;
          auVar105._8_4_ = fStack_438;
          auVar105._12_4_ = fStack_434;
          auVar105._16_4_ = fStack_430;
          auVar105._20_4_ = fStack_42c;
          auVar105._24_4_ = fStack_428;
          auVar105._28_4_ = fStack_424;
          auVar162 = vandps_avx(auVar105,auVar226);
          auVar107._4_4_ = fStack_39c;
          auVar107._0_4_ = local_3a0;
          auVar107._8_4_ = fStack_398;
          auVar107._12_4_ = fStack_394;
          auVar107._16_4_ = fStack_390;
          auVar107._20_4_ = fStack_38c;
          auVar107._24_4_ = fStack_388;
          auVar107._28_4_ = fStack_384;
          auVar22 = vandps_avx(auVar107,auVar226);
          auVar22 = vmaxps_avx(auVar162,auVar22);
          auVar162 = vandps_avx(auVar314,auVar226);
          auVar22 = vmaxps_avx(auVar22,auVar162);
          auVar22 = vcmpps_avx(auVar22,local_3c0,1);
          auVar23 = vblendvps_avx(auVar105,auVar21,auVar22);
          auVar138._0_4_ =
               fVar189 * (float)local_460._0_4_ +
               fVar276 * (float)local_2e0._0_4_ +
               fVar303 * (float)local_580._0_4_ + (float)local_300._0_4_ * fVar275;
          auVar138._4_4_ =
               fVar125 * (float)local_460._4_4_ +
               fVar278 * (float)local_2e0._4_4_ +
               fVar316 * (float)local_580._4_4_ + (float)local_300._4_4_ * fVar255;
          auVar138._8_4_ =
               fVar143 * fStack_458 +
               fVar281 * fStack_2d8 + fVar304 * fStack_578 + fStack_2f8 * fVar201;
          auVar138._12_4_ =
               fVar169 * fStack_454 +
               fVar283 * fStack_2d4 + fVar227 * fStack_574 + fStack_2f4 * fVar301;
          auVar138._16_4_ =
               fVar256 * fStack_450 +
               fVar285 * fStack_2d0 + fVar305 * fStack_570 + fStack_2f0 * fVar202;
          auVar138._20_4_ =
               fVar289 * fStack_44c +
               fVar287 * fStack_2cc + fVar245 * fStack_56c + fStack_2ec * fVar302;
          auVar138._24_4_ =
               fVar151 * fStack_448 +
               fVar290 * fStack_2c8 + fVar267 * fStack_568 + fStack_2e8 * fVar269;
          auVar138._28_4_ = auVar162._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar224 = vblendvps_avx(auVar107,auVar30,auVar22);
          auVar162 = vandps_avx(auVar273,auVar226);
          auVar22 = vandps_avx(auVar308,auVar226);
          auVar295 = vmaxps_avx(auVar162,auVar22);
          auVar162 = vandps_avx(auVar138,auVar226);
          auVar162 = vmaxps_avx(auVar295,auVar162);
          local_560._0_4_ = auVar111._0_4_;
          local_560._4_4_ = auVar111._4_4_;
          fStack_558 = auVar111._8_4_;
          fStack_554 = auVar111._12_4_;
          fStack_550 = auVar111._16_4_;
          fStack_54c = auVar111._20_4_;
          fStack_548 = auVar111._24_4_;
          auVar22 = vcmpps_avx(auVar162,local_3c0,1);
          auVar162 = vblendvps_avx(auVar273,auVar21,auVar22);
          auVar139._0_4_ =
               (float)local_460._0_4_ * (float)local_560._0_4_ +
               fVar220 + (float)local_300._0_4_ * fVar257 + fVar230;
          auVar139._4_4_ =
               (float)local_460._4_4_ * (float)local_560._4_4_ +
               fVar228 + (float)local_300._4_4_ * fVar217 + fVar238;
          auVar139._8_4_ = fStack_458 * fStack_558 + fVar145 + fStack_2f8 * fVar167 + fVar240;
          auVar139._12_4_ = fStack_454 * fStack_554 + fVar147 + fStack_2f4 * fVar264 + fVar242;
          auVar139._16_4_ = fStack_450 * fStack_550 + fVar148 + fStack_2f0 * fVar266 + fVar243;
          auVar139._20_4_ = fStack_44c * fStack_54c + fVar149 + fStack_2ec * fVar218 + fVar244;
          auVar139._24_4_ = fStack_448 * fStack_548 + fVar150 + fStack_2e8 * fVar168 + fVar246;
          auVar139._28_4_ = auVar295._28_4_ + fStack_464 + local_360._28_4_ + 0.0;
          auVar22 = vblendvps_avx(auVar308,auVar30,auVar22);
          fVar151 = auVar23._0_4_;
          fVar220 = auVar23._4_4_;
          fVar204 = auVar23._8_4_;
          fVar213 = auVar23._12_4_;
          fVar215 = auVar23._16_4_;
          fVar170 = auVar23._20_4_;
          fVar184 = auVar23._24_4_;
          fVar186 = auVar23._28_4_;
          fVar257 = auVar162._0_4_;
          fVar167 = auVar162._4_4_;
          fVar266 = auVar162._8_4_;
          fVar168 = auVar162._12_4_;
          fVar276 = auVar162._16_4_;
          fVar281 = auVar162._20_4_;
          fVar285 = auVar162._24_4_;
          fVar248 = auVar224._0_4_;
          fVar255 = auVar224._4_4_;
          fVar301 = auVar224._8_4_;
          fVar302 = auVar224._12_4_;
          fVar303 = auVar224._16_4_;
          fVar304 = auVar224._20_4_;
          fVar305 = auVar224._24_4_;
          auVar297._0_4_ = fVar248 * fVar248 + fVar151 * fVar151;
          auVar297._4_4_ = fVar255 * fVar255 + fVar220 * fVar220;
          auVar297._8_4_ = fVar301 * fVar301 + fVar204 * fVar204;
          auVar297._12_4_ = fVar302 * fVar302 + fVar213 * fVar213;
          auVar297._16_4_ = fVar303 * fVar303 + fVar215 * fVar215;
          auVar297._20_4_ = fVar304 * fVar304 + fVar170 * fVar170;
          auVar297._24_4_ = fVar305 * fVar305 + fVar184 * fVar184;
          auVar297._28_4_ = fStack_304 + auVar30._28_4_;
          auVar21 = vrsqrtps_avx(auVar297);
          fVar275 = auVar21._0_4_;
          fVar201 = auVar21._4_4_;
          auVar63._4_4_ = fVar201 * 1.5;
          auVar63._0_4_ = fVar275 * 1.5;
          fVar202 = auVar21._8_4_;
          auVar63._8_4_ = fVar202 * 1.5;
          fVar269 = auVar21._12_4_;
          auVar63._12_4_ = fVar269 * 1.5;
          fVar316 = auVar21._16_4_;
          auVar63._16_4_ = fVar316 * 1.5;
          fVar227 = auVar21._20_4_;
          auVar63._20_4_ = fVar227 * 1.5;
          fVar245 = auVar21._24_4_;
          auVar63._24_4_ = fVar245 * 1.5;
          auVar63._28_4_ = auVar308._28_4_;
          auVar64._4_4_ = fVar201 * fVar201 * fVar201 * auVar297._4_4_ * 0.5;
          auVar64._0_4_ = fVar275 * fVar275 * fVar275 * auVar297._0_4_ * 0.5;
          auVar64._8_4_ = fVar202 * fVar202 * fVar202 * auVar297._8_4_ * 0.5;
          auVar64._12_4_ = fVar269 * fVar269 * fVar269 * auVar297._12_4_ * 0.5;
          auVar64._16_4_ = fVar316 * fVar316 * fVar316 * auVar297._16_4_ * 0.5;
          auVar64._20_4_ = fVar227 * fVar227 * fVar227 * auVar297._20_4_ * 0.5;
          auVar64._24_4_ = fVar245 * fVar245 * fVar245 * auVar297._24_4_ * 0.5;
          auVar64._28_4_ = auVar297._28_4_;
          auVar30 = vsubps_avx(auVar63,auVar64);
          fVar290 = auVar30._0_4_;
          fVar189 = auVar30._4_4_;
          fVar125 = auVar30._8_4_;
          fVar143 = auVar30._12_4_;
          fVar169 = auVar30._16_4_;
          fVar256 = auVar30._20_4_;
          fVar289 = auVar30._24_4_;
          fVar275 = auVar22._0_4_;
          fVar201 = auVar22._4_4_;
          fVar202 = auVar22._8_4_;
          fVar269 = auVar22._12_4_;
          fVar316 = auVar22._16_4_;
          fVar227 = auVar22._20_4_;
          fVar245 = auVar22._24_4_;
          auVar262._0_4_ = fVar275 * fVar275 + fVar257 * fVar257;
          auVar262._4_4_ = fVar201 * fVar201 + fVar167 * fVar167;
          auVar262._8_4_ = fVar202 * fVar202 + fVar266 * fVar266;
          auVar262._12_4_ = fVar269 * fVar269 + fVar168 * fVar168;
          auVar262._16_4_ = fVar316 * fVar316 + fVar276 * fVar276;
          auVar262._20_4_ = fVar227 * fVar227 + fVar281 * fVar281;
          auVar262._24_4_ = fVar245 * fVar245 + fVar285 * fVar285;
          auVar262._28_4_ = auVar21._28_4_ + auVar162._28_4_;
          auVar162 = vrsqrtps_avx(auVar262);
          fVar217 = auVar162._0_4_;
          fVar264 = auVar162._4_4_;
          auVar65._4_4_ = fVar264 * 1.5;
          auVar65._0_4_ = fVar217 * 1.5;
          fVar218 = auVar162._8_4_;
          auVar65._8_4_ = fVar218 * 1.5;
          fVar267 = auVar162._12_4_;
          auVar65._12_4_ = fVar267 * 1.5;
          fVar278 = auVar162._16_4_;
          auVar65._16_4_ = fVar278 * 1.5;
          fVar283 = auVar162._20_4_;
          auVar65._20_4_ = fVar283 * 1.5;
          fVar287 = auVar162._24_4_;
          auVar65._24_4_ = fVar287 * 1.5;
          auVar65._28_4_ = auVar308._28_4_;
          auVar66._4_4_ = fVar264 * fVar264 * fVar264 * auVar262._4_4_ * 0.5;
          auVar66._0_4_ = fVar217 * fVar217 * fVar217 * auVar262._0_4_ * 0.5;
          auVar66._8_4_ = fVar218 * fVar218 * fVar218 * auVar262._8_4_ * 0.5;
          auVar66._12_4_ = fVar267 * fVar267 * fVar267 * auVar262._12_4_ * 0.5;
          auVar66._16_4_ = fVar278 * fVar278 * fVar278 * auVar262._16_4_ * 0.5;
          auVar66._20_4_ = fVar283 * fVar283 * fVar283 * auVar262._20_4_ * 0.5;
          auVar66._24_4_ = fVar287 * fVar287 * fVar287 * auVar262._24_4_ * 0.5;
          auVar66._28_4_ = auVar262._28_4_;
          auVar22 = vsubps_avx(auVar65,auVar66);
          fVar217 = auVar22._0_4_;
          fVar264 = auVar22._4_4_;
          fVar218 = auVar22._8_4_;
          fVar267 = auVar22._12_4_;
          fVar278 = auVar22._16_4_;
          fVar283 = auVar22._20_4_;
          fVar287 = auVar22._24_4_;
          fVar248 = (float)local_7e0._0_4_ * fVar290 * fVar248;
          fVar255 = (float)local_7e0._4_4_ * fVar189 * fVar255;
          auVar67._4_4_ = fVar255;
          auVar67._0_4_ = fVar248;
          fVar301 = fStack_7d8 * fVar125 * fVar301;
          auVar67._8_4_ = fVar301;
          fVar302 = fStack_7d4 * fVar143 * fVar302;
          auVar67._12_4_ = fVar302;
          fVar303 = fStack_7d0 * fVar169 * fVar303;
          auVar67._16_4_ = fVar303;
          fVar304 = fStack_7cc * fVar256 * fVar304;
          auVar67._20_4_ = fVar304;
          fVar305 = fStack_7c8 * fVar289 * fVar305;
          auVar67._24_4_ = fVar305;
          auVar67._28_4_ = auVar162._28_4_;
          local_560._4_4_ = fVar255 + local_640._4_4_;
          local_560._0_4_ = fVar248 + (float)local_640._0_4_;
          fStack_558 = fVar301 + local_640._8_4_;
          fStack_554 = fVar302 + local_640._12_4_;
          fStack_550 = fVar303 + local_640._16_4_;
          fStack_54c = fVar304 + local_640._20_4_;
          fStack_548 = fVar305 + local_640._24_4_;
          fStack_544 = auVar162._28_4_ + local_640._28_4_;
          local_5c0 = (float)local_7e0._0_4_ * fVar290 * -fVar151;
          fStack_5bc = (float)local_7e0._4_4_ * fVar189 * -fVar220;
          auVar68._4_4_ = fStack_5bc;
          auVar68._0_4_ = local_5c0;
          fStack_5b8 = fStack_7d8 * fVar125 * -fVar204;
          auVar68._8_4_ = fStack_5b8;
          fStack_5b4 = fStack_7d4 * fVar143 * -fVar213;
          auVar68._12_4_ = fStack_5b4;
          fStack_5b0 = fStack_7d0 * fVar169 * -fVar215;
          auVar68._16_4_ = fStack_5b0;
          fStack_5ac = fStack_7cc * fVar256 * -fVar170;
          auVar68._20_4_ = fStack_5ac;
          fStack_5a8 = fStack_7c8 * fVar289 * -fVar184;
          auVar68._24_4_ = fStack_5a8;
          auVar68._28_4_ = -fVar186;
          local_5c0 = auVar182._0_4_ + local_5c0;
          fStack_5bc = auVar182._4_4_ + fStack_5bc;
          fStack_5b8 = auVar182._8_4_ + fStack_5b8;
          fStack_5b4 = auVar182._12_4_ + fStack_5b4;
          fStack_5b0 = auVar182._16_4_ + fStack_5b0;
          fStack_5ac = auVar182._20_4_ + fStack_5ac;
          fStack_5a8 = auVar182._24_4_ + fStack_5a8;
          fStack_5a4 = auVar182._28_4_ + -fVar186;
          fVar248 = fVar290 * 0.0 * (float)local_7e0._0_4_;
          fVar255 = fVar189 * 0.0 * (float)local_7e0._4_4_;
          auVar69._4_4_ = fVar255;
          auVar69._0_4_ = fVar248;
          fVar301 = fVar125 * 0.0 * fStack_7d8;
          auVar69._8_4_ = fVar301;
          fVar302 = fVar143 * 0.0 * fStack_7d4;
          auVar69._12_4_ = fVar302;
          fVar303 = fVar169 * 0.0 * fStack_7d0;
          auVar69._16_4_ = fVar303;
          fVar304 = fVar256 * 0.0 * fStack_7cc;
          auVar69._20_4_ = fVar304;
          fVar305 = fVar289 * 0.0 * fStack_7c8;
          auVar69._24_4_ = fVar305;
          auVar69._28_4_ = fVar186;
          auVar295 = vsubps_avx(local_640,auVar67);
          auVar325._0_4_ = fVar248 + auVar139._0_4_;
          auVar325._4_4_ = fVar255 + auVar139._4_4_;
          auVar325._8_4_ = fVar301 + auVar139._8_4_;
          auVar325._12_4_ = fVar302 + auVar139._12_4_;
          auVar325._16_4_ = fVar303 + auVar139._16_4_;
          auVar325._20_4_ = fVar304 + auVar139._20_4_;
          auVar325._24_4_ = fVar305 + auVar139._24_4_;
          auVar325._28_4_ = fVar186 + auVar139._28_4_;
          fVar248 = auVar313._0_4_ * fVar217 * fVar275;
          fVar275 = auVar313._4_4_ * fVar264 * fVar201;
          auVar70._4_4_ = fVar275;
          auVar70._0_4_ = fVar248;
          fVar255 = auVar313._8_4_ * fVar218 * fVar202;
          auVar70._8_4_ = fVar255;
          fVar201 = auVar313._12_4_ * fVar267 * fVar269;
          auVar70._12_4_ = fVar201;
          fVar301 = auVar313._16_4_ * fVar278 * fVar316;
          auVar70._16_4_ = fVar301;
          fVar202 = auVar313._20_4_ * fVar283 * fVar227;
          auVar70._20_4_ = fVar202;
          fVar302 = auVar313._24_4_ * fVar287 * fVar245;
          auVar70._24_4_ = fVar302;
          auVar70._28_4_ = fStack_7c4;
          auVar24 = vsubps_avx(auVar182,auVar68);
          auVar315._0_4_ = auVar235._0_4_ + fVar248;
          auVar315._4_4_ = auVar235._4_4_ + fVar275;
          auVar315._8_4_ = auVar235._8_4_ + fVar255;
          auVar315._12_4_ = auVar235._12_4_ + fVar201;
          auVar315._16_4_ = auVar235._16_4_ + fVar301;
          auVar315._20_4_ = auVar235._20_4_ + fVar202;
          auVar315._24_4_ = auVar235._24_4_ + fVar302;
          auVar315._28_4_ = auVar235._28_4_ + fStack_7c4;
          fVar248 = fVar217 * -fVar257 * auVar313._0_4_;
          fVar275 = fVar264 * -fVar167 * auVar313._4_4_;
          auVar71._4_4_ = fVar275;
          auVar71._0_4_ = fVar248;
          fVar255 = fVar218 * -fVar266 * auVar313._8_4_;
          auVar71._8_4_ = fVar255;
          fVar201 = fVar267 * -fVar168 * auVar313._12_4_;
          auVar71._12_4_ = fVar201;
          fVar301 = fVar278 * -fVar276 * auVar313._16_4_;
          auVar71._16_4_ = fVar301;
          fVar202 = fVar283 * -fVar281 * auVar313._20_4_;
          auVar71._20_4_ = fVar202;
          fVar302 = fVar287 * -fVar285 * auVar313._24_4_;
          auVar71._24_4_ = fVar302;
          auVar71._28_4_ = local_640._28_4_;
          auVar25 = vsubps_avx(auVar139,auVar69);
          auVar210._0_4_ = local_540._0_4_ + fVar248;
          auVar210._4_4_ = local_540._4_4_ + fVar275;
          auVar210._8_4_ = local_540._8_4_ + fVar255;
          auVar210._12_4_ = local_540._12_4_ + fVar201;
          auVar210._16_4_ = local_540._16_4_ + fVar301;
          auVar210._20_4_ = local_540._20_4_ + fVar202;
          auVar210._24_4_ = local_540._24_4_ + fVar302;
          auVar210._28_4_ = local_540._28_4_ + local_640._28_4_;
          fVar248 = fVar217 * 0.0 * auVar313._0_4_;
          fVar275 = fVar264 * 0.0 * auVar313._4_4_;
          auVar72._4_4_ = fVar275;
          auVar72._0_4_ = fVar248;
          fVar255 = fVar218 * 0.0 * auVar313._8_4_;
          auVar72._8_4_ = fVar255;
          fVar201 = fVar267 * 0.0 * auVar313._12_4_;
          auVar72._12_4_ = fVar201;
          fVar301 = fVar278 * 0.0 * auVar313._16_4_;
          auVar72._16_4_ = fVar301;
          fVar202 = fVar283 * 0.0 * auVar313._20_4_;
          auVar72._20_4_ = fVar202;
          fVar302 = fVar287 * 0.0 * auVar313._24_4_;
          auVar72._24_4_ = fVar302;
          auVar72._28_4_ = auVar139._28_4_;
          auVar162 = vsubps_avx(auVar235,auVar70);
          auVar104._4_4_ = fStack_47c;
          auVar104._0_4_ = local_480;
          auVar104._8_4_ = fStack_478;
          auVar104._12_4_ = fStack_474;
          auVar104._16_4_ = fStack_470;
          auVar104._20_4_ = fStack_46c;
          auVar104._24_4_ = fStack_468;
          auVar104._28_4_ = fStack_464;
          auVar274._0_4_ = local_480 + fVar248;
          auVar274._4_4_ = fStack_47c + fVar275;
          auVar274._8_4_ = fStack_478 + fVar255;
          auVar274._12_4_ = fStack_474 + fVar201;
          auVar274._16_4_ = fStack_470 + fVar301;
          auVar274._20_4_ = fStack_46c + fVar202;
          auVar274._24_4_ = fStack_468 + fVar302;
          auVar274._28_4_ = fStack_464 + auVar139._28_4_;
          auVar21 = vsubps_avx(local_540,auVar71);
          auVar30 = vsubps_avx(auVar104,auVar72);
          auVar23 = vsubps_avx(auVar210,auVar24);
          auVar224 = vsubps_avx(auVar274,auVar25);
          auVar73._4_4_ = auVar25._4_4_ * auVar23._4_4_;
          auVar73._0_4_ = auVar25._0_4_ * auVar23._0_4_;
          auVar73._8_4_ = auVar25._8_4_ * auVar23._8_4_;
          auVar73._12_4_ = auVar25._12_4_ * auVar23._12_4_;
          auVar73._16_4_ = auVar25._16_4_ * auVar23._16_4_;
          auVar73._20_4_ = auVar25._20_4_ * auVar23._20_4_;
          auVar73._24_4_ = auVar25._24_4_ * auVar23._24_4_;
          auVar73._28_4_ = auVar308._28_4_;
          auVar74._4_4_ = auVar24._4_4_ * auVar224._4_4_;
          auVar74._0_4_ = auVar24._0_4_ * auVar224._0_4_;
          auVar74._8_4_ = auVar24._8_4_ * auVar224._8_4_;
          auVar74._12_4_ = auVar24._12_4_ * auVar224._12_4_;
          auVar74._16_4_ = auVar24._16_4_ * auVar224._16_4_;
          auVar74._20_4_ = auVar24._20_4_ * auVar224._20_4_;
          auVar74._24_4_ = auVar24._24_4_ * auVar224._24_4_;
          auVar74._28_4_ = fStack_464;
          auVar311 = vsubps_avx(auVar74,auVar73);
          auVar75._4_4_ = auVar295._4_4_ * auVar224._4_4_;
          auVar75._0_4_ = auVar295._0_4_ * auVar224._0_4_;
          auVar75._8_4_ = auVar295._8_4_ * auVar224._8_4_;
          auVar75._12_4_ = auVar295._12_4_ * auVar224._12_4_;
          auVar75._16_4_ = auVar295._16_4_ * auVar224._16_4_;
          auVar75._20_4_ = auVar295._20_4_ * auVar224._20_4_;
          auVar75._24_4_ = auVar295._24_4_ * auVar224._24_4_;
          auVar75._28_4_ = auVar224._28_4_;
          auVar224 = vsubps_avx(auVar315,auVar295);
          auVar76._4_4_ = auVar25._4_4_ * auVar224._4_4_;
          auVar76._0_4_ = auVar25._0_4_ * auVar224._0_4_;
          auVar76._8_4_ = auVar25._8_4_ * auVar224._8_4_;
          auVar76._12_4_ = auVar25._12_4_ * auVar224._12_4_;
          auVar76._16_4_ = auVar25._16_4_ * auVar224._16_4_;
          auVar76._20_4_ = auVar25._20_4_ * auVar224._20_4_;
          auVar76._24_4_ = auVar25._24_4_ * auVar224._24_4_;
          auVar76._28_4_ = auVar22._28_4_;
          auVar26 = vsubps_avx(auVar76,auVar75);
          auVar77._4_4_ = auVar24._4_4_ * auVar224._4_4_;
          auVar77._0_4_ = auVar24._0_4_ * auVar224._0_4_;
          auVar77._8_4_ = auVar24._8_4_ * auVar224._8_4_;
          auVar77._12_4_ = auVar24._12_4_ * auVar224._12_4_;
          auVar77._16_4_ = auVar24._16_4_ * auVar224._16_4_;
          auVar77._20_4_ = auVar24._20_4_ * auVar224._20_4_;
          auVar77._24_4_ = auVar24._24_4_ * auVar224._24_4_;
          auVar77._28_4_ = auVar22._28_4_;
          auVar78._4_4_ = auVar295._4_4_ * auVar23._4_4_;
          auVar78._0_4_ = auVar295._0_4_ * auVar23._0_4_;
          auVar78._8_4_ = auVar295._8_4_ * auVar23._8_4_;
          auVar78._12_4_ = auVar295._12_4_ * auVar23._12_4_;
          auVar78._16_4_ = auVar295._16_4_ * auVar23._16_4_;
          auVar78._20_4_ = auVar295._20_4_ * auVar23._20_4_;
          auVar78._24_4_ = auVar295._24_4_ * auVar23._24_4_;
          auVar78._28_4_ = auVar23._28_4_;
          auVar22 = vsubps_avx(auVar78,auVar77);
          auVar160._0_4_ = auVar311._0_4_ * 0.0 + auVar22._0_4_ + auVar26._0_4_ * 0.0;
          auVar160._4_4_ = auVar311._4_4_ * 0.0 + auVar22._4_4_ + auVar26._4_4_ * 0.0;
          auVar160._8_4_ = auVar311._8_4_ * 0.0 + auVar22._8_4_ + auVar26._8_4_ * 0.0;
          auVar160._12_4_ = auVar311._12_4_ * 0.0 + auVar22._12_4_ + auVar26._12_4_ * 0.0;
          auVar160._16_4_ = auVar311._16_4_ * 0.0 + auVar22._16_4_ + auVar26._16_4_ * 0.0;
          auVar160._20_4_ = auVar311._20_4_ * 0.0 + auVar22._20_4_ + auVar26._20_4_ * 0.0;
          auVar160._24_4_ = auVar311._24_4_ * 0.0 + auVar22._24_4_ + auVar26._24_4_ * 0.0;
          auVar160._28_4_ = auVar311._28_4_ + auVar22._28_4_ + auVar26._28_4_;
          auVar13 = vcmpps_avx(auVar160,ZEXT832(0) << 0x20,2);
          auVar183 = ZEXT3264(auVar13);
          auVar162 = vblendvps_avx(auVar162,_local_560,auVar13);
          auVar103._4_4_ = fStack_5bc;
          auVar103._0_4_ = local_5c0;
          auVar103._8_4_ = fStack_5b8;
          auVar103._12_4_ = fStack_5b4;
          auVar103._16_4_ = fStack_5b0;
          auVar103._20_4_ = fStack_5ac;
          auVar103._24_4_ = fStack_5a8;
          auVar103._28_4_ = fStack_5a4;
          auVar22 = vblendvps_avx(auVar21,auVar103,auVar13);
          auVar21 = vblendvps_avx(auVar30,auVar325,auVar13);
          auVar30 = vblendvps_avx(auVar295,auVar315,auVar13);
          auVar23 = vblendvps_avx(auVar24,auVar210,auVar13);
          auVar224 = vblendvps_avx(auVar25,auVar274,auVar13);
          auVar295 = vblendvps_avx(auVar315,auVar295,auVar13);
          auVar311 = vblendvps_avx(auVar210,auVar24,auVar13);
          auVar26 = vblendvps_avx(auVar274,auVar25,auVar13);
          local_620 = vandps_avx(local_360,auVar197);
          auVar295 = vsubps_avx(auVar295,auVar162);
          auVar27 = vsubps_avx(auVar311,auVar22);
          auVar26 = vsubps_avx(auVar26,auVar21);
          auVar28 = vsubps_avx(auVar22,auVar23);
          fVar248 = auVar27._0_4_;
          fVar150 = auVar21._0_4_;
          fVar269 = auVar27._4_4_;
          fVar230 = auVar21._4_4_;
          auVar79._4_4_ = fVar230 * fVar269;
          auVar79._0_4_ = fVar150 * fVar248;
          fVar257 = auVar27._8_4_;
          fVar238 = auVar21._8_4_;
          auVar79._8_4_ = fVar238 * fVar257;
          fVar267 = auVar27._12_4_;
          fVar240 = auVar21._12_4_;
          auVar79._12_4_ = fVar240 * fVar267;
          fVar290 = auVar27._16_4_;
          fVar242 = auVar21._16_4_;
          auVar79._16_4_ = fVar242 * fVar290;
          fVar151 = auVar27._20_4_;
          fVar243 = auVar21._20_4_;
          auVar79._20_4_ = fVar243 * fVar151;
          fVar186 = auVar27._24_4_;
          fVar244 = auVar21._24_4_;
          auVar79._24_4_ = fVar244 * fVar186;
          auVar79._28_4_ = auVar311._28_4_;
          fVar275 = auVar22._0_4_;
          fVar246 = auVar26._0_4_;
          fVar303 = auVar22._4_4_;
          fVar247 = auVar26._4_4_;
          auVar80._4_4_ = fVar247 * fVar303;
          auVar80._0_4_ = fVar246 * fVar275;
          fVar217 = auVar22._8_4_;
          fVar279 = auVar26._8_4_;
          auVar80._8_4_ = fVar279 * fVar217;
          fVar276 = auVar22._12_4_;
          fVar282 = auVar26._12_4_;
          auVar80._12_4_ = fVar282 * fVar276;
          fVar189 = auVar22._16_4_;
          fVar284 = auVar26._16_4_;
          auVar80._16_4_ = fVar284 * fVar189;
          fVar220 = auVar22._20_4_;
          fVar286 = auVar26._20_4_;
          auVar80._20_4_ = fVar286 * fVar220;
          fVar188 = auVar22._24_4_;
          fVar288 = auVar26._24_4_;
          uVar121 = auVar24._28_4_;
          auVar80._24_4_ = fVar288 * fVar188;
          auVar80._28_4_ = uVar121;
          auVar311 = vsubps_avx(auVar80,auVar79);
          fVar255 = auVar162._0_4_;
          fVar316 = auVar162._4_4_;
          auVar81._4_4_ = fVar247 * fVar316;
          auVar81._0_4_ = fVar246 * fVar255;
          fVar167 = auVar162._8_4_;
          auVar81._8_4_ = fVar279 * fVar167;
          fVar278 = auVar162._12_4_;
          auVar81._12_4_ = fVar282 * fVar278;
          fVar125 = auVar162._16_4_;
          auVar81._16_4_ = fVar284 * fVar125;
          fVar204 = auVar162._20_4_;
          auVar81._20_4_ = fVar286 * fVar204;
          fVar228 = auVar162._24_4_;
          auVar81._24_4_ = fVar288 * fVar228;
          auVar81._28_4_ = uVar121;
          fVar201 = auVar295._0_4_;
          fVar304 = auVar295._4_4_;
          auVar82._4_4_ = fVar230 * fVar304;
          auVar82._0_4_ = fVar150 * fVar201;
          fVar264 = auVar295._8_4_;
          auVar82._8_4_ = fVar238 * fVar264;
          fVar281 = auVar295._12_4_;
          auVar82._12_4_ = fVar240 * fVar281;
          fVar143 = auVar295._16_4_;
          auVar82._16_4_ = fVar242 * fVar143;
          fVar213 = auVar295._20_4_;
          auVar82._20_4_ = fVar243 * fVar213;
          fVar145 = auVar295._24_4_;
          auVar82._24_4_ = fVar244 * fVar145;
          auVar82._28_4_ = auVar315._28_4_;
          auVar24 = vsubps_avx(auVar82,auVar81);
          auVar83._4_4_ = fVar303 * fVar304;
          auVar83._0_4_ = fVar275 * fVar201;
          auVar83._8_4_ = fVar217 * fVar264;
          auVar83._12_4_ = fVar276 * fVar281;
          auVar83._16_4_ = fVar189 * fVar143;
          auVar83._20_4_ = fVar220 * fVar213;
          auVar83._24_4_ = fVar188 * fVar145;
          auVar83._28_4_ = uVar121;
          auVar84._4_4_ = fVar316 * fVar269;
          auVar84._0_4_ = fVar255 * fVar248;
          auVar84._8_4_ = fVar167 * fVar257;
          auVar84._12_4_ = fVar278 * fVar267;
          auVar84._16_4_ = fVar125 * fVar290;
          auVar84._20_4_ = fVar204 * fVar151;
          auVar84._24_4_ = fVar228 * fVar186;
          auVar84._28_4_ = auVar25._28_4_;
          auVar25 = vsubps_avx(auVar84,auVar83);
          auVar29 = vsubps_avx(auVar21,auVar224);
          fVar202 = auVar25._28_4_ + auVar24._28_4_;
          auVar298._0_4_ = auVar25._0_4_ + auVar24._0_4_ * 0.0 + auVar311._0_4_ * 0.0;
          auVar298._4_4_ = auVar25._4_4_ + auVar24._4_4_ * 0.0 + auVar311._4_4_ * 0.0;
          auVar298._8_4_ = auVar25._8_4_ + auVar24._8_4_ * 0.0 + auVar311._8_4_ * 0.0;
          auVar298._12_4_ = auVar25._12_4_ + auVar24._12_4_ * 0.0 + auVar311._12_4_ * 0.0;
          auVar298._16_4_ = auVar25._16_4_ + auVar24._16_4_ * 0.0 + auVar311._16_4_ * 0.0;
          auVar298._20_4_ = auVar25._20_4_ + auVar24._20_4_ * 0.0 + auVar311._20_4_ * 0.0;
          auVar298._24_4_ = auVar25._24_4_ + auVar24._24_4_ * 0.0 + auVar311._24_4_ * 0.0;
          auVar298._28_4_ = fVar202 + auVar311._28_4_;
          fVar301 = auVar28._0_4_;
          fVar227 = auVar28._4_4_;
          auVar85._4_4_ = auVar224._4_4_ * fVar227;
          auVar85._0_4_ = auVar224._0_4_ * fVar301;
          fVar266 = auVar28._8_4_;
          auVar85._8_4_ = auVar224._8_4_ * fVar266;
          fVar283 = auVar28._12_4_;
          auVar85._12_4_ = auVar224._12_4_ * fVar283;
          fVar169 = auVar28._16_4_;
          auVar85._16_4_ = auVar224._16_4_ * fVar169;
          fVar215 = auVar28._20_4_;
          auVar85._20_4_ = auVar224._20_4_ * fVar215;
          fVar147 = auVar28._24_4_;
          auVar85._24_4_ = auVar224._24_4_ * fVar147;
          auVar85._28_4_ = fVar202;
          fVar202 = auVar29._0_4_;
          fVar305 = auVar29._4_4_;
          auVar86._4_4_ = auVar23._4_4_ * fVar305;
          auVar86._0_4_ = auVar23._0_4_ * fVar202;
          fVar218 = auVar29._8_4_;
          auVar86._8_4_ = auVar23._8_4_ * fVar218;
          fVar285 = auVar29._12_4_;
          auVar86._12_4_ = auVar23._12_4_ * fVar285;
          fVar256 = auVar29._16_4_;
          auVar86._16_4_ = auVar23._16_4_ * fVar256;
          fVar170 = auVar29._20_4_;
          auVar86._20_4_ = auVar23._20_4_ * fVar170;
          fVar148 = auVar29._24_4_;
          auVar86._24_4_ = auVar23._24_4_ * fVar148;
          auVar86._28_4_ = auVar25._28_4_;
          auVar24 = vsubps_avx(auVar86,auVar85);
          auVar25 = vsubps_avx(auVar162,auVar30);
          fVar302 = auVar25._0_4_;
          fVar245 = auVar25._4_4_;
          auVar87._4_4_ = auVar224._4_4_ * fVar245;
          auVar87._0_4_ = auVar224._0_4_ * fVar302;
          fVar168 = auVar25._8_4_;
          auVar87._8_4_ = auVar224._8_4_ * fVar168;
          fVar287 = auVar25._12_4_;
          auVar87._12_4_ = auVar224._12_4_ * fVar287;
          fVar289 = auVar25._16_4_;
          auVar87._16_4_ = auVar224._16_4_ * fVar289;
          fVar184 = auVar25._20_4_;
          auVar87._20_4_ = auVar224._20_4_ * fVar184;
          fVar149 = auVar25._24_4_;
          auVar87._24_4_ = auVar224._24_4_ * fVar149;
          auVar87._28_4_ = auVar224._28_4_;
          auVar88._4_4_ = fVar305 * auVar30._4_4_;
          auVar88._0_4_ = fVar202 * auVar30._0_4_;
          auVar88._8_4_ = fVar218 * auVar30._8_4_;
          auVar88._12_4_ = fVar285 * auVar30._12_4_;
          auVar88._16_4_ = fVar256 * auVar30._16_4_;
          auVar88._20_4_ = fVar170 * auVar30._20_4_;
          auVar88._24_4_ = fVar148 * auVar30._24_4_;
          auVar88._28_4_ = auVar311._28_4_;
          auVar224 = vsubps_avx(auVar87,auVar88);
          auVar89._4_4_ = auVar23._4_4_ * fVar245;
          auVar89._0_4_ = auVar23._0_4_ * fVar302;
          auVar89._8_4_ = auVar23._8_4_ * fVar168;
          auVar89._12_4_ = auVar23._12_4_ * fVar287;
          auVar89._16_4_ = auVar23._16_4_ * fVar289;
          auVar89._20_4_ = auVar23._20_4_ * fVar184;
          auVar89._24_4_ = auVar23._24_4_ * fVar149;
          auVar89._28_4_ = auVar23._28_4_;
          auVar90._4_4_ = fVar227 * auVar30._4_4_;
          auVar90._0_4_ = fVar301 * auVar30._0_4_;
          auVar90._8_4_ = fVar266 * auVar30._8_4_;
          auVar90._12_4_ = fVar283 * auVar30._12_4_;
          auVar90._16_4_ = fVar169 * auVar30._16_4_;
          auVar90._20_4_ = fVar215 * auVar30._20_4_;
          auVar90._24_4_ = fVar147 * auVar30._24_4_;
          auVar90._28_4_ = auVar30._28_4_;
          auVar30 = vsubps_avx(auVar90,auVar89);
          auVar140._0_4_ = auVar24._0_4_ * 0.0 + auVar30._0_4_ + auVar224._0_4_ * 0.0;
          auVar140._4_4_ = auVar24._4_4_ * 0.0 + auVar30._4_4_ + auVar224._4_4_ * 0.0;
          auVar140._8_4_ = auVar24._8_4_ * 0.0 + auVar30._8_4_ + auVar224._8_4_ * 0.0;
          auVar140._12_4_ = auVar24._12_4_ * 0.0 + auVar30._12_4_ + auVar224._12_4_ * 0.0;
          auVar140._16_4_ = auVar24._16_4_ * 0.0 + auVar30._16_4_ + auVar224._16_4_ * 0.0;
          auVar140._20_4_ = auVar24._20_4_ * 0.0 + auVar30._20_4_ + auVar224._20_4_ * 0.0;
          auVar140._24_4_ = auVar24._24_4_ * 0.0 + auVar30._24_4_ + auVar224._24_4_ * 0.0;
          auVar140._28_4_ = auVar224._28_4_ + auVar30._28_4_ + auVar224._28_4_;
          auVar141 = ZEXT3264(auVar140);
          auVar30 = vmaxps_avx(auVar298,auVar140);
          auVar30 = vcmpps_avx(auVar30,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar23 = local_620 & auVar30;
          if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar23 >> 0x7f,0) == '\0') &&
                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar23 >> 0xbf,0) == '\0') &&
              (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar23[0x1f]) {
LAB_0093871d:
            auVar265 = auVar28._4_12_;
            auVar163 = ZEXT3264(CONCAT824(uStack_4a8,
                                          CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
          }
          else {
            auVar23 = vandps_avx(auVar30,local_620);
            auVar91._4_4_ = fVar305 * fVar269;
            auVar91._0_4_ = fVar202 * fVar248;
            auVar91._8_4_ = fVar218 * fVar257;
            auVar91._12_4_ = fVar285 * fVar267;
            auVar91._16_4_ = fVar256 * fVar290;
            auVar91._20_4_ = fVar170 * fVar151;
            auVar91._24_4_ = fVar148 * fVar186;
            auVar91._28_4_ = local_620._28_4_;
            auVar92._4_4_ = fVar227 * fVar247;
            auVar92._0_4_ = fVar301 * fVar246;
            auVar92._8_4_ = fVar266 * fVar279;
            auVar92._12_4_ = fVar283 * fVar282;
            auVar92._16_4_ = fVar169 * fVar284;
            auVar92._20_4_ = fVar215 * fVar286;
            auVar92._24_4_ = fVar147 * fVar288;
            auVar92._28_4_ = auVar30._28_4_;
            auVar224 = vsubps_avx(auVar92,auVar91);
            auVar93._4_4_ = fVar245 * fVar247;
            auVar93._0_4_ = fVar302 * fVar246;
            auVar93._8_4_ = fVar168 * fVar279;
            auVar93._12_4_ = fVar287 * fVar282;
            auVar93._16_4_ = fVar289 * fVar284;
            auVar93._20_4_ = fVar184 * fVar286;
            auVar93._24_4_ = fVar149 * fVar288;
            auVar93._28_4_ = auVar26._28_4_;
            auVar94._4_4_ = fVar305 * fVar304;
            auVar94._0_4_ = fVar202 * fVar201;
            auVar94._8_4_ = fVar218 * fVar264;
            auVar94._12_4_ = fVar285 * fVar281;
            auVar94._16_4_ = fVar256 * fVar143;
            auVar94._20_4_ = fVar170 * fVar213;
            auVar94._24_4_ = fVar148 * fVar145;
            auVar94._28_4_ = auVar29._28_4_;
            auVar311 = vsubps_avx(auVar94,auVar93);
            auVar95._4_4_ = fVar227 * fVar304;
            auVar95._0_4_ = fVar301 * fVar201;
            auVar95._8_4_ = fVar266 * fVar264;
            auVar95._12_4_ = fVar283 * fVar281;
            auVar95._16_4_ = fVar169 * fVar143;
            auVar95._20_4_ = fVar215 * fVar213;
            auVar95._24_4_ = fVar147 * fVar145;
            auVar95._28_4_ = auVar295._28_4_;
            auVar96._4_4_ = fVar245 * fVar269;
            auVar96._0_4_ = fVar302 * fVar248;
            auVar96._8_4_ = fVar168 * fVar257;
            auVar96._12_4_ = fVar287 * fVar267;
            auVar96._16_4_ = fVar289 * fVar290;
            auVar96._20_4_ = fVar184 * fVar151;
            auVar96._24_4_ = fVar149 * fVar186;
            auVar96._28_4_ = auVar27._28_4_;
            auVar28 = vsubps_avx(auVar96,auVar95);
            auVar265 = auVar28._4_12_;
            auVar161._0_4_ = auVar224._0_4_ * 0.0 + auVar28._0_4_ + auVar311._0_4_ * 0.0;
            auVar161._4_4_ = auVar224._4_4_ * 0.0 + auVar28._4_4_ + auVar311._4_4_ * 0.0;
            auVar161._8_4_ = auVar224._8_4_ * 0.0 + auVar28._8_4_ + auVar311._8_4_ * 0.0;
            auVar161._12_4_ = auVar224._12_4_ * 0.0 + auVar28._12_4_ + auVar311._12_4_ * 0.0;
            auVar161._16_4_ = auVar224._16_4_ * 0.0 + auVar28._16_4_ + auVar311._16_4_ * 0.0;
            auVar161._20_4_ = auVar224._20_4_ * 0.0 + auVar28._20_4_ + auVar311._20_4_ * 0.0;
            auVar161._24_4_ = auVar224._24_4_ * 0.0 + auVar28._24_4_ + auVar311._24_4_ * 0.0;
            auVar161._28_4_ = auVar27._28_4_ + auVar28._28_4_ + auVar295._28_4_;
            auVar30 = vrcpps_avx(auVar161);
            fVar201 = auVar30._0_4_;
            fVar301 = auVar30._4_4_;
            auVar97._4_4_ = auVar161._4_4_ * fVar301;
            auVar97._0_4_ = auVar161._0_4_ * fVar201;
            fVar202 = auVar30._8_4_;
            auVar97._8_4_ = auVar161._8_4_ * fVar202;
            fVar302 = auVar30._12_4_;
            auVar97._12_4_ = auVar161._12_4_ * fVar302;
            fVar269 = auVar30._16_4_;
            auVar97._16_4_ = auVar161._16_4_ * fVar269;
            fVar304 = auVar30._20_4_;
            auVar97._20_4_ = auVar161._20_4_ * fVar304;
            fVar227 = auVar30._24_4_;
            auVar97._24_4_ = auVar161._24_4_ * fVar227;
            auVar97._28_4_ = auVar29._28_4_;
            auVar309._8_4_ = 0x3f800000;
            auVar309._0_8_ = 0x3f8000003f800000;
            auVar309._12_4_ = 0x3f800000;
            auVar309._16_4_ = 0x3f800000;
            auVar309._20_4_ = 0x3f800000;
            auVar309._24_4_ = 0x3f800000;
            auVar309._28_4_ = 0x3f800000;
            auVar30 = vsubps_avx(auVar309,auVar97);
            fVar201 = auVar30._0_4_ * fVar201 + fVar201;
            fVar301 = auVar30._4_4_ * fVar301 + fVar301;
            fVar202 = auVar30._8_4_ * fVar202 + fVar202;
            fVar302 = auVar30._12_4_ * fVar302 + fVar302;
            fVar269 = auVar30._16_4_ * fVar269 + fVar269;
            fVar304 = auVar30._20_4_ * fVar304 + fVar304;
            fVar227 = auVar30._24_4_ * fVar227 + fVar227;
            auVar98._4_4_ =
                 (fVar316 * auVar224._4_4_ + auVar311._4_4_ * fVar303 + auVar28._4_4_ * fVar230) *
                 fVar301;
            auVar98._0_4_ =
                 (fVar255 * auVar224._0_4_ + auVar311._0_4_ * fVar275 + auVar28._0_4_ * fVar150) *
                 fVar201;
            auVar98._8_4_ =
                 (fVar167 * auVar224._8_4_ + auVar311._8_4_ * fVar217 + auVar28._8_4_ * fVar238) *
                 fVar202;
            auVar98._12_4_ =
                 (fVar278 * auVar224._12_4_ + auVar311._12_4_ * fVar276 + auVar28._12_4_ * fVar240)
                 * fVar302;
            auVar98._16_4_ =
                 (fVar125 * auVar224._16_4_ + auVar311._16_4_ * fVar189 + auVar28._16_4_ * fVar242)
                 * fVar269;
            auVar98._20_4_ =
                 (fVar204 * auVar224._20_4_ + auVar311._20_4_ * fVar220 + auVar28._20_4_ * fVar243)
                 * fVar304;
            auVar98._24_4_ =
                 (fVar228 * auVar224._24_4_ + auVar311._24_4_ * fVar188 + auVar28._24_4_ * fVar244)
                 * fVar227;
            auVar98._28_4_ = auVar162._28_4_ + auVar22._28_4_ + auVar21._28_4_;
            fVar248 = ray->tfar;
            auVar211._4_4_ = fVar248;
            auVar211._0_4_ = fVar248;
            auVar211._8_4_ = fVar248;
            auVar211._12_4_ = fVar248;
            auVar211._16_4_ = fVar248;
            auVar211._20_4_ = fVar248;
            auVar211._24_4_ = fVar248;
            auVar211._28_4_ = fVar248;
            auVar108._8_8_ = uStack_d8;
            auVar108._0_8_ = local_e0;
            auVar108._16_8_ = uStack_d0;
            auVar108._24_8_ = uStack_c8;
            auVar162 = vcmpps_avx(auVar108,auVar98,2);
            auVar22 = vcmpps_avx(auVar98,auVar211,2);
            auVar162 = vandps_avx(auVar162,auVar22);
            auVar21 = auVar23 & auVar162;
            if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar21 >> 0x7f,0) == '\0') &&
                  (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar21 >> 0xbf,0) == '\0') &&
                (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar21[0x1f]) goto LAB_0093871d;
            auVar162 = vandps_avx(auVar23,auVar162);
            auVar21 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar161,4);
            auVar30 = auVar162 & auVar21;
            auVar163 = ZEXT3264(CONCAT824(uStack_4a8,
                                          CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
            if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0x7f,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0xbf,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar30[0x1f] < '\0') {
              auVar162 = vandps_avx(auVar21,auVar162);
              auVar163 = ZEXT3264(auVar162);
              auVar99._4_4_ = auVar298._4_4_ * fVar301;
              auVar99._0_4_ = auVar298._0_4_ * fVar201;
              auVar99._8_4_ = auVar298._8_4_ * fVar202;
              auVar99._12_4_ = auVar298._12_4_ * fVar302;
              auVar99._16_4_ = auVar298._16_4_ * fVar269;
              auVar99._20_4_ = auVar298._20_4_ * fVar304;
              auVar99._24_4_ = auVar298._24_4_ * fVar227;
              auVar99._28_4_ = auVar22._28_4_;
              auVar100._4_4_ = auVar140._4_4_ * fVar301;
              auVar100._0_4_ = auVar140._0_4_ * fVar201;
              auVar100._8_4_ = auVar140._8_4_ * fVar202;
              auVar100._12_4_ = auVar140._12_4_ * fVar302;
              auVar100._16_4_ = auVar140._16_4_ * fVar269;
              auVar100._20_4_ = auVar140._20_4_ * fVar304;
              auVar100._24_4_ = auVar140._24_4_ * fVar227;
              auVar100._28_4_ = auVar140._28_4_;
              auVar236._8_4_ = 0x3f800000;
              auVar236._0_8_ = 0x3f8000003f800000;
              auVar236._12_4_ = 0x3f800000;
              auVar236._16_4_ = 0x3f800000;
              auVar236._20_4_ = 0x3f800000;
              auVar236._24_4_ = 0x3f800000;
              auVar236._28_4_ = 0x3f800000;
              auVar162 = vsubps_avx(auVar236,auVar99);
              _local_140 = vblendvps_avx(auVar162,auVar99,auVar13);
              auVar162 = vsubps_avx(auVar236,auVar100);
              _local_400 = vblendvps_avx(auVar162,auVar100,auVar13);
              auVar141 = ZEXT3264(_local_400);
              local_160 = auVar98;
            }
          }
          auVar162 = auVar163._0_32_;
          auVar320 = ZEXT3264(_local_720);
          if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar162 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar162 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar162 >> 0x7f,0) != '\0') ||
                (auVar163 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
               SUB321(auVar162 >> 0xbf,0) != '\0') ||
              (auVar163 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
              auVar163[0x1f] < '\0') {
            auVar22 = vsubps_avx(auVar313,_local_7e0);
            fVar275 = (float)local_7e0._0_4_ + auVar22._0_4_ * (float)local_140._0_4_;
            fVar255 = (float)local_7e0._4_4_ + auVar22._4_4_ * (float)local_140._4_4_;
            fVar201 = fStack_7d8 + auVar22._8_4_ * fStack_138;
            fVar301 = fStack_7d4 + auVar22._12_4_ * fStack_134;
            fVar202 = fStack_7d0 + auVar22._16_4_ * fStack_130;
            fVar302 = fStack_7cc + auVar22._20_4_ * fStack_12c;
            fVar269 = fStack_7c8 + auVar22._24_4_ * fStack_128;
            fVar303 = fStack_7c4 + auVar22._28_4_;
            fVar248 = local_728->depth_scale;
            auVar183 = ZEXT3264(CONCAT428(fVar248,CONCAT424(fVar248,CONCAT420(fVar248,CONCAT416(
                                                  fVar248,CONCAT412(fVar248,CONCAT48(fVar248,
                                                  CONCAT44(fVar248,fVar248))))))));
            auVar101._4_4_ = (fVar255 + fVar255) * fVar248;
            auVar101._0_4_ = (fVar275 + fVar275) * fVar248;
            auVar101._8_4_ = (fVar201 + fVar201) * fVar248;
            auVar101._12_4_ = (fVar301 + fVar301) * fVar248;
            auVar101._16_4_ = (fVar202 + fVar202) * fVar248;
            auVar101._20_4_ = (fVar302 + fVar302) * fVar248;
            auVar101._24_4_ = (fVar269 + fVar269) * fVar248;
            auVar101._28_4_ = fVar303 + fVar303;
            auVar22 = vcmpps_avx(local_160,auVar101,6);
            auVar141 = ZEXT3264(auVar22);
            auVar21 = auVar162 & auVar22;
            if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0x7f,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0xbf,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar21[0x1f] < '\0') {
              local_1e0 = vandps_avx(auVar22,auVar162);
              auVar141 = ZEXT3264(local_1e0);
              auVar157._0_8_ =
                   CONCAT44((float)local_400._4_4_ + (float)local_400._4_4_ + -1.0,
                            (float)local_400._0_4_ + (float)local_400._0_4_ + -1.0);
              auVar157._8_4_ = (float)uStack_3f8 + (float)uStack_3f8 + -1.0;
              auVar157._12_4_ = uStack_3f8._4_4_ + uStack_3f8._4_4_ + -1.0;
              auVar158._16_4_ = (float)uStack_3f0 + (float)uStack_3f0 + -1.0;
              auVar158._0_16_ = auVar157;
              auVar158._20_4_ = uStack_3f0._4_4_ + uStack_3f0._4_4_ + -1.0;
              fStack_268 = (float)uStack_3e8 + (float)uStack_3e8 + -1.0;
              _local_280 = auVar158;
              fStack_264 = uStack_3e8._4_4_ + uStack_3e8._4_4_ + -1.0;
              auVar163 = ZEXT3264(_local_280);
              local_2a0 = _local_140;
              local_260 = local_160;
              local_23c = uVar117;
              local_230 = local_690;
              uStack_228 = uStack_688;
              local_220 = local_6a0;
              uStack_218 = uStack_698;
              local_210 = local_590;
              uStack_208 = uStack_588;
              auVar183 = ZEXT1664(_local_5a0);
              local_200 = _local_5a0;
              local_6c0._0_8_ = (local_7f0->scene->geometries).items[local_730].ptr;
              _local_400 = _local_280;
              auVar162 = _local_400;
              if ((((Geometry *)local_6c0._0_8_)->mask & ray->mask) == 0) {
                pRVar115 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar115 = local_7f0->args;
                if ((pRVar115->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar115 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar115 >> 8),1),
                   ((Geometry *)local_6c0._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_6c0._8_24_ = auVar235._8_24_;
                  auVar178._0_4_ = (float)(int)local_240;
                  auVar178._4_12_ = auVar265;
                  auVar329 = vshufps_avx(auVar178,auVar178,0);
                  auVar183 = ZEXT3264(CONCAT1616(auVar329,auVar329));
                  local_1c0[0] = (auVar329._0_4_ + (float)local_140._0_4_ + 0.0) *
                                 (float)local_100._0_4_;
                  local_1c0[1] = (auVar329._4_4_ + (float)local_140._4_4_ + 1.0) *
                                 (float)local_100._4_4_;
                  local_1c0[2] = (auVar329._8_4_ + fStack_138 + 2.0) * fStack_f8;
                  local_1c0[3] = (auVar329._12_4_ + fStack_134 + 3.0) * fStack_f4;
                  fStack_1b0 = (auVar329._0_4_ + fStack_130 + 4.0) * fStack_f0;
                  fStack_1ac = (auVar329._4_4_ + fStack_12c + 5.0) * fStack_ec;
                  fStack_1a8 = (auVar329._8_4_ + fStack_128 + 6.0) * fStack_e8;
                  fStack_1a4 = auVar329._12_4_ + fStack_124 + 7.0;
                  uStack_3f8 = auVar157._8_8_;
                  uStack_3f0 = auVar158._16_8_;
                  uStack_3e8 = local_280._24_8_;
                  local_1a0 = auVar157._0_8_;
                  uStack_198 = uStack_3f8;
                  uStack_190 = uStack_3f0;
                  uStack_188 = uStack_3e8;
                  auVar163 = ZEXT3264(local_160);
                  local_180 = local_160;
                  uVar121 = vmovmskps_avx(local_1e0);
                  uVar116 = CONCAT44((int)((ulong)pRVar115 >> 0x20),uVar121);
                  lVar118 = 0;
                  _local_400 = auVar162;
                  if (uVar116 != 0) {
                    for (; (uVar116 >> lVar118 & 1) == 0; lVar118 = lVar118 + 1) {
                    }
                  }
                  while( true ) {
                    local_7e0 = (undefined1  [8])lVar118;
                    local_620._0_8_ = uVar116;
                    if (uVar116 == 0) break;
                    local_674 = local_1c0[lVar118];
                    auVar141 = ZEXT464((uint)local_674);
                    local_670 = *(uint *)((long)&local_1a0 + lVar118 * 4);
                    auVar163 = ZEXT464(local_670);
                    local_640._0_4_ = ray->tfar;
                    ray->tfar = *(float *)(local_180 + lVar118 * 4);
                    fVar268 = 1.0 - local_674;
                    fVar248 = local_674 * 3.0;
                    auVar329 = ZEXT416((uint)((fVar268 * -2.0 * local_674 + local_674 * local_674) *
                                             0.5));
                    auVar329 = vshufps_avx(auVar329,auVar329,0);
                    auVar193 = ZEXT416((uint)(((fVar268 + fVar268) * (fVar248 + 2.0) +
                                              fVar268 * fVar268 * -3.0) * 0.5));
                    auVar193 = vshufps_avx(auVar193,auVar193,0);
                    auVar194 = ZEXT416((uint)(((local_674 + local_674) * (fVar248 + -5.0) +
                                              local_674 * fVar248) * 0.5));
                    auVar194 = vshufps_avx(auVar194,auVar194,0);
                    auVar195 = ZEXT416((uint)((local_674 * (fVar268 + fVar268) - fVar268 * fVar268)
                                             * 0.5));
                    auVar195 = vshufps_avx(auVar195,auVar195,0);
                    auVar179._0_4_ =
                         auVar195._0_4_ * (float)local_690._0_4_ +
                         auVar194._0_4_ * (float)local_6a0._0_4_ +
                         auVar329._0_4_ * (float)local_5a0._0_4_ +
                         auVar193._0_4_ * (float)local_590._0_4_;
                    auVar179._4_4_ =
                         auVar195._4_4_ * (float)local_690._4_4_ +
                         auVar194._4_4_ * (float)local_6a0._4_4_ +
                         auVar329._4_4_ * (float)local_5a0._4_4_ +
                         auVar193._4_4_ * (float)local_590._4_4_;
                    auVar179._8_4_ =
                         auVar195._8_4_ * (float)uStack_688 +
                         auVar194._8_4_ * (float)uStack_698 +
                         auVar329._8_4_ * fStack_598 + auVar193._8_4_ * (float)uStack_588;
                    auVar179._12_4_ =
                         auVar195._12_4_ * uStack_688._4_4_ +
                         auVar194._12_4_ * uStack_698._4_4_ +
                         auVar329._12_4_ * fStack_594 + auVar193._12_4_ * uStack_588._4_4_;
                    auVar183 = ZEXT1664(auVar179);
                    local_6f0.context = local_7f0->user;
                    local_680 = vmovlps_avx(auVar179);
                    local_678 = vextractps_avx(auVar179,2);
                    local_66c = (int)local_648;
                    local_668 = (int)local_730;
                    local_664 = (local_6f0.context)->instID[0];
                    local_660 = (local_6f0.context)->instPrimID[0];
                    local_7f4 = -1;
                    local_6f0.valid = &local_7f4;
                    local_6f0.geometryUserPtr = *(void **)(local_6c0._0_8_ + 0x18);
                    local_6f0.ray = (RTCRayN *)ray;
                    local_6f0.hit = (RTCHitN *)&local_680;
                    local_6f0.N = 1;
                    if (*(code **)(local_6c0._0_8_ + 0x48) == (code *)0x0) {
LAB_00938691:
                      p_Var12 = local_7f0->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((local_7f0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_6c0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar183 = ZEXT1664(auVar183._0_16_);
                        auVar329 = (*p_Var12)(&local_6f0);
                        auVar163._0_8_ = auVar329._8_8_;
                        auVar141._0_8_ = auVar329._0_8_;
                        auVar163._8_56_ = extraout_var_02;
                        auVar141._8_56_ = extraout_var_00;
                        if (*local_6f0.valid == 0) goto LAB_009386d4;
                      }
                      pRVar115 = (RTCIntersectArguments *)0x1;
                      goto LAB_0093873d;
                    }
                    auVar183 = ZEXT1664(auVar179);
                    auVar329 = (**(code **)(local_6c0._0_8_ + 0x48))(&local_6f0);
                    auVar163._0_8_ = auVar329._8_8_;
                    auVar141._0_8_ = auVar329._0_8_;
                    auVar163._8_56_ = extraout_var_01;
                    auVar141._8_56_ = extraout_var;
                    if (*local_6f0.valid != 0) goto LAB_00938691;
LAB_009386d4:
                    auVar141 = ZEXT464((uint)local_640._0_4_);
                    ray->tfar = (float)local_640._0_4_;
                    uVar116 = local_620._0_8_ ^ 1L << ((ulong)local_7e0 & 0x3f);
                    lVar118 = 0;
                    if (uVar116 != 0) {
                      for (; (uVar116 >> lVar118 & 1) == 0; lVar118 = lVar118 + 1) {
                      }
                    }
                  }
                  pRVar115 = (RTCIntersectArguments *)0x0;
LAB_0093873d:
                  auVar320 = ZEXT3264(_local_720);
                }
              }
              bVar123 = bVar123 | (byte)pRVar115;
              fVar124 = (float)local_760._0_4_;
              fVar142 = (float)local_760._4_4_;
              fVar144 = fStack_758;
              fVar146 = fStack_754;
              fVar268 = fStack_750;
              fVar253 = fStack_74c;
              fVar254 = fStack_748;
              fVar277 = fStack_744;
              fVar152 = (float)local_7c0._0_4_;
              fVar164 = (float)local_7c0._4_4_;
              fVar165 = fStack_7b8;
              fVar166 = fStack_7b4;
              fVar280 = fStack_7b0;
              fVar219 = fStack_7ac;
              fVar185 = fStack_7a8;
              fVar203 = (float)local_7a0._0_4_;
              fVar212 = (float)local_7a0._4_4_;
              fVar214 = fStack_798;
              fVar216 = fStack_794;
              fVar187 = fStack_790;
              fVar229 = fStack_78c;
              fVar237 = fStack_788;
              fVar190 = (float)local_780._0_4_;
              fVar198 = (float)local_780._4_4_;
              fVar199 = fStack_778;
              fVar200 = fStack_774;
              fVar239 = fStack_770;
              fVar241 = fStack_76c;
              fVar317 = fStack_768;
            }
          }
        }
      }
    }
    if (bVar123 != 0) break;
    fVar248 = ray->tfar;
    auVar129._4_4_ = fVar248;
    auVar129._0_4_ = fVar248;
    auVar129._8_4_ = fVar248;
    auVar129._12_4_ = fVar248;
    auVar329 = vcmpps_avx(local_2b0,auVar129,2);
    uVar117 = vmovmskps_avx(auVar329);
  }
  return uVar113 != 0;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }